

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

bool embree::avx::CurveNvIntersector1<4>::
     occluded_t<embree::avx::RibbonCurve1Intersector1<embree::BSplineCurveT,8>,embree::avx::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [28];
  undefined1 (*pauVar2) [28];
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar7;
  Primitive PVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined4 uVar73;
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined8 uVar96;
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [28];
  undefined1 auVar106 [28];
  uint uVar107;
  ulong uVar108;
  long lVar109;
  Geometry *pGVar110;
  RTCIntersectArguments *pRVar111;
  long lVar112;
  ulong uVar113;
  RTCIntersectArguments *pRVar114;
  undefined4 uVar115;
  undefined8 unaff_RBX;
  float fVar119;
  float fVar120;
  ulong uVar117;
  float fVar118;
  float fVar140;
  vint4 bi_2;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  float fVar150;
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [64];
  float fVar149;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  float fVar151;
  float fVar167;
  vint4 bi_1;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar152;
  undefined1 auVar157 [16];
  float fVar165;
  float fVar166;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [64];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  float fVar175;
  float fVar190;
  float fVar192;
  vint4 ai;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  float fVar176;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  float fVar191;
  float fVar193;
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  float fVar194;
  float fVar195;
  float fVar200;
  float fVar201;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  float fVar202;
  undefined1 auVar199 [32];
  float fVar203;
  float fVar213;
  float fVar214;
  vint4 bi;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar217;
  float fVar219;
  float fVar221;
  undefined1 auVar208 [32];
  float fVar215;
  float fVar216;
  float fVar218;
  float fVar220;
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  float fVar222;
  float fVar229;
  float fVar230;
  vint4 ai_2;
  undefined1 auVar223 [16];
  float fVar231;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  float fVar232;
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  float fVar233;
  float fVar234;
  float fVar240;
  float fVar242;
  vint4 ai_1;
  undefined1 auVar235 [16];
  float fVar244;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  float fVar241;
  float fVar243;
  undefined1 auVar238 [32];
  float fVar245;
  undefined1 auVar239 [32];
  float fVar246;
  float fVar247;
  float fVar255;
  float fVar257;
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  float fVar256;
  float fVar258;
  float fVar259;
  float fVar260;
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [64];
  float fVar261;
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  float fVar266;
  float fVar267;
  float fVar268;
  float fVar269;
  float fVar270;
  float fVar271;
  undefined1 auVar265 [64];
  float fVar272;
  float fVar279;
  float fVar280;
  undefined1 auVar273 [16];
  undefined1 auVar274 [32];
  float fVar281;
  float fVar282;
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [64];
  float fVar288;
  float fVar291;
  undefined1 auVar289 [16];
  float fVar292;
  float fVar293;
  float fVar294;
  float fVar295;
  float fVar296;
  undefined1 auVar297 [16];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  float fVar302;
  float fVar306;
  float fVar307;
  undefined1 auVar303 [16];
  float fVar308;
  float fVar309;
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  float fVar310;
  float fVar311;
  float fVar315;
  float fVar317;
  float fVar319;
  undefined1 auVar312 [32];
  float fVar314;
  float fVar316;
  float fVar318;
  undefined1 auVar313 [64];
  float fVar320;
  float fVar321;
  float fVar324;
  float fVar325;
  float fVar326;
  float fVar327;
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar328 [16];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  int local_804;
  undefined1 local_800 [16];
  long local_7f0;
  Precalculations *local_7e8;
  Primitive *local_7e0;
  undefined4 local_7d4;
  undefined1 local_7d0 [8];
  undefined8 uStack_7c8;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [32];
  undefined1 local_760 [8];
  undefined8 uStack_758;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  ulong local_728;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  RTCFilterFunctionNArguments local_690;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  undefined8 local_630;
  undefined4 local_628;
  float local_624;
  uint local_620;
  undefined4 local_61c;
  undefined4 local_618;
  uint local_614;
  uint local_610;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_550 [8];
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [8];
  undefined8 uStack_538;
  undefined1 local_530 [8];
  undefined8 uStack_528;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [32];
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [8];
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [32];
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  uint local_260;
  uint local_25c;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined1 local_220 [16];
  undefined1 local_200 [32];
  float local_1e0 [4];
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  ulong uVar116;
  undefined1 auVar158 [24];
  undefined1 auVar189 [64];
  undefined1 auVar278 [64];
  undefined1 auVar290 [12];
  
  PVar8 = prim[1];
  uVar108 = (ulong)(byte)PVar8;
  fVar222 = *(float *)(prim + uVar108 * 0x19 + 0x12);
  auVar184 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + uVar108 * 0x19 + 6));
  auVar248._0_4_ = fVar222 * (ray->dir).field_0.m128[0];
  auVar248._4_4_ = fVar222 * (ray->dir).field_0.m128[1];
  auVar248._8_4_ = fVar222 * (ray->dir).field_0.m128[2];
  auVar248._12_4_ = fVar222 * (ray->dir).field_0.m128[3];
  auVar328 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar108 * 4 + 6)));
  auVar153._0_4_ = fVar222 * auVar184._0_4_;
  auVar153._4_4_ = fVar222 * auVar184._4_4_;
  auVar153._8_4_ = fVar222 * auVar184._8_4_;
  auVar153._12_4_ = fVar222 * auVar184._12_4_;
  auVar184 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar108 * 5 + 6)));
  auVar328 = vcvtdq2ps_avx(auVar328);
  auVar207 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar108 * 6 + 6)));
  auVar184 = vcvtdq2ps_avx(auVar184);
  auVar198 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar108 * 0xb + 6)));
  auVar207 = vcvtdq2ps_avx(auVar207);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar108 * 0xc + 6)));
  auVar198 = vcvtdq2ps_avx(auVar198);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar108 * 0xd + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar122 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar108 * 0x12 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar123 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar108 * 0x13 + 6)));
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar155 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar108 * 0x14 + 6)));
  auVar123 = vcvtdq2ps_avx(auVar123);
  auVar155 = vcvtdq2ps_avx(auVar155);
  auVar121 = vshufps_avx(auVar248,auVar248,0);
  auVar154 = vshufps_avx(auVar248,auVar248,0x55);
  auVar177 = vshufps_avx(auVar248,auVar248,0xaa);
  fVar222 = auVar177._0_4_;
  fVar195 = auVar177._4_4_;
  fVar229 = auVar177._8_4_;
  fVar200 = auVar177._12_4_;
  fVar233 = auVar154._0_4_;
  fVar240 = auVar154._4_4_;
  fVar242 = auVar154._8_4_;
  fVar244 = auVar154._12_4_;
  fVar230 = auVar121._0_4_;
  fVar201 = auVar121._4_4_;
  fVar231 = auVar121._8_4_;
  fVar202 = auVar121._12_4_;
  auVar297._0_4_ = fVar230 * auVar328._0_4_ + fVar233 * auVar184._0_4_ + fVar222 * auVar207._0_4_;
  auVar297._4_4_ = fVar201 * auVar328._4_4_ + fVar240 * auVar184._4_4_ + fVar195 * auVar207._4_4_;
  auVar297._8_4_ = fVar231 * auVar328._8_4_ + fVar242 * auVar184._8_4_ + fVar229 * auVar207._8_4_;
  auVar297._12_4_ =
       fVar202 * auVar328._12_4_ + fVar244 * auVar184._12_4_ + fVar200 * auVar207._12_4_;
  auVar303._0_4_ = fVar230 * auVar198._0_4_ + fVar233 * auVar14._0_4_ + auVar15._0_4_ * fVar222;
  auVar303._4_4_ = fVar201 * auVar198._4_4_ + fVar240 * auVar14._4_4_ + auVar15._4_4_ * fVar195;
  auVar303._8_4_ = fVar231 * auVar198._8_4_ + fVar242 * auVar14._8_4_ + auVar15._8_4_ * fVar229;
  auVar303._12_4_ = fVar202 * auVar198._12_4_ + fVar244 * auVar14._12_4_ + auVar15._12_4_ * fVar200;
  auVar249._0_4_ = fVar230 * auVar122._0_4_ + fVar233 * auVar123._0_4_ + auVar155._0_4_ * fVar222;
  auVar249._4_4_ = fVar201 * auVar122._4_4_ + fVar240 * auVar123._4_4_ + auVar155._4_4_ * fVar195;
  auVar249._8_4_ = fVar231 * auVar122._8_4_ + fVar242 * auVar123._8_4_ + auVar155._8_4_ * fVar229;
  auVar249._12_4_ =
       fVar202 * auVar122._12_4_ + fVar244 * auVar123._12_4_ + auVar155._12_4_ * fVar200;
  auVar121 = vshufps_avx(auVar153,auVar153,0);
  auVar154 = vshufps_avx(auVar153,auVar153,0x55);
  auVar177 = vshufps_avx(auVar153,auVar153,0xaa);
  fVar222 = auVar177._0_4_;
  fVar195 = auVar177._4_4_;
  fVar229 = auVar177._8_4_;
  fVar200 = auVar177._12_4_;
  fVar233 = auVar154._0_4_;
  fVar240 = auVar154._4_4_;
  fVar242 = auVar154._8_4_;
  fVar244 = auVar154._12_4_;
  fVar230 = auVar121._0_4_;
  fVar201 = auVar121._4_4_;
  fVar231 = auVar121._8_4_;
  fVar202 = auVar121._12_4_;
  auVar204._0_4_ = fVar230 * auVar328._0_4_ + fVar233 * auVar184._0_4_ + fVar222 * auVar207._0_4_;
  auVar204._4_4_ = fVar201 * auVar328._4_4_ + fVar240 * auVar184._4_4_ + fVar195 * auVar207._4_4_;
  auVar204._8_4_ = fVar231 * auVar328._8_4_ + fVar242 * auVar184._8_4_ + fVar229 * auVar207._8_4_;
  auVar204._12_4_ =
       fVar202 * auVar328._12_4_ + fVar244 * auVar184._12_4_ + fVar200 * auVar207._12_4_;
  auVar154._0_4_ = fVar230 * auVar198._0_4_ + auVar15._0_4_ * fVar222 + fVar233 * auVar14._0_4_;
  auVar154._4_4_ = fVar201 * auVar198._4_4_ + auVar15._4_4_ * fVar195 + fVar240 * auVar14._4_4_;
  auVar154._8_4_ = fVar231 * auVar198._8_4_ + auVar15._8_4_ * fVar229 + fVar242 * auVar14._8_4_;
  auVar154._12_4_ = fVar202 * auVar198._12_4_ + auVar15._12_4_ * fVar200 + fVar244 * auVar14._12_4_;
  auVar121._0_4_ = fVar233 * auVar123._0_4_ + auVar155._0_4_ * fVar222 + fVar230 * auVar122._0_4_;
  auVar121._4_4_ = fVar240 * auVar123._4_4_ + auVar155._4_4_ * fVar195 + fVar201 * auVar122._4_4_;
  auVar121._8_4_ = fVar242 * auVar123._8_4_ + auVar155._8_4_ * fVar229 + fVar231 * auVar122._8_4_;
  auVar121._12_4_ =
       fVar244 * auVar123._12_4_ + auVar155._12_4_ * fVar200 + fVar202 * auVar122._12_4_;
  auVar235._8_4_ = 0x7fffffff;
  auVar235._0_8_ = 0x7fffffff7fffffff;
  auVar235._12_4_ = 0x7fffffff;
  auVar328 = vandps_avx(auVar297,auVar235);
  auVar196._8_4_ = 0x219392ef;
  auVar196._0_8_ = 0x219392ef219392ef;
  auVar196._12_4_ = 0x219392ef;
  auVar328 = vcmpps_avx(auVar328,auVar196,1);
  auVar184 = vblendvps_avx(auVar297,auVar196,auVar328);
  auVar328 = vandps_avx(auVar303,auVar235);
  auVar328 = vcmpps_avx(auVar328,auVar196,1);
  auVar207 = vblendvps_avx(auVar303,auVar196,auVar328);
  auVar328 = vandps_avx(auVar249,auVar235);
  auVar328 = vcmpps_avx(auVar328,auVar196,1);
  auVar328 = vblendvps_avx(auVar249,auVar196,auVar328);
  auVar198 = vrcpps_avx(auVar184);
  fVar233 = auVar198._0_4_;
  auVar177._0_4_ = fVar233 * auVar184._0_4_;
  fVar240 = auVar198._4_4_;
  auVar177._4_4_ = fVar240 * auVar184._4_4_;
  fVar242 = auVar198._8_4_;
  auVar177._8_4_ = fVar242 * auVar184._8_4_;
  fVar244 = auVar198._12_4_;
  auVar177._12_4_ = fVar244 * auVar184._12_4_;
  auVar250._8_4_ = 0x3f800000;
  auVar250._0_8_ = 0x3f8000003f800000;
  auVar250._12_4_ = 0x3f800000;
  auVar184 = vsubps_avx(auVar250,auVar177);
  fVar233 = fVar233 + fVar233 * auVar184._0_4_;
  fVar240 = fVar240 + fVar240 * auVar184._4_4_;
  fVar242 = fVar242 + fVar242 * auVar184._8_4_;
  fVar244 = fVar244 + fVar244 * auVar184._12_4_;
  auVar184 = vrcpps_avx(auVar207);
  fVar222 = auVar184._0_4_;
  auVar223._0_4_ = fVar222 * auVar207._0_4_;
  fVar229 = auVar184._4_4_;
  auVar223._4_4_ = fVar229 * auVar207._4_4_;
  fVar230 = auVar184._8_4_;
  auVar223._8_4_ = fVar230 * auVar207._8_4_;
  fVar231 = auVar184._12_4_;
  auVar223._12_4_ = fVar231 * auVar207._12_4_;
  auVar184 = vsubps_avx(auVar250,auVar223);
  fVar222 = fVar222 + fVar222 * auVar184._0_4_;
  fVar229 = fVar229 + fVar229 * auVar184._4_4_;
  fVar230 = fVar230 + fVar230 * auVar184._8_4_;
  fVar231 = fVar231 + fVar231 * auVar184._12_4_;
  auVar184 = vrcpps_avx(auVar328);
  fVar195 = auVar184._0_4_;
  auVar197._0_4_ = fVar195 * auVar328._0_4_;
  fVar200 = auVar184._4_4_;
  auVar197._4_4_ = fVar200 * auVar328._4_4_;
  fVar201 = auVar184._8_4_;
  auVar197._8_4_ = fVar201 * auVar328._8_4_;
  fVar202 = auVar184._12_4_;
  auVar197._12_4_ = fVar202 * auVar328._12_4_;
  auVar328 = vsubps_avx(auVar250,auVar197);
  fVar195 = fVar195 + fVar195 * auVar328._0_4_;
  fVar200 = fVar200 + fVar200 * auVar328._4_4_;
  fVar201 = fVar201 + fVar201 * auVar328._8_4_;
  fVar202 = fVar202 + fVar202 * auVar328._12_4_;
  auVar328._8_8_ = 0;
  auVar328._0_8_ = *(ulong *)(prim + uVar108 * 7 + 6);
  auVar328 = vpmovsxwd_avx(auVar328);
  auVar328 = vcvtdq2ps_avx(auVar328);
  auVar207 = vsubps_avx(auVar328,auVar204);
  auVar184._8_8_ = 0;
  auVar184._0_8_ = *(ulong *)(prim + uVar108 * 9 + 6);
  auVar328 = vpmovsxwd_avx(auVar184);
  auVar178._0_4_ = fVar233 * auVar207._0_4_;
  auVar178._4_4_ = fVar240 * auVar207._4_4_;
  auVar178._8_4_ = fVar242 * auVar207._8_4_;
  auVar178._12_4_ = fVar244 * auVar207._12_4_;
  auVar328 = vcvtdq2ps_avx(auVar328);
  auVar328 = vsubps_avx(auVar328,auVar204);
  auVar205._0_4_ = fVar233 * auVar328._0_4_;
  auVar205._4_4_ = fVar240 * auVar328._4_4_;
  auVar205._8_4_ = fVar242 * auVar328._8_4_;
  auVar205._12_4_ = fVar244 * auVar328._12_4_;
  auVar207._8_8_ = 0;
  auVar207._0_8_ = *(ulong *)(prim + uVar108 * 0xe + 6);
  auVar328 = vpmovsxwd_avx(auVar207);
  auVar328 = vcvtdq2ps_avx(auVar328);
  auVar184 = vsubps_avx(auVar328,auVar154);
  auVar198._8_8_ = 0;
  auVar198._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  auVar328 = vpmovsxwd_avx(auVar198);
  auVar236._0_4_ = auVar184._0_4_ * fVar222;
  auVar236._4_4_ = auVar184._4_4_ * fVar229;
  auVar236._8_4_ = auVar184._8_4_ * fVar230;
  auVar236._12_4_ = auVar184._12_4_ * fVar231;
  auVar328 = vcvtdq2ps_avx(auVar328);
  auVar328 = vsubps_avx(auVar328,auVar154);
  auVar155._0_4_ = fVar222 * auVar328._0_4_;
  auVar155._4_4_ = fVar229 * auVar328._4_4_;
  auVar155._8_4_ = fVar230 * auVar328._8_4_;
  auVar155._12_4_ = fVar231 * auVar328._12_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar108 * 0x15 + 6);
  auVar328 = vpmovsxwd_avx(auVar14);
  auVar328 = vcvtdq2ps_avx(auVar328);
  auVar328 = vsubps_avx(auVar328,auVar121);
  auVar224._0_4_ = auVar328._0_4_ * fVar195;
  auVar224._4_4_ = auVar328._4_4_ * fVar200;
  auVar224._8_4_ = auVar328._8_4_ * fVar201;
  auVar224._12_4_ = auVar328._12_4_ * fVar202;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar108 * 0x17 + 6);
  auVar328 = vpmovsxwd_avx(auVar15);
  auVar328 = vcvtdq2ps_avx(auVar328);
  auVar328 = vsubps_avx(auVar328,auVar121);
  auVar122._0_4_ = auVar328._0_4_ * fVar195;
  auVar122._4_4_ = auVar328._4_4_ * fVar200;
  auVar122._8_4_ = auVar328._8_4_ * fVar201;
  auVar122._12_4_ = auVar328._12_4_ * fVar202;
  auVar328 = vpminsd_avx(auVar178,auVar205);
  auVar184 = vpminsd_avx(auVar236,auVar155);
  auVar328 = vmaxps_avx(auVar328,auVar184);
  auVar184 = vpminsd_avx(auVar224,auVar122);
  uVar115 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar273._4_4_ = uVar115;
  auVar273._0_4_ = uVar115;
  auVar273._8_4_ = uVar115;
  auVar273._12_4_ = uVar115;
  auVar278 = ZEXT1664(auVar273);
  auVar184 = vmaxps_avx(auVar184,auVar273);
  auVar328 = vmaxps_avx(auVar328,auVar184);
  auVar265 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
  local_2d0._0_4_ = auVar328._0_4_ * 0.99999964;
  local_2d0._4_4_ = auVar328._4_4_ * 0.99999964;
  local_2d0._8_4_ = auVar328._8_4_ * 0.99999964;
  local_2d0._12_4_ = auVar328._12_4_ * 0.99999964;
  auVar328 = vpmaxsd_avx(auVar178,auVar205);
  auVar184 = vpmaxsd_avx(auVar236,auVar155);
  auVar328 = vminps_avx(auVar328,auVar184);
  auVar184 = vpmaxsd_avx(auVar224,auVar122);
  fVar222 = ray->tfar;
  auVar179._4_4_ = fVar222;
  auVar179._0_4_ = fVar222;
  auVar179._8_4_ = fVar222;
  auVar179._12_4_ = fVar222;
  auVar184 = vminps_avx(auVar184,auVar179);
  auVar328 = vminps_avx(auVar328,auVar184);
  auVar123._0_4_ = auVar328._0_4_ * 1.0000004;
  auVar123._4_4_ = auVar328._4_4_ * 1.0000004;
  auVar123._8_4_ = auVar328._8_4_ * 1.0000004;
  auVar123._12_4_ = auVar328._12_4_ * 1.0000004;
  auVar328 = vpshufd_avx(ZEXT116((byte)PVar8),0);
  auVar184 = vpcmpgtd_avx(auVar328,_DAT_01f4ad30);
  auVar328 = vcmpps_avx(local_2d0,auVar123,2);
  auVar328 = vandps_avx(auVar328,auVar184);
  local_4e0 = mm_lookupmask_ps._16_8_;
  uStack_4d8 = mm_lookupmask_ps._24_8_;
  uStack_4d0 = mm_lookupmask_ps._16_8_;
  uStack_4c8 = mm_lookupmask_ps._24_8_;
  uVar115 = vmovmskps_avx(auVar328);
  uVar116 = CONCAT44((int)((ulong)unaff_RBX >> 0x20),uVar115);
  local_7e8 = pre;
  local_7e0 = prim;
  while (uVar116 != 0) {
    auVar274 = auVar278._0_32_;
    auVar163 = auVar265._0_32_;
    lVar109 = 0;
    if (uVar116 != 0) {
      for (; (uVar116 >> lVar109 & 1) == 0; lVar109 = lVar109 + 1) {
      }
    }
    uVar117 = uVar116 - 1 & uVar116;
    local_7d4 = *(undefined4 *)(local_7e0 + lVar109 * 4 + 6);
    lVar109 = lVar109 * 0x40;
    lVar112 = 0;
    if (uVar117 != 0) {
      for (; (uVar117 >> lVar112 & 1) == 0; lVar112 = lVar112 + 1) {
      }
    }
    local_728 = (ulong)*(uint *)(local_7e0 + 2);
    pGVar9 = (context->scene->geometries).items[*(uint *)(local_7e0 + 2)].ptr;
    _local_7d0 = *(undefined1 (*) [16])(prim + lVar109 + uVar108 * 0x19 + 0x16);
    if (((uVar117 != 0) && (uVar113 = uVar117 - 1 & uVar117, uVar113 != 0)) &&
       (lVar112 = 0, uVar113 != 0)) {
      for (; (uVar113 >> lVar112 & 1) == 0; lVar112 = lVar112 + 1) {
      }
    }
    _local_530 = *(undefined1 (*) [16])(prim + lVar109 + uVar108 * 0x19 + 0x26);
    _local_540 = *(undefined1 (*) [16])(prim + lVar109 + uVar108 * 0x19 + 0x36);
    _local_550 = *(undefined1 (*) [16])(prim + lVar109 + uVar108 * 0x19 + 0x46);
    uVar107 = (uint)pGVar9[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    aVar7 = (ray->org).field_0;
    auVar207 = vsubps_avx(_local_7d0,(undefined1  [16])aVar7);
    auVar122 = _local_7d0;
    auVar328 = vshufps_avx(auVar207,auVar207,0);
    auVar184 = vshufps_avx(auVar207,auVar207,0x55);
    auVar207 = vshufps_avx(auVar207,auVar207,0xaa);
    fVar222 = (local_7e8->ray_space).vx.field_0.m128[0];
    fVar195 = (local_7e8->ray_space).vx.field_0.m128[1];
    fVar229 = (local_7e8->ray_space).vx.field_0.m128[2];
    fVar200 = (local_7e8->ray_space).vx.field_0.m128[3];
    fVar230 = (local_7e8->ray_space).vy.field_0.m128[0];
    fVar201 = (local_7e8->ray_space).vy.field_0.m128[1];
    fVar231 = (local_7e8->ray_space).vy.field_0.m128[2];
    fVar202 = (local_7e8->ray_space).vy.field_0.m128[3];
    fVar233 = (local_7e8->ray_space).vz.field_0.m128[0];
    fVar240 = (local_7e8->ray_space).vz.field_0.m128[1];
    fVar242 = (local_7e8->ray_space).vz.field_0.m128[2];
    fVar244 = (local_7e8->ray_space).vz.field_0.m128[3];
    auVar206._0_4_ = auVar328._0_4_ * fVar222 + auVar207._0_4_ * fVar233 + auVar184._0_4_ * fVar230;
    auVar206._4_4_ = auVar328._4_4_ * fVar195 + auVar207._4_4_ * fVar240 + auVar184._4_4_ * fVar201;
    auVar206._8_4_ = auVar328._8_4_ * fVar229 + auVar207._8_4_ * fVar242 + auVar184._8_4_ * fVar231;
    auVar206._12_4_ =
         auVar328._12_4_ * fVar200 + auVar207._12_4_ * fVar244 + auVar184._12_4_ * fVar202;
    auVar328 = vblendps_avx(auVar206,_local_7d0,8);
    auVar198 = vsubps_avx(_local_530,(undefined1  [16])aVar7);
    auVar184 = vshufps_avx(auVar198,auVar198,0);
    auVar207 = vshufps_avx(auVar198,auVar198,0x55);
    auVar198 = vshufps_avx(auVar198,auVar198,0xaa);
    auVar180._0_4_ = auVar184._0_4_ * fVar222 + auVar198._0_4_ * fVar233 + auVar207._0_4_ * fVar230;
    auVar180._4_4_ = auVar184._4_4_ * fVar195 + auVar198._4_4_ * fVar240 + auVar207._4_4_ * fVar201;
    auVar180._8_4_ = auVar184._8_4_ * fVar229 + auVar198._8_4_ * fVar242 + auVar207._8_4_ * fVar231;
    auVar180._12_4_ =
         auVar184._12_4_ * fVar200 + auVar198._12_4_ * fVar244 + auVar207._12_4_ * fVar202;
    auVar184 = vblendps_avx(auVar180,_local_530,8);
    auVar14 = vsubps_avx(_local_540,(undefined1  [16])aVar7);
    auVar207 = vshufps_avx(auVar14,auVar14,0);
    auVar198 = vshufps_avx(auVar14,auVar14,0x55);
    auVar14 = vshufps_avx(auVar14,auVar14,0xaa);
    auVar251._0_4_ = auVar207._0_4_ * fVar222 + auVar198._0_4_ * fVar230 + auVar14._0_4_ * fVar233;
    auVar251._4_4_ = auVar207._4_4_ * fVar195 + auVar198._4_4_ * fVar201 + auVar14._4_4_ * fVar240;
    auVar251._8_4_ = auVar207._8_4_ * fVar229 + auVar198._8_4_ * fVar231 + auVar14._8_4_ * fVar242;
    auVar251._12_4_ =
         auVar207._12_4_ * fVar200 + auVar198._12_4_ * fVar202 + auVar14._12_4_ * fVar244;
    auVar207 = vblendps_avx(auVar251,_local_540,8);
    auVar15 = vsubps_avx(_local_550,(undefined1  [16])aVar7);
    auVar198 = vshufps_avx(auVar15,auVar15,0);
    auVar14 = vshufps_avx(auVar15,auVar15,0x55);
    auVar15 = vshufps_avx(auVar15,auVar15,0xaa);
    auVar156._0_4_ = auVar198._0_4_ * fVar222 + auVar15._0_4_ * fVar233 + auVar14._0_4_ * fVar230;
    auVar156._4_4_ = auVar198._4_4_ * fVar195 + auVar15._4_4_ * fVar240 + auVar14._4_4_ * fVar201;
    auVar156._8_4_ = auVar198._8_4_ * fVar229 + auVar15._8_4_ * fVar242 + auVar14._8_4_ * fVar231;
    auVar156._12_4_ =
         auVar198._12_4_ * fVar200 + auVar15._12_4_ * fVar244 + auVar14._12_4_ * fVar202;
    auVar198 = vblendps_avx(auVar156,_local_550,8);
    auVar237._8_4_ = 0x7fffffff;
    auVar237._0_8_ = 0x7fffffff7fffffff;
    auVar237._12_4_ = 0x7fffffff;
    auVar328 = vandps_avx(auVar328,auVar237);
    auVar184 = vandps_avx(auVar184,auVar237);
    auVar14 = vmaxps_avx(auVar328,auVar184);
    auVar328 = vandps_avx(auVar207,auVar237);
    auVar184 = vandps_avx(auVar198,auVar237);
    auVar328 = vmaxps_avx(auVar328,auVar184);
    auVar328 = vmaxps_avx(auVar14,auVar328);
    auVar184 = vmovshdup_avx(auVar328);
    auVar184 = vmaxss_avx(auVar184,auVar328);
    auVar328 = vshufpd_avx(auVar328,auVar328,1);
    auVar328 = vmaxss_avx(auVar328,auVar184);
    local_7f0 = (long)(int)uVar107;
    lVar109 = local_7f0 * 0x44;
    fVar222 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar109 + 0x908);
    fVar195 = *(float *)(bspline_basis0 + lVar109 + 0x90c);
    fVar229 = *(float *)(bspline_basis0 + lVar109 + 0x910);
    fVar200 = *(float *)(bspline_basis0 + lVar109 + 0x914);
    fVar230 = *(float *)(bspline_basis0 + lVar109 + 0x918);
    fVar201 = *(float *)(bspline_basis0 + lVar109 + 0x91c);
    fVar231 = *(float *)(bspline_basis0 + lVar109 + 0x920);
    auVar106 = *(undefined1 (*) [28])(bspline_basis0 + lVar109 + 0x908);
    auVar184 = vshufps_avx(auVar251,auVar251,0);
    register0x00001250 = auVar184;
    _local_7a0 = auVar184;
    auVar207 = vshufps_avx(auVar251,auVar251,0x55);
    local_6e0._16_16_ = auVar207;
    local_6e0._0_16_ = auVar207;
    fVar202 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar109 + 0xd8c);
    fVar233 = *(float *)(bspline_basis0 + lVar109 + 0xd90);
    fVar240 = *(float *)(bspline_basis0 + lVar109 + 0xd94);
    fVar242 = *(float *)(bspline_basis0 + lVar109 + 0xd98);
    fVar244 = *(float *)(bspline_basis0 + lVar109 + 0xd9c);
    fVar291 = *(float *)(bspline_basis0 + lVar109 + 0xda0);
    fVar149 = *(float *)(bspline_basis0 + lVar109 + 0xda4);
    auVar105 = *(undefined1 (*) [28])(bspline_basis0 + lVar109 + 0xd8c);
    auVar198 = vshufps_avx(auVar156,auVar156,0);
    register0x00001210 = auVar198;
    _local_440 = auVar198;
    fVar118 = auVar198._0_4_;
    fVar137 = auVar198._4_4_;
    fVar140 = auVar198._8_4_;
    fVar143 = auVar198._12_4_;
    fVar151 = auVar184._0_4_;
    fVar165 = auVar184._4_4_;
    fVar167 = auVar184._8_4_;
    fVar169 = auVar184._12_4_;
    auVar184 = vshufps_avx(auVar156,auVar156,0x55);
    register0x00001590 = auVar184;
    _local_580 = auVar184;
    fVar310 = auVar184._0_4_;
    fVar314 = auVar184._4_4_;
    fVar316 = auVar184._8_4_;
    fVar318 = auVar184._12_4_;
    fVar175 = auVar207._0_4_;
    fVar190 = auVar207._4_4_;
    fVar192 = auVar207._8_4_;
    fVar245 = auVar207._12_4_;
    auVar15 = _local_540;
    auVar184 = vshufps_avx(_local_540,_local_540,0xff);
    register0x00001390 = auVar184;
    _local_80 = auVar184;
    auVar207 = vshufps_avx(_local_550,_local_550,0xff);
    register0x00001450 = auVar207;
    _local_a0 = auVar207;
    fVar272 = auVar207._0_4_;
    fVar279 = auVar207._4_4_;
    fVar280 = auVar207._8_4_;
    fVar281 = auVar207._12_4_;
    fVar234 = auVar184._0_4_;
    fVar241 = auVar184._4_4_;
    fVar243 = auVar184._8_4_;
    auVar207 = vshufps_avx(auVar180,auVar180,0);
    register0x00001290 = auVar207;
    _local_340 = auVar207;
    fVar292 = *(float *)(bspline_basis0 + lVar109 + 0x484);
    fVar309 = *(float *)(bspline_basis0 + lVar109 + 0x488);
    fVar294 = *(float *)(bspline_basis0 + lVar109 + 0x48c);
    fVar293 = *(float *)(bspline_basis0 + lVar109 + 0x490);
    fVar295 = *(float *)(bspline_basis0 + lVar109 + 0x494);
    fVar296 = *(float *)(bspline_basis0 + lVar109 + 0x498);
    fVar261 = *(float *)(bspline_basis0 + lVar109 + 0x49c);
    fVar176 = auVar207._0_4_;
    fVar191 = auVar207._4_4_;
    fVar150 = auVar207._8_4_;
    fVar193 = auVar207._12_4_;
    auVar207 = vshufps_avx(auVar180,auVar180,0x55);
    register0x00001210 = auVar207;
    _local_600 = auVar207;
    fVar119 = auVar207._0_4_;
    fVar138 = auVar207._4_4_;
    fVar141 = auVar207._8_4_;
    fVar144 = auVar207._12_4_;
    auVar123 = _local_530;
    auVar207 = vshufps_avx(_local_530,_local_530,0xff);
    register0x000015d0 = auVar207;
    _local_c0 = auVar207;
    fVar320 = auVar207._0_4_;
    fVar324 = auVar207._4_4_;
    fVar247 = auVar207._8_4_;
    fVar256 = auVar207._12_4_;
    auVar207 = vshufps_avx(auVar206,auVar206,0);
    register0x000014d0 = auVar207;
    _local_320 = auVar207;
    local_480 = *(float *)(bspline_basis0 + lVar109);
    fStack_47c = *(float *)(bspline_basis0 + lVar109 + 4);
    fStack_478 = *(float *)(bspline_basis0 + lVar109 + 8);
    fStack_474 = *(float *)(bspline_basis0 + lVar109 + 0xc);
    fStack_470 = *(float *)(bspline_basis0 + lVar109 + 0x10);
    fStack_46c = *(float *)(bspline_basis0 + lVar109 + 0x14);
    fStack_468 = *(float *)(bspline_basis0 + lVar109 + 0x18);
    fVar288 = auVar207._0_4_;
    fStack_49c = auVar207._4_4_;
    fStack_498 = auVar207._8_4_;
    fStack_494 = auVar207._12_4_;
    auVar283._0_4_ = fVar288 * local_480 + fVar176 * fVar292 + fVar151 * fVar222 + fVar118 * fVar202
    ;
    auVar283._4_4_ =
         fStack_49c * fStack_47c + fVar191 * fVar309 + fVar165 * fVar195 + fVar137 * fVar233;
    auVar283._8_4_ =
         fStack_498 * fStack_478 + fVar150 * fVar294 + fVar167 * fVar229 + fVar140 * fVar240;
    auVar283._12_4_ =
         fStack_494 * fStack_474 + fVar193 * fVar293 + fVar169 * fVar200 + fVar143 * fVar242;
    auVar283._16_4_ =
         fVar288 * fStack_470 + fVar176 * fVar295 + fVar151 * fVar230 + fVar118 * fVar244;
    auVar283._20_4_ =
         fStack_49c * fStack_46c + fVar191 * fVar296 + fVar165 * fVar201 + fVar137 * fVar291;
    auVar283._24_4_ =
         fStack_498 * fStack_468 + fVar150 * fVar261 + fVar167 * fVar231 + fVar140 * fVar149;
    auVar283._28_4_ = *(float *)(bspline_basis0 + lVar109 + 0x924) + fVar169 + fVar143 + 0.0;
    auVar198 = vshufps_avx(auVar206,auVar206,0x55);
    register0x00001250 = auVar198;
    _local_660 = auVar198;
    fVar152 = auVar198._0_4_;
    fVar166 = auVar198._4_4_;
    fVar168 = auVar198._8_4_;
    fVar170 = auVar198._12_4_;
    local_360._0_4_ =
         fVar152 * local_480 + fVar119 * fVar292 + fVar175 * fVar222 + fVar310 * fVar202;
    local_360._4_4_ =
         fVar166 * fStack_47c + fVar138 * fVar309 + fVar190 * fVar195 + fVar314 * fVar233;
    local_360._8_4_ =
         fVar168 * fStack_478 + fVar141 * fVar294 + fVar192 * fVar229 + fVar316 * fVar240;
    local_360._12_4_ =
         fVar170 * fStack_474 + fVar144 * fVar293 + fVar245 * fVar200 + fVar318 * fVar242;
    local_360._16_4_ =
         fVar152 * fStack_470 + fVar119 * fVar295 + fVar175 * fVar230 + fVar310 * fVar244;
    local_360._20_4_ =
         fVar166 * fStack_46c + fVar138 * fVar296 + fVar190 * fVar201 + fVar314 * fVar291;
    local_360._24_4_ =
         fVar168 * fStack_468 + fVar141 * fVar261 + fVar192 * fVar231 + fVar316 * fVar149;
    local_360._28_4_ = 0.0;
    auVar198 = vpermilps_avx(_local_7d0,0xff);
    register0x000013d0 = auVar198;
    _local_120 = auVar198;
    fStack_464 = (float)*(undefined4 *)(bspline_basis0 + lVar109 + 0x1c);
    fVar246 = auVar198._0_4_;
    fVar255 = auVar198._4_4_;
    fVar257 = auVar198._8_4_;
    local_780._0_4_ =
         fVar246 * local_480 + fVar320 * fVar292 + fVar234 * fVar222 + fVar272 * fVar202;
    local_780._4_4_ =
         fVar255 * fStack_47c + fVar324 * fVar309 + fVar241 * fVar195 + fVar279 * fVar233;
    local_780._8_4_ =
         fVar257 * fStack_478 + fVar247 * fVar294 + fVar243 * fVar229 + fVar280 * fVar240;
    local_780._12_4_ =
         auVar198._12_4_ * fStack_474 +
         fVar256 * fVar293 + auVar184._12_4_ * fVar200 + fVar281 * fVar242;
    local_780._16_4_ =
         fVar246 * fStack_470 + fVar320 * fVar295 + fVar234 * fVar230 + fVar272 * fVar244;
    local_780._20_4_ =
         fVar255 * fStack_46c + fVar324 * fVar296 + fVar241 * fVar201 + fVar279 * fVar291;
    local_780._24_4_ =
         fVar257 * fStack_468 + fVar247 * fVar261 + fVar243 * fVar231 + fVar280 * fVar149;
    local_780._28_4_ = 0;
    fVar216 = *(float *)(bspline_basis1 + lVar109 + 0x908);
    fVar171 = *(float *)(bspline_basis1 + lVar109 + 0x90c);
    fVar266 = *(float *)(bspline_basis1 + lVar109 + 0x910);
    fVar267 = *(float *)(bspline_basis1 + lVar109 + 0x914);
    fVar218 = *(float *)(bspline_basis1 + lVar109 + 0x918);
    fVar172 = *(float *)(bspline_basis1 + lVar109 + 0x91c);
    fVar268 = *(float *)(bspline_basis1 + lVar109 + 0x920);
    fVar269 = *(float *)(bspline_basis1 + lVar109 + 0xd8c);
    fVar220 = *(float *)(bspline_basis1 + lVar109 + 0xd90);
    fVar173 = *(float *)(bspline_basis1 + lVar109 + 0xd94);
    fVar270 = *(float *)(bspline_basis1 + lVar109 + 0xd98);
    fVar271 = *(float *)(bspline_basis1 + lVar109 + 0xd9c);
    fVar221 = *(float *)(bspline_basis1 + lVar109 + 0xda0);
    fVar174 = *(float *)(bspline_basis1 + lVar109 + 0xda4);
    fVar194 = *(float *)(bspline_basis1 + lVar109 + 0x484);
    fVar120 = *(float *)(bspline_basis1 + lVar109 + 0x488);
    fVar139 = *(float *)(bspline_basis1 + lVar109 + 0x48c);
    fVar142 = *(float *)(bspline_basis1 + lVar109 + 0x490);
    fVar145 = *(float *)(bspline_basis1 + lVar109 + 0x494);
    fVar146 = *(float *)(bspline_basis1 + lVar109 + 0x498);
    fVar147 = *(float *)(bspline_basis1 + lVar109 + 0x49c);
    fVar232 = fVar281 + 0.0 + 0.0;
    fVar148 = *(float *)(bspline_basis1 + lVar109);
    fVar203 = *(float *)(bspline_basis1 + lVar109 + 4);
    fVar213 = *(float *)(bspline_basis1 + lVar109 + 8);
    fVar214 = *(float *)(bspline_basis1 + lVar109 + 0xc);
    fVar215 = *(float *)(bspline_basis1 + lVar109 + 0x10);
    fVar217 = *(float *)(bspline_basis1 + lVar109 + 0x14);
    fVar219 = *(float *)(bspline_basis1 + lVar109 + 0x18);
    auVar186._0_4_ = fVar288 * fVar148 + fVar194 * fVar176 + fVar216 * fVar151 + fVar269 * fVar118;
    auVar186._4_4_ =
         fStack_49c * fVar203 + fVar120 * fVar191 + fVar171 * fVar165 + fVar220 * fVar137;
    auVar186._8_4_ =
         fStack_498 * fVar213 + fVar139 * fVar150 + fVar266 * fVar167 + fVar173 * fVar140;
    auVar186._12_4_ =
         fStack_494 * fVar214 + fVar142 * fVar193 + fVar267 * fVar169 + fVar270 * fVar143;
    auVar186._16_4_ = fVar288 * fVar215 + fVar145 * fVar176 + fVar218 * fVar151 + fVar271 * fVar118;
    auVar186._20_4_ =
         fStack_49c * fVar217 + fVar146 * fVar191 + fVar172 * fVar165 + fVar221 * fVar137;
    auVar186._24_4_ =
         fStack_498 * fVar219 + fVar147 * fVar150 + fVar268 * fVar167 + fVar174 * fVar140;
    auVar186._28_4_ = fVar256 + fVar318 + 0.0;
    auVar189 = ZEXT3264(auVar186);
    local_380._0_4_ = fVar152 * fVar148 + fVar194 * fVar119 + fVar216 * fVar175 + fVar310 * fVar269;
    local_380._4_4_ = fVar166 * fVar203 + fVar120 * fVar138 + fVar171 * fVar190 + fVar314 * fVar220;
    local_380._8_4_ = fVar168 * fVar213 + fVar139 * fVar141 + fVar266 * fVar192 + fVar316 * fVar173;
    local_380._12_4_ = fVar170 * fVar214 + fVar142 * fVar144 + fVar267 * fVar245 + fVar318 * fVar270
    ;
    local_380._16_4_ = fVar152 * fVar215 + fVar145 * fVar119 + fVar218 * fVar175 + fVar310 * fVar271
    ;
    local_380._20_4_ = fVar166 * fVar217 + fVar146 * fVar138 + fVar172 * fVar190 + fVar314 * fVar221
    ;
    local_380._24_4_ = fVar168 * fVar219 + fVar147 * fVar141 + fVar268 * fVar192 + fVar316 * fVar174
    ;
    local_380._28_4_ = fVar318 + 0.0 + 0.0;
    local_6c0._0_4_ = fVar246 * fVar148 + fVar320 * fVar194 + fVar216 * fVar234 + fVar272 * fVar269;
    local_6c0._4_4_ = fVar255 * fVar203 + fVar324 * fVar120 + fVar171 * fVar241 + fVar279 * fVar220;
    local_6c0._8_4_ = fVar257 * fVar213 + fVar247 * fVar139 + fVar266 * fVar243 + fVar280 * fVar173;
    local_6c0._12_4_ =
         auVar198._12_4_ * fVar214 +
         fVar256 * fVar142 + fVar267 * auVar184._12_4_ + fVar281 * fVar270;
    local_6c0._16_4_ = fVar246 * fVar215 + fVar320 * fVar145 + fVar218 * fVar234 + fVar272 * fVar271
    ;
    local_6c0._20_4_ = fVar255 * fVar217 + fVar324 * fVar146 + fVar172 * fVar241 + fVar279 * fVar221
    ;
    local_6c0._24_4_ = fVar257 * fVar219 + fVar247 * fVar147 + fVar268 * fVar243 + fVar280 * fVar174
    ;
    local_6c0._28_4_ = fVar232 + 0.0;
    local_3c0 = vsubps_avx(auVar186,auVar283);
    auVar16 = vsubps_avx(local_380,local_360);
    fVar222 = local_3c0._0_4_;
    fVar229 = local_3c0._4_4_;
    auVar13._4_4_ = local_360._4_4_ * fVar229;
    auVar13._0_4_ = local_360._0_4_ * fVar222;
    fVar230 = local_3c0._8_4_;
    auVar13._8_4_ = local_360._8_4_ * fVar230;
    fVar231 = local_3c0._12_4_;
    auVar13._12_4_ = local_360._12_4_ * fVar231;
    fVar233 = local_3c0._16_4_;
    auVar13._16_4_ = local_360._16_4_ * fVar233;
    fVar242 = local_3c0._20_4_;
    auVar13._20_4_ = local_360._20_4_ * fVar242;
    fVar291 = local_3c0._24_4_;
    auVar13._24_4_ = local_360._24_4_ * fVar291;
    auVar13._28_4_ = 0;
    fVar195 = auVar16._0_4_;
    fVar200 = auVar16._4_4_;
    auVar17._4_4_ = auVar283._4_4_ * fVar200;
    auVar17._0_4_ = auVar283._0_4_ * fVar195;
    fVar201 = auVar16._8_4_;
    auVar17._8_4_ = auVar283._8_4_ * fVar201;
    fVar202 = auVar16._12_4_;
    auVar17._12_4_ = auVar283._12_4_ * fVar202;
    fVar240 = auVar16._16_4_;
    auVar17._16_4_ = auVar283._16_4_ * fVar240;
    fVar244 = auVar16._20_4_;
    auVar17._20_4_ = auVar283._20_4_ * fVar244;
    fVar149 = auVar16._24_4_;
    auVar17._24_4_ = auVar283._24_4_ * fVar149;
    auVar17._28_4_ = fVar232;
    auVar17 = vsubps_avx(auVar13,auVar17);
    auVar13 = vmaxps_avx(local_780,local_6c0);
    auVar22._4_4_ = auVar13._4_4_ * auVar13._4_4_ * (fVar229 * fVar229 + fVar200 * fVar200);
    auVar22._0_4_ = auVar13._0_4_ * auVar13._0_4_ * (fVar222 * fVar222 + fVar195 * fVar195);
    auVar22._8_4_ = auVar13._8_4_ * auVar13._8_4_ * (fVar230 * fVar230 + fVar201 * fVar201);
    auVar22._12_4_ = auVar13._12_4_ * auVar13._12_4_ * (fVar231 * fVar231 + fVar202 * fVar202);
    auVar22._16_4_ = auVar13._16_4_ * auVar13._16_4_ * (fVar233 * fVar233 + fVar240 * fVar240);
    auVar22._20_4_ = auVar13._20_4_ * auVar13._20_4_ * (fVar242 * fVar242 + fVar244 * fVar244);
    auVar22._24_4_ = auVar13._24_4_ * auVar13._24_4_ * (fVar291 * fVar291 + fVar149 * fVar149);
    auVar22._28_4_ = auVar16._28_4_ + fVar232;
    auVar11._4_4_ = auVar17._4_4_ * auVar17._4_4_;
    auVar11._0_4_ = auVar17._0_4_ * auVar17._0_4_;
    auVar11._8_4_ = auVar17._8_4_ * auVar17._8_4_;
    auVar11._12_4_ = auVar17._12_4_ * auVar17._12_4_;
    auVar11._16_4_ = auVar17._16_4_ * auVar17._16_4_;
    auVar11._20_4_ = auVar17._20_4_ * auVar17._20_4_;
    auVar11._24_4_ = auVar17._24_4_ * auVar17._24_4_;
    auVar11._28_4_ = auVar17._28_4_;
    auVar13 = vcmpps_avx(auVar11,auVar22,2);
    local_800 = ZEXT416((uint)(auVar328._0_4_ * 4.7683716e-07));
    auVar225._0_4_ = (float)(int)uVar107;
    auVar225._4_12_ = auVar207._4_12_;
    local_4a0 = auVar225._0_4_;
    auVar328 = vshufps_avx(auVar225,auVar225,0);
    auVar226._16_16_ = auVar328;
    auVar226._0_16_ = auVar328;
    auVar17 = vcmpps_avx(_DAT_01f7b060,auVar226,1);
    auVar328 = vpermilps_avx(auVar206,0xaa);
    register0x000013d0 = auVar328;
    _local_140 = auVar328;
    auVar184 = vpermilps_avx(auVar180,0xaa);
    register0x00001590 = auVar184;
    _local_420 = auVar184;
    auVar207 = vpermilps_avx(auVar251,0xaa);
    register0x000015d0 = auVar207;
    _local_300 = auVar207;
    auVar198 = vpermilps_avx(auVar156,0xaa);
    register0x00001550 = auVar198;
    _local_520 = auVar198;
    auVar22 = auVar17 & auVar13;
    auVar14 = vpermilps_avx((undefined1  [16])aVar7,0xff);
    _local_760 = ZEXT1632(auVar14);
    fVar222 = fVar151;
    fVar195 = fVar165;
    fVar229 = fVar167;
    fVar200 = fVar152;
    fVar230 = fVar166;
    fVar201 = fVar168;
    if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar22 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar22 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar22 >> 0x7f,0) == '\0') &&
          (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar22 >> 0xbf,0) == '\0') &&
        (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar22[0x1f]) {
      uVar113 = 0;
      auVar265 = ZEXT3264(auVar163);
      auVar278 = ZEXT3264(auVar274);
      auVar287 = ZEXT3264(local_6e0);
      auVar313 = ZEXT3264(_local_600);
      _local_540 = auVar15;
      _local_530 = auVar123;
    }
    else {
      local_4c0._0_8_ = pGVar9;
      auVar13 = vandps_avx(auVar13,auVar17);
      fVar247 = auVar328._0_4_;
      fVar256 = auVar328._4_4_;
      fVar258 = auVar328._8_4_;
      fVar259 = auVar328._12_4_;
      fVar311 = auVar184._0_4_;
      fVar315 = auVar184._4_4_;
      fVar317 = auVar184._8_4_;
      fVar319 = auVar184._12_4_;
      fVar321 = auVar207._0_4_;
      fVar325 = auVar207._4_4_;
      fVar326 = auVar207._8_4_;
      fVar327 = auVar207._12_4_;
      fVar302 = auVar198._0_4_;
      fVar306 = auVar198._4_4_;
      fVar307 = auVar198._8_4_;
      fVar308 = auVar198._12_4_;
      fVar231 = auVar13._28_4_ + auVar17._28_4_ + 0.0;
      local_3a0 = fVar247 * fVar148 + fVar311 * fVar194 + fVar321 * fVar216 + fVar302 * fVar269;
      fStack_39c = fVar256 * fVar203 + fVar315 * fVar120 + fVar325 * fVar171 + fVar306 * fVar220;
      fStack_398 = fVar258 * fVar213 + fVar317 * fVar139 + fVar326 * fVar266 + fVar307 * fVar173;
      fStack_394 = fVar259 * fVar214 + fVar319 * fVar142 + fVar327 * fVar267 + fVar308 * fVar270;
      fStack_390 = fVar247 * fVar215 + fVar311 * fVar145 + fVar321 * fVar218 + fVar302 * fVar271;
      fStack_38c = fVar256 * fVar217 + fVar315 * fVar146 + fVar325 * fVar172 + fVar306 * fVar221;
      fStack_388 = fVar258 * fVar219 + fVar317 * fVar147 + fVar326 * fVar268 + fVar307 * fVar174;
      fStack_384 = *(float *)(bspline_basis1 + lVar109 + 0x1c) + fVar231;
      local_460._0_4_ = auVar106._0_4_;
      local_460._4_4_ = auVar106._4_4_;
      fStack_458 = auVar106._8_4_;
      fStack_454 = auVar106._12_4_;
      fStack_450 = auVar106._16_4_;
      fStack_44c = auVar106._20_4_;
      fStack_448 = auVar106._24_4_;
      local_500._0_4_ = auVar105._0_4_;
      local_500._4_4_ = auVar105._4_4_;
      fStack_4f8 = auVar105._8_4_;
      fStack_4f4 = auVar105._12_4_;
      fStack_4f0 = auVar105._16_4_;
      fStack_4ec = auVar105._20_4_;
      fStack_4e8 = auVar105._24_4_;
      local_460._0_4_ =
           fVar247 * local_480 +
           fVar311 * fVar292 + fVar321 * (float)local_460._0_4_ + fVar302 * (float)local_500._0_4_;
      local_460._4_4_ =
           fVar256 * fStack_47c +
           fVar315 * fVar309 + fVar325 * (float)local_460._4_4_ + fVar306 * (float)local_500._4_4_;
      fStack_458 = fVar258 * fStack_478 +
                   fVar317 * fVar294 + fVar326 * fStack_458 + fVar307 * fStack_4f8;
      fStack_454 = fVar259 * fStack_474 +
                   fVar319 * fVar293 + fVar327 * fStack_454 + fVar308 * fStack_4f4;
      fStack_450 = fVar247 * fStack_470 +
                   fVar311 * fVar295 + fVar321 * fStack_450 + fVar302 * fStack_4f0;
      fStack_44c = fVar256 * fStack_46c +
                   fVar315 * fVar296 + fVar325 * fStack_44c + fVar306 * fStack_4ec;
      fStack_448 = fVar258 * fStack_468 +
                   fVar317 * fVar261 + fVar326 * fStack_448 + fVar307 * fStack_4e8;
      fStack_444 = fStack_384 + fVar144 + *(float *)(bspline_basis1 + lVar109 + 0x1c) + fVar231;
      fVar231 = *(float *)(bspline_basis0 + lVar109 + 0x1210);
      fVar202 = *(float *)(bspline_basis0 + lVar109 + 0x1214);
      fVar233 = *(float *)(bspline_basis0 + lVar109 + 0x1218);
      fVar240 = *(float *)(bspline_basis0 + lVar109 + 0x121c);
      fVar242 = *(float *)(bspline_basis0 + lVar109 + 0x1220);
      fVar244 = *(float *)(bspline_basis0 + lVar109 + 0x1224);
      fVar291 = *(float *)(bspline_basis0 + lVar109 + 0x1228);
      fVar149 = *(float *)(bspline_basis0 + lVar109 + 0x1694);
      fVar292 = *(float *)(bspline_basis0 + lVar109 + 0x1698);
      fVar309 = *(float *)(bspline_basis0 + lVar109 + 0x169c);
      fVar294 = *(float *)(bspline_basis0 + lVar109 + 0x16a0);
      fVar293 = *(float *)(bspline_basis0 + lVar109 + 0x16a4);
      fVar295 = *(float *)(bspline_basis0 + lVar109 + 0x16a8);
      fVar296 = *(float *)(bspline_basis0 + lVar109 + 0x16ac);
      fVar261 = *(float *)(bspline_basis0 + lVar109 + 0x1b18);
      fVar216 = *(float *)(bspline_basis0 + lVar109 + 0x1b1c);
      fVar171 = *(float *)(bspline_basis0 + lVar109 + 0x1b20);
      fVar266 = *(float *)(bspline_basis0 + lVar109 + 0x1b24);
      fVar267 = *(float *)(bspline_basis0 + lVar109 + 0x1b28);
      fVar218 = *(float *)(bspline_basis0 + lVar109 + 0x1b2c);
      fVar172 = *(float *)(bspline_basis0 + lVar109 + 0x1b30);
      fVar268 = *(float *)(bspline_basis0 + lVar109 + 0x1f9c);
      fVar269 = *(float *)(bspline_basis0 + lVar109 + 0x1fa0);
      fVar220 = *(float *)(bspline_basis0 + lVar109 + 0x1fa4);
      fVar173 = *(float *)(bspline_basis0 + lVar109 + 0x1fa8);
      fVar270 = *(float *)(bspline_basis0 + lVar109 + 0x1fac);
      fVar271 = *(float *)(bspline_basis0 + lVar109 + 0x1fb0);
      fVar221 = *(float *)(bspline_basis0 + lVar109 + 0x1fb4);
      fVar260 = *(float *)(bspline_basis1 + lVar109 + 0x4a0) + fVar259;
      _local_500 = auVar186;
      fVar174 = *(float *)(bspline_basis0 + lVar109 + 0x1b34) +
                *(float *)(bspline_basis0 + lVar109 + 0x1fb8);
      fVar282 = *(float *)(bspline_basis0 + lVar109 + 0x16b0) + fVar174;
      auVar159._0_4_ = fVar152 * fVar231 + fVar175 * fVar261 + fVar310 * fVar268 + fVar119 * fVar149
      ;
      auVar159._4_4_ = fVar166 * fVar202 + fVar190 * fVar216 + fVar314 * fVar269 + fVar138 * fVar292
      ;
      auVar159._8_4_ = fVar168 * fVar233 + fVar192 * fVar171 + fVar316 * fVar220 + fVar141 * fVar309
      ;
      auVar159._12_4_ =
           fVar170 * fVar240 + fVar245 * fVar266 + fVar318 * fVar173 + fVar144 * fVar294;
      auVar159._16_4_ =
           fVar152 * fVar242 + fVar175 * fVar267 + fVar310 * fVar270 + fVar119 * fVar293;
      auVar159._20_4_ =
           fVar166 * fVar244 + fVar190 * fVar218 + fVar314 * fVar271 + fVar138 * fVar295;
      auVar159._24_4_ =
           fVar168 * fVar291 + fVar192 * fVar172 + fVar316 * fVar221 + fVar141 * fVar296;
      auVar159._28_4_ =
           fVar174 + *(float *)(bspline_basis1 + lVar109 + 0x4a0) +
                     *(float *)(bspline_basis1 + lVar109 + 0x924) + fVar260;
      auVar199._0_4_ = fVar311 * fVar149 + fVar321 * fVar261 + fVar302 * fVar268 + fVar247 * fVar231
      ;
      auVar199._4_4_ = fVar315 * fVar292 + fVar325 * fVar216 + fVar306 * fVar269 + fVar256 * fVar202
      ;
      auVar199._8_4_ = fVar317 * fVar309 + fVar326 * fVar171 + fVar307 * fVar220 + fVar258 * fVar233
      ;
      auVar199._12_4_ =
           fVar319 * fVar294 + fVar327 * fVar266 + fVar308 * fVar173 + fVar259 * fVar240;
      auVar199._16_4_ =
           fVar311 * fVar293 + fVar321 * fVar267 + fVar302 * fVar270 + fVar247 * fVar242;
      auVar199._20_4_ =
           fVar315 * fVar295 + fVar325 * fVar218 + fVar306 * fVar271 + fVar256 * fVar244;
      auVar199._24_4_ =
           fVar317 * fVar296 + fVar326 * fVar172 + fVar307 * fVar221 + fVar258 * fVar291;
      auVar199._28_4_ = fVar282 + *(float *)(bspline_basis0 + lVar109 + 0x122c);
      fVar174 = *(float *)(bspline_basis1 + lVar109 + 0x1b18);
      fVar194 = *(float *)(bspline_basis1 + lVar109 + 0x1b1c);
      fVar120 = *(float *)(bspline_basis1 + lVar109 + 0x1b20);
      fVar139 = *(float *)(bspline_basis1 + lVar109 + 0x1b24);
      fVar142 = *(float *)(bspline_basis1 + lVar109 + 0x1b28);
      fVar145 = *(float *)(bspline_basis1 + lVar109 + 0x1b2c);
      fVar146 = *(float *)(bspline_basis1 + lVar109 + 0x1b30);
      fVar147 = *(float *)(bspline_basis1 + lVar109 + 0x1f9c);
      fVar148 = *(float *)(bspline_basis1 + lVar109 + 0x1fa0);
      fVar203 = *(float *)(bspline_basis1 + lVar109 + 0x1fa4);
      fVar213 = *(float *)(bspline_basis1 + lVar109 + 0x1fa8);
      fVar214 = *(float *)(bspline_basis1 + lVar109 + 0x1fac);
      fVar215 = *(float *)(bspline_basis1 + lVar109 + 0x1fb0);
      fVar217 = *(float *)(bspline_basis1 + lVar109 + 0x1fb4);
      fVar219 = *(float *)(bspline_basis1 + lVar109 + 0x1694);
      fVar232 = *(float *)(bspline_basis1 + lVar109 + 0x1698);
      fVar234 = *(float *)(bspline_basis1 + lVar109 + 0x169c);
      fVar241 = *(float *)(bspline_basis1 + lVar109 + 0x16a0);
      fVar243 = *(float *)(bspline_basis1 + lVar109 + 0x16a4);
      fVar246 = *(float *)(bspline_basis1 + lVar109 + 0x16a8);
      fVar255 = *(float *)(bspline_basis1 + lVar109 + 0x16ac);
      fVar257 = *(float *)(bspline_basis1 + lVar109 + 0x1210);
      fVar272 = *(float *)(bspline_basis1 + lVar109 + 0x1214);
      fVar279 = *(float *)(bspline_basis1 + lVar109 + 0x1218);
      fVar280 = *(float *)(bspline_basis1 + lVar109 + 0x121c);
      fVar281 = *(float *)(bspline_basis1 + lVar109 + 0x1220);
      fVar320 = *(float *)(bspline_basis1 + lVar109 + 0x1224);
      fVar324 = *(float *)(bspline_basis1 + lVar109 + 0x1228);
      auVar262._0_4_ = fVar257 * fVar288 + fVar176 * fVar219 + fVar151 * fVar174 + fVar118 * fVar147
      ;
      auVar262._4_4_ =
           fVar272 * fStack_49c + fVar191 * fVar232 + fVar165 * fVar194 + fVar137 * fVar148;
      auVar262._8_4_ =
           fVar279 * fStack_498 + fVar150 * fVar234 + fVar167 * fVar120 + fVar140 * fVar203;
      auVar262._12_4_ =
           fVar280 * fStack_494 + fVar193 * fVar241 + fVar169 * fVar139 + fVar143 * fVar213;
      auVar262._16_4_ =
           fVar281 * fVar288 + fVar176 * fVar243 + fVar151 * fVar142 + fVar118 * fVar214;
      auVar262._20_4_ =
           fVar320 * fStack_49c + fVar191 * fVar246 + fVar165 * fVar145 + fVar137 * fVar215;
      auVar262._24_4_ =
           fVar324 * fStack_498 + fVar150 * fVar255 + fVar167 * fVar146 + fVar140 * fVar217;
      auVar262._28_4_ = fVar143 + fVar143 + fVar282 + fVar143;
      auVar275._0_4_ = fVar152 * fVar257 + fVar119 * fVar219 + fVar175 * fVar174 + fVar310 * fVar147
      ;
      auVar275._4_4_ = fVar166 * fVar272 + fVar138 * fVar232 + fVar190 * fVar194 + fVar314 * fVar148
      ;
      auVar275._8_4_ = fVar168 * fVar279 + fVar141 * fVar234 + fVar192 * fVar120 + fVar316 * fVar203
      ;
      auVar275._12_4_ =
           fVar170 * fVar280 + fVar144 * fVar241 + fVar245 * fVar139 + fVar318 * fVar213;
      auVar275._16_4_ =
           fVar152 * fVar281 + fVar119 * fVar243 + fVar175 * fVar142 + fVar310 * fVar214;
      auVar275._20_4_ =
           fVar166 * fVar320 + fVar138 * fVar246 + fVar190 * fVar145 + fVar314 * fVar215;
      auVar275._24_4_ =
           fVar168 * fVar324 + fVar141 * fVar255 + fVar192 * fVar146 + fVar316 * fVar217;
      auVar275._28_4_ = fVar143 + fVar143 + fVar143 + fVar282;
      auVar208._0_4_ = fVar247 * fVar257 + fVar311 * fVar219 + fVar321 * fVar174 + fVar302 * fVar147
      ;
      auVar208._4_4_ = fVar256 * fVar272 + fVar315 * fVar232 + fVar325 * fVar194 + fVar306 * fVar148
      ;
      auVar208._8_4_ = fVar258 * fVar279 + fVar317 * fVar234 + fVar326 * fVar120 + fVar307 * fVar203
      ;
      auVar208._12_4_ =
           fVar259 * fVar280 + fVar319 * fVar241 + fVar327 * fVar139 + fVar308 * fVar213;
      auVar208._16_4_ =
           fVar247 * fVar281 + fVar311 * fVar243 + fVar321 * fVar142 + fVar302 * fVar214;
      auVar208._20_4_ =
           fVar256 * fVar320 + fVar315 * fVar246 + fVar325 * fVar145 + fVar306 * fVar215;
      auVar208._24_4_ =
           fVar258 * fVar324 + fVar317 * fVar255 + fVar326 * fVar146 + fVar307 * fVar217;
      auVar208._28_4_ =
           *(float *)(bspline_basis1 + lVar109 + 0x122c) +
           *(float *)(bspline_basis1 + lVar109 + 0x16b0) +
           *(float *)(bspline_basis1 + lVar109 + 0x1b34) +
           *(float *)(bspline_basis1 + lVar109 + 0x1fb8);
      auVar187._8_4_ = 0x7fffffff;
      auVar187._0_8_ = 0x7fffffff7fffffff;
      auVar187._12_4_ = 0x7fffffff;
      auVar187._16_4_ = 0x7fffffff;
      auVar187._20_4_ = 0x7fffffff;
      auVar187._24_4_ = 0x7fffffff;
      auVar187._28_4_ = 0x7fffffff;
      auVar97._4_4_ =
           fVar202 * fStack_49c + fVar191 * fVar292 + fVar165 * fVar216 + fVar137 * fVar269;
      auVar97._0_4_ = fVar231 * fVar288 + fVar176 * fVar149 + fVar151 * fVar261 + fVar118 * fVar268;
      auVar97._8_4_ =
           fVar233 * fStack_498 + fVar150 * fVar309 + fVar167 * fVar171 + fVar140 * fVar220;
      auVar97._12_4_ =
           fVar240 * fStack_494 + fVar193 * fVar294 + fVar169 * fVar266 + fVar143 * fVar173;
      auVar97._16_4_ = fVar242 * fVar288 + fVar176 * fVar293 + fVar151 * fVar267 + fVar118 * fVar270
      ;
      auVar97._20_4_ =
           fVar244 * fStack_49c + fVar191 * fVar295 + fVar165 * fVar218 + fVar137 * fVar271;
      auVar97._24_4_ =
           fVar291 * fStack_498 + fVar150 * fVar296 + fVar167 * fVar172 + fVar140 * fVar221;
      auVar97._28_4_ =
           *(float *)(bspline_basis0 + lVar109 + 0x16b0) +
           *(float *)(bspline_basis0 + lVar109 + 0x1fb8) + fVar260;
      auVar17 = vandps_avx(auVar97,auVar187);
      auVar22 = vandps_avx(auVar159,auVar187);
      auVar22 = vmaxps_avx(auVar17,auVar22);
      auVar17 = vandps_avx(auVar199,auVar187);
      auVar17 = vmaxps_avx(auVar22,auVar17);
      auVar328 = vpermilps_avx(local_800,0);
      auVar252._16_16_ = auVar328;
      auVar252._0_16_ = auVar328;
      auVar17 = vcmpps_avx(auVar17,auVar252,1);
      auVar11 = vblendvps_avx(auVar97,local_3c0,auVar17);
      auVar226 = vblendvps_avx(auVar159,auVar16,auVar17);
      auVar17 = vandps_avx(auVar262,auVar187);
      auVar22 = vandps_avx(auVar275,auVar187);
      auVar12 = vmaxps_avx(auVar17,auVar22);
      auVar17 = vandps_avx(auVar208,auVar187);
      auVar17 = vmaxps_avx(auVar12,auVar17);
      auVar12 = vcmpps_avx(auVar17,auVar252,1);
      auVar17 = vblendvps_avx(auVar262,local_3c0,auVar12);
      auVar16 = vblendvps_avx(auVar275,auVar16,auVar12);
      fVar120 = auVar11._0_4_;
      fVar139 = auVar11._4_4_;
      fVar142 = auVar11._8_4_;
      fVar145 = auVar11._12_4_;
      fVar146 = auVar11._16_4_;
      fVar147 = auVar11._20_4_;
      fVar148 = auVar11._24_4_;
      fVar203 = auVar17._0_4_;
      fVar213 = auVar17._4_4_;
      fVar214 = auVar17._8_4_;
      fVar215 = auVar17._12_4_;
      fVar217 = auVar17._16_4_;
      fVar219 = auVar17._20_4_;
      fVar118 = auVar17._24_4_;
      fVar231 = auVar226._0_4_;
      fVar242 = auVar226._4_4_;
      fVar292 = auVar226._8_4_;
      fVar295 = auVar226._12_4_;
      fVar171 = auVar226._16_4_;
      fVar172 = auVar226._20_4_;
      fVar173 = auVar226._24_4_;
      auVar126._0_4_ = fVar231 * fVar231 + fVar120 * fVar120;
      auVar126._4_4_ = fVar242 * fVar242 + fVar139 * fVar139;
      auVar126._8_4_ = fVar292 * fVar292 + fVar142 * fVar142;
      auVar126._12_4_ = fVar295 * fVar295 + fVar145 * fVar145;
      auVar126._16_4_ = fVar171 * fVar171 + fVar146 * fVar146;
      auVar126._20_4_ = fVar172 * fVar172 + fVar147 * fVar147;
      auVar126._24_4_ = fVar173 * fVar173 + fVar148 * fVar148;
      auVar126._28_4_ = auVar275._28_4_ + auVar11._28_4_;
      auVar11 = vrsqrtps_avx(auVar126);
      fVar202 = auVar11._0_4_;
      fVar233 = auVar11._4_4_;
      auVar12._4_4_ = fVar233 * 1.5;
      auVar12._0_4_ = fVar202 * 1.5;
      fVar240 = auVar11._8_4_;
      auVar12._8_4_ = fVar240 * 1.5;
      fVar244 = auVar11._12_4_;
      auVar12._12_4_ = fVar244 * 1.5;
      fVar291 = auVar11._16_4_;
      auVar12._16_4_ = fVar291 * 1.5;
      fVar149 = auVar11._20_4_;
      auVar12._20_4_ = fVar149 * 1.5;
      fVar309 = auVar11._24_4_;
      auVar12._24_4_ = fVar309 * 1.5;
      auVar12._28_4_ = auVar22._28_4_;
      auVar18._4_4_ = fVar233 * fVar233 * fVar233 * auVar126._4_4_ * 0.5;
      auVar18._0_4_ = fVar202 * fVar202 * fVar202 * auVar126._0_4_ * 0.5;
      auVar18._8_4_ = fVar240 * fVar240 * fVar240 * auVar126._8_4_ * 0.5;
      auVar18._12_4_ = fVar244 * fVar244 * fVar244 * auVar126._12_4_ * 0.5;
      auVar18._16_4_ = fVar291 * fVar291 * fVar291 * auVar126._16_4_ * 0.5;
      auVar18._20_4_ = fVar149 * fVar149 * fVar149 * auVar126._20_4_ * 0.5;
      auVar18._24_4_ = fVar309 * fVar309 * fVar309 * auVar126._24_4_ * 0.5;
      auVar18._28_4_ = auVar126._28_4_;
      auVar11 = vsubps_avx(auVar12,auVar18);
      fVar202 = auVar11._0_4_;
      fVar244 = auVar11._4_4_;
      fVar309 = auVar11._8_4_;
      fVar296 = auVar11._12_4_;
      fVar266 = auVar11._16_4_;
      fVar268 = auVar11._20_4_;
      fVar270 = auVar11._24_4_;
      fVar174 = auVar226._28_4_;
      fVar233 = auVar16._0_4_;
      fVar291 = auVar16._4_4_;
      fVar294 = auVar16._8_4_;
      fVar261 = auVar16._12_4_;
      fVar267 = auVar16._16_4_;
      fVar269 = auVar16._20_4_;
      fVar271 = auVar16._24_4_;
      auVar127._0_4_ = fVar233 * fVar233 + fVar203 * fVar203;
      auVar127._4_4_ = fVar291 * fVar291 + fVar213 * fVar213;
      auVar127._8_4_ = fVar294 * fVar294 + fVar214 * fVar214;
      auVar127._12_4_ = fVar261 * fVar261 + fVar215 * fVar215;
      auVar127._16_4_ = fVar267 * fVar267 + fVar217 * fVar217;
      auVar127._20_4_ = fVar269 * fVar269 + fVar219 * fVar219;
      auVar127._24_4_ = fVar271 * fVar271 + fVar118 * fVar118;
      auVar127._28_4_ = auVar17._28_4_ + auVar11._28_4_;
      auVar17 = vrsqrtps_avx(auVar127);
      fVar240 = auVar17._0_4_;
      fVar149 = auVar17._4_4_;
      auVar19._4_4_ = fVar149 * 1.5;
      auVar19._0_4_ = fVar240 * 1.5;
      fVar293 = auVar17._8_4_;
      auVar19._8_4_ = fVar293 * 1.5;
      fVar216 = auVar17._12_4_;
      auVar19._12_4_ = fVar216 * 1.5;
      fVar218 = auVar17._16_4_;
      auVar19._16_4_ = fVar218 * 1.5;
      fVar220 = auVar17._20_4_;
      auVar19._20_4_ = fVar220 * 1.5;
      fVar221 = auVar17._24_4_;
      auVar19._24_4_ = fVar221 * 1.5;
      auVar19._28_4_ = auVar22._28_4_;
      fVar194 = auVar17._28_4_;
      auVar20._4_4_ = fVar149 * fVar149 * fVar149 * auVar127._4_4_ * 0.5;
      auVar20._0_4_ = fVar240 * fVar240 * fVar240 * auVar127._0_4_ * 0.5;
      auVar20._8_4_ = fVar293 * fVar293 * fVar293 * auVar127._8_4_ * 0.5;
      auVar20._12_4_ = fVar216 * fVar216 * fVar216 * auVar127._12_4_ * 0.5;
      auVar20._16_4_ = fVar218 * fVar218 * fVar218 * auVar127._16_4_ * 0.5;
      auVar20._20_4_ = fVar220 * fVar220 * fVar220 * auVar127._20_4_ * 0.5;
      auVar20._24_4_ = fVar221 * fVar221 * fVar221 * auVar127._24_4_ * 0.5;
      auVar20._28_4_ = auVar127._28_4_;
      auVar17 = vsubps_avx(auVar19,auVar20);
      fVar240 = auVar17._0_4_;
      fVar149 = auVar17._4_4_;
      fVar293 = auVar17._8_4_;
      fVar216 = auVar17._12_4_;
      fVar218 = auVar17._16_4_;
      fVar220 = auVar17._20_4_;
      fVar221 = auVar17._24_4_;
      fVar231 = (float)local_780._0_4_ * fVar231 * fVar202;
      fVar242 = local_780._4_4_ * fVar242 * fVar244;
      auVar23._4_4_ = fVar242;
      auVar23._0_4_ = fVar231;
      fVar292 = local_780._8_4_ * fVar292 * fVar309;
      auVar23._8_4_ = fVar292;
      fVar295 = local_780._12_4_ * fVar295 * fVar296;
      auVar23._12_4_ = fVar295;
      fVar171 = local_780._16_4_ * fVar171 * fVar266;
      auVar23._16_4_ = fVar171;
      fVar172 = local_780._20_4_ * fVar172 * fVar268;
      auVar23._20_4_ = fVar172;
      fVar173 = local_780._24_4_ * fVar173 * fVar270;
      auVar23._24_4_ = fVar173;
      auVar23._28_4_ = fVar174;
      local_5c0._4_4_ = auVar283._4_4_ + fVar242;
      local_5c0._0_4_ = auVar283._0_4_ + fVar231;
      fStack_5b8 = auVar283._8_4_ + fVar292;
      fStack_5b4 = auVar283._12_4_ + fVar295;
      fStack_5b0 = auVar283._16_4_ + fVar171;
      fStack_5ac = auVar283._20_4_ + fVar172;
      fStack_5a8 = auVar283._24_4_ + fVar173;
      fStack_5a4 = auVar283._28_4_ + fVar174;
      local_5e0 = (float)local_780._0_4_ * fVar202 * -fVar120;
      fStack_5dc = local_780._4_4_ * fVar244 * -fVar139;
      auVar24._4_4_ = fStack_5dc;
      auVar24._0_4_ = local_5e0;
      fStack_5d8 = local_780._8_4_ * fVar309 * -fVar142;
      auVar24._8_4_ = fStack_5d8;
      fStack_5d4 = local_780._12_4_ * fVar296 * -fVar145;
      auVar24._12_4_ = fStack_5d4;
      fStack_5d0 = local_780._16_4_ * fVar266 * -fVar146;
      auVar24._16_4_ = fStack_5d0;
      fStack_5cc = local_780._20_4_ * fVar268 * -fVar147;
      auVar24._20_4_ = fStack_5cc;
      fStack_5c8 = local_780._24_4_ * fVar270 * -fVar148;
      auVar24._24_4_ = fStack_5c8;
      auVar24._28_4_ = 0x3f000000;
      local_5e0 = local_5e0 + local_360._0_4_;
      fStack_5dc = fStack_5dc + local_360._4_4_;
      fStack_5d8 = fStack_5d8 + local_360._8_4_;
      fStack_5d4 = fStack_5d4 + local_360._12_4_;
      fStack_5d0 = fStack_5d0 + local_360._16_4_;
      fStack_5cc = fStack_5cc + local_360._20_4_;
      fStack_5c8 = fStack_5c8 + local_360._24_4_;
      fStack_5c4 = 0.5;
      fVar231 = (float)local_780._0_4_ * fVar202 * 0.0;
      fVar202 = local_780._4_4_ * fVar244 * 0.0;
      auVar25._4_4_ = fVar202;
      auVar25._0_4_ = fVar231;
      fVar242 = local_780._8_4_ * fVar309 * 0.0;
      auVar25._8_4_ = fVar242;
      fVar244 = local_780._12_4_ * fVar296 * 0.0;
      auVar25._12_4_ = fVar244;
      fVar292 = local_780._16_4_ * fVar266 * 0.0;
      auVar25._16_4_ = fVar292;
      fVar309 = local_780._20_4_ * fVar268 * 0.0;
      auVar25._20_4_ = fVar309;
      fVar295 = local_780._24_4_ * fVar270 * 0.0;
      auVar25._24_4_ = fVar295;
      auVar25._28_4_ = fVar259;
      auVar263._0_4_ = fVar231 + (float)local_460._0_4_;
      auVar263._4_4_ = fVar202 + (float)local_460._4_4_;
      auVar263._8_4_ = fVar242 + fStack_458;
      auVar263._12_4_ = fVar244 + fStack_454;
      auVar263._16_4_ = fVar292 + fStack_450;
      auVar263._20_4_ = fVar309 + fStack_44c;
      auVar263._24_4_ = fVar295 + fStack_448;
      auVar263._28_4_ = fVar259 + fStack_444;
      fVar231 = (float)local_6c0._0_4_ * fVar233 * fVar240;
      fVar202 = local_6c0._4_4_ * fVar291 * fVar149;
      auVar26._4_4_ = fVar202;
      auVar26._0_4_ = fVar231;
      fVar233 = local_6c0._8_4_ * fVar294 * fVar293;
      auVar26._8_4_ = fVar233;
      fVar242 = local_6c0._12_4_ * fVar261 * fVar216;
      auVar26._12_4_ = fVar242;
      fVar244 = local_6c0._16_4_ * fVar267 * fVar218;
      auVar26._16_4_ = fVar244;
      fVar291 = local_6c0._20_4_ * fVar269 * fVar220;
      auVar26._20_4_ = fVar291;
      fVar292 = local_6c0._24_4_ * fVar271 * fVar221;
      auVar26._24_4_ = fVar292;
      auVar26._28_4_ = auVar16._28_4_;
      auVar226 = vsubps_avx(auVar283,auVar23);
      auVar284._0_4_ = auVar186._0_4_ + fVar231;
      auVar284._4_4_ = auVar186._4_4_ + fVar202;
      auVar284._8_4_ = auVar186._8_4_ + fVar233;
      auVar284._12_4_ = auVar186._12_4_ + fVar242;
      auVar284._16_4_ = auVar186._16_4_ + fVar244;
      auVar284._20_4_ = auVar186._20_4_ + fVar291;
      auVar284._24_4_ = auVar186._24_4_ + fVar292;
      auVar284._28_4_ = auVar186._28_4_ + auVar16._28_4_;
      fVar231 = (float)local_6c0._0_4_ * -fVar203 * fVar240;
      fVar202 = local_6c0._4_4_ * -fVar213 * fVar149;
      auVar16._4_4_ = fVar202;
      auVar16._0_4_ = fVar231;
      fVar233 = local_6c0._8_4_ * -fVar214 * fVar293;
      auVar16._8_4_ = fVar233;
      fVar242 = local_6c0._12_4_ * -fVar215 * fVar216;
      auVar16._12_4_ = fVar242;
      fVar244 = local_6c0._16_4_ * -fVar217 * fVar218;
      auVar16._16_4_ = fVar244;
      fVar291 = local_6c0._20_4_ * -fVar219 * fVar220;
      auVar16._20_4_ = fVar291;
      fVar292 = local_6c0._24_4_ * -fVar118 * fVar221;
      auVar16._24_4_ = fVar292;
      auVar16._28_4_ = fVar174;
      auVar18 = vsubps_avx(local_360,auVar24);
      auVar312._0_4_ = local_380._0_4_ + fVar231;
      auVar312._4_4_ = local_380._4_4_ + fVar202;
      auVar312._8_4_ = local_380._8_4_ + fVar233;
      auVar312._12_4_ = local_380._12_4_ + fVar242;
      auVar312._16_4_ = local_380._16_4_ + fVar244;
      auVar312._20_4_ = local_380._20_4_ + fVar291;
      auVar312._24_4_ = local_380._24_4_ + fVar292;
      auVar312._28_4_ = local_380._28_4_ + fVar174;
      fVar231 = (float)local_6c0._0_4_ * fVar240 * 0.0;
      fVar202 = local_6c0._4_4_ * fVar149 * 0.0;
      auVar27._4_4_ = fVar202;
      auVar27._0_4_ = fVar231;
      fVar233 = local_6c0._8_4_ * fVar293 * 0.0;
      auVar27._8_4_ = fVar233;
      fVar240 = local_6c0._12_4_ * fVar216 * 0.0;
      auVar27._12_4_ = fVar240;
      fVar242 = local_6c0._16_4_ * fVar218 * 0.0;
      auVar27._16_4_ = fVar242;
      fVar244 = local_6c0._20_4_ * fVar220 * 0.0;
      auVar27._20_4_ = fVar244;
      fVar291 = local_6c0._24_4_ * fVar221 * 0.0;
      auVar27._24_4_ = fVar291;
      auVar27._28_4_ = fVar194;
      auVar283 = vsubps_avx(_local_460,auVar25);
      auVar103._4_4_ = fStack_39c;
      auVar103._0_4_ = local_3a0;
      auVar103._8_4_ = fStack_398;
      auVar103._12_4_ = fStack_394;
      auVar103._16_4_ = fStack_390;
      auVar103._20_4_ = fStack_38c;
      auVar103._24_4_ = fStack_388;
      auVar103._28_4_ = fStack_384;
      auVar322._0_4_ = local_3a0 + fVar231;
      auVar322._4_4_ = fStack_39c + fVar202;
      auVar322._8_4_ = fStack_398 + fVar233;
      auVar322._12_4_ = fStack_394 + fVar240;
      auVar322._16_4_ = fStack_390 + fVar242;
      auVar322._20_4_ = fStack_38c + fVar244;
      auVar322._24_4_ = fStack_388 + fVar291;
      auVar322._28_4_ = fStack_384 + fVar194;
      auVar17 = vsubps_avx(auVar186,auVar26);
      auVar16 = vsubps_avx(local_380,auVar16);
      auVar22 = vsubps_avx(auVar103,auVar27);
      auVar11 = vsubps_avx(auVar312,auVar18);
      auVar186 = vsubps_avx(auVar322,auVar283);
      auVar28._4_4_ = auVar283._4_4_ * auVar11._4_4_;
      auVar28._0_4_ = auVar283._0_4_ * auVar11._0_4_;
      auVar28._8_4_ = auVar283._8_4_ * auVar11._8_4_;
      auVar28._12_4_ = auVar283._12_4_ * auVar11._12_4_;
      auVar28._16_4_ = auVar283._16_4_ * auVar11._16_4_;
      auVar28._20_4_ = auVar283._20_4_ * auVar11._20_4_;
      auVar28._24_4_ = auVar283._24_4_ * auVar11._24_4_;
      auVar28._28_4_ = fVar194;
      auVar29._4_4_ = auVar18._4_4_ * auVar186._4_4_;
      auVar29._0_4_ = auVar18._0_4_ * auVar186._0_4_;
      auVar29._8_4_ = auVar18._8_4_ * auVar186._8_4_;
      auVar29._12_4_ = auVar18._12_4_ * auVar186._12_4_;
      auVar29._16_4_ = auVar18._16_4_ * auVar186._16_4_;
      auVar29._20_4_ = auVar18._20_4_ * auVar186._20_4_;
      auVar29._24_4_ = auVar18._24_4_ * auVar186._24_4_;
      auVar29._28_4_ = fStack_384;
      auVar12 = vsubps_avx(auVar29,auVar28);
      auVar30._4_4_ = auVar226._4_4_ * auVar186._4_4_;
      auVar30._0_4_ = auVar226._0_4_ * auVar186._0_4_;
      auVar30._8_4_ = auVar226._8_4_ * auVar186._8_4_;
      auVar30._12_4_ = auVar226._12_4_ * auVar186._12_4_;
      auVar30._16_4_ = auVar226._16_4_ * auVar186._16_4_;
      auVar30._20_4_ = auVar226._20_4_ * auVar186._20_4_;
      auVar30._24_4_ = auVar226._24_4_ * auVar186._24_4_;
      auVar30._28_4_ = auVar186._28_4_;
      auVar19 = vsubps_avx(auVar284,auVar226);
      auVar31._4_4_ = auVar283._4_4_ * auVar19._4_4_;
      auVar31._0_4_ = auVar283._0_4_ * auVar19._0_4_;
      auVar31._8_4_ = auVar283._8_4_ * auVar19._8_4_;
      auVar31._12_4_ = auVar283._12_4_ * auVar19._12_4_;
      auVar31._16_4_ = auVar283._16_4_ * auVar19._16_4_;
      auVar31._20_4_ = auVar283._20_4_ * auVar19._20_4_;
      auVar31._24_4_ = auVar283._24_4_ * auVar19._24_4_;
      auVar31._28_4_ = local_380._28_4_;
      auVar20 = vsubps_avx(auVar31,auVar30);
      auVar32._4_4_ = auVar18._4_4_ * auVar19._4_4_;
      auVar32._0_4_ = auVar18._0_4_ * auVar19._0_4_;
      auVar32._8_4_ = auVar18._8_4_ * auVar19._8_4_;
      auVar32._12_4_ = auVar18._12_4_ * auVar19._12_4_;
      auVar32._16_4_ = auVar18._16_4_ * auVar19._16_4_;
      auVar32._20_4_ = auVar18._20_4_ * auVar19._20_4_;
      auVar32._24_4_ = auVar18._24_4_ * auVar19._24_4_;
      auVar32._28_4_ = auVar186._28_4_;
      auVar33._4_4_ = auVar226._4_4_ * auVar11._4_4_;
      auVar33._0_4_ = auVar226._0_4_ * auVar11._0_4_;
      auVar33._8_4_ = auVar226._8_4_ * auVar11._8_4_;
      auVar33._12_4_ = auVar226._12_4_ * auVar11._12_4_;
      auVar33._16_4_ = auVar226._16_4_ * auVar11._16_4_;
      auVar33._20_4_ = auVar226._20_4_ * auVar11._20_4_;
      auVar33._24_4_ = auVar226._24_4_ * auVar11._24_4_;
      auVar33._28_4_ = auVar11._28_4_;
      auVar11 = vsubps_avx(auVar33,auVar32);
      auVar128._0_4_ = auVar12._0_4_ * 0.0 + auVar11._0_4_ + auVar20._0_4_ * 0.0;
      auVar128._4_4_ = auVar12._4_4_ * 0.0 + auVar11._4_4_ + auVar20._4_4_ * 0.0;
      auVar128._8_4_ = auVar12._8_4_ * 0.0 + auVar11._8_4_ + auVar20._8_4_ * 0.0;
      auVar128._12_4_ = auVar12._12_4_ * 0.0 + auVar11._12_4_ + auVar20._12_4_ * 0.0;
      auVar128._16_4_ = auVar12._16_4_ * 0.0 + auVar11._16_4_ + auVar20._16_4_ * 0.0;
      auVar128._20_4_ = auVar12._20_4_ * 0.0 + auVar11._20_4_ + auVar20._20_4_ * 0.0;
      auVar128._24_4_ = auVar12._24_4_ * 0.0 + auVar11._24_4_ + auVar20._24_4_ * 0.0;
      auVar128._28_4_ = auVar11._28_4_ + auVar11._28_4_ + auVar20._28_4_;
      auVar12 = vcmpps_avx(auVar128,ZEXT832(0) << 0x20,2);
      _local_7c0 = vblendvps_avx(auVar17,_local_5c0,auVar12);
      auVar98._4_4_ = fStack_5dc;
      auVar98._0_4_ = local_5e0;
      auVar98._8_4_ = fStack_5d8;
      auVar98._12_4_ = fStack_5d4;
      auVar98._16_4_ = fStack_5d0;
      auVar98._20_4_ = fStack_5cc;
      auVar98._24_4_ = fStack_5c8;
      auVar98._28_4_ = 0x3f000000;
      local_5a0 = vblendvps_avx(auVar16,auVar98,auVar12);
      auVar17 = vblendvps_avx(auVar22,auVar263,auVar12);
      auVar16 = vblendvps_avx(auVar226,auVar284,auVar12);
      auVar22 = vblendvps_avx(auVar18,auVar312,auVar12);
      auVar11 = vblendvps_avx(auVar283,auVar322,auVar12);
      auVar186 = vblendvps_avx(auVar284,auVar226,auVar12);
      auVar226 = vblendvps_avx(auVar312,auVar18,auVar12);
      auVar328 = vpackssdw_avx(auVar13._0_16_,auVar13._16_16_);
      auVar283 = vblendvps_avx(auVar322,auVar283,auVar12);
      auVar186 = vsubps_avx(auVar186,_local_7c0);
      auVar226 = vsubps_avx(auVar226,local_5a0);
      auVar283 = vsubps_avx(auVar283,auVar17);
      auVar19 = vsubps_avx(local_5a0,auVar22);
      fVar231 = auVar226._0_4_;
      fVar147 = auVar17._0_4_;
      fVar244 = auVar226._4_4_;
      fVar148 = auVar17._4_4_;
      auVar34._4_4_ = fVar148 * fVar244;
      auVar34._0_4_ = fVar147 * fVar231;
      fVar294 = auVar226._8_4_;
      fVar203 = auVar17._8_4_;
      auVar34._8_4_ = fVar203 * fVar294;
      fVar216 = auVar226._12_4_;
      fVar213 = auVar17._12_4_;
      auVar34._12_4_ = fVar213 * fVar216;
      fVar172 = auVar226._16_4_;
      fVar214 = auVar17._16_4_;
      auVar34._16_4_ = fVar214 * fVar172;
      fVar270 = auVar226._20_4_;
      fVar215 = auVar17._20_4_;
      auVar34._20_4_ = fVar215 * fVar270;
      fVar120 = auVar226._24_4_;
      fVar217 = auVar17._24_4_;
      auVar34._24_4_ = fVar217 * fVar120;
      auVar34._28_4_ = auVar13._28_4_;
      fVar202 = local_5a0._0_4_;
      fVar143 = auVar283._0_4_;
      fVar291 = local_5a0._4_4_;
      fVar144 = auVar283._4_4_;
      auVar35._4_4_ = fVar144 * fVar291;
      auVar35._0_4_ = fVar143 * fVar202;
      fVar293 = local_5a0._8_4_;
      fVar175 = auVar283._8_4_;
      auVar35._8_4_ = fVar175 * fVar293;
      fVar171 = local_5a0._12_4_;
      fVar176 = auVar283._12_4_;
      auVar35._12_4_ = fVar176 * fVar171;
      fVar268 = local_5a0._16_4_;
      fVar190 = auVar283._16_4_;
      auVar35._16_4_ = fVar190 * fVar268;
      fVar271 = local_5a0._20_4_;
      fVar191 = auVar283._20_4_;
      auVar35._20_4_ = fVar191 * fVar271;
      fVar139 = local_5a0._24_4_;
      fVar192 = auVar283._24_4_;
      uVar115 = auVar18._28_4_;
      auVar35._24_4_ = fVar192 * fVar139;
      auVar35._28_4_ = uVar115;
      auVar13 = vsubps_avx(auVar35,auVar34);
      fVar233 = local_7c0._0_4_;
      fVar149 = local_7c0._4_4_;
      auVar36._4_4_ = fVar144 * fVar149;
      auVar36._0_4_ = fVar143 * fVar233;
      fVar295 = local_7c0._8_4_;
      auVar36._8_4_ = fVar175 * fVar295;
      fVar266 = local_7c0._12_4_;
      auVar36._12_4_ = fVar176 * fVar266;
      fVar269 = local_7c0._16_4_;
      auVar36._16_4_ = fVar190 * fVar269;
      fVar221 = local_7c0._20_4_;
      auVar36._20_4_ = fVar191 * fVar221;
      fVar142 = local_7c0._24_4_;
      auVar36._24_4_ = fVar192 * fVar142;
      auVar36._28_4_ = uVar115;
      fVar240 = auVar186._0_4_;
      fVar292 = auVar186._4_4_;
      auVar37._4_4_ = fVar148 * fVar292;
      auVar37._0_4_ = fVar147 * fVar240;
      fVar296 = auVar186._8_4_;
      auVar37._8_4_ = fVar203 * fVar296;
      fVar267 = auVar186._12_4_;
      auVar37._12_4_ = fVar213 * fVar267;
      fVar220 = auVar186._16_4_;
      auVar37._16_4_ = fVar214 * fVar220;
      fVar174 = auVar186._20_4_;
      auVar37._20_4_ = fVar215 * fVar174;
      fVar145 = auVar186._24_4_;
      auVar37._24_4_ = fVar217 * fVar145;
      auVar37._28_4_ = auVar312._28_4_;
      auVar18 = vsubps_avx(auVar37,auVar36);
      auVar38._4_4_ = fVar291 * fVar292;
      auVar38._0_4_ = fVar202 * fVar240;
      auVar38._8_4_ = fVar293 * fVar296;
      auVar38._12_4_ = fVar171 * fVar267;
      auVar38._16_4_ = fVar268 * fVar220;
      auVar38._20_4_ = fVar271 * fVar174;
      auVar38._24_4_ = fVar139 * fVar145;
      auVar38._28_4_ = uVar115;
      auVar39._4_4_ = fVar149 * fVar244;
      auVar39._0_4_ = fVar233 * fVar231;
      auVar39._8_4_ = fVar295 * fVar294;
      auVar39._12_4_ = fVar266 * fVar216;
      auVar39._16_4_ = fVar269 * fVar172;
      auVar39._20_4_ = fVar221 * fVar270;
      auVar39._24_4_ = fVar142 * fVar120;
      auVar39._28_4_ = auVar322._28_4_;
      auVar20 = vsubps_avx(auVar39,auVar38);
      auVar17 = vsubps_avx(auVar17,auVar11);
      fVar242 = auVar20._28_4_ + auVar18._28_4_;
      auVar209._0_4_ = auVar20._0_4_ + auVar18._0_4_ * 0.0 + auVar13._0_4_ * 0.0;
      auVar209._4_4_ = auVar20._4_4_ + auVar18._4_4_ * 0.0 + auVar13._4_4_ * 0.0;
      auVar209._8_4_ = auVar20._8_4_ + auVar18._8_4_ * 0.0 + auVar13._8_4_ * 0.0;
      auVar209._12_4_ = auVar20._12_4_ + auVar18._12_4_ * 0.0 + auVar13._12_4_ * 0.0;
      auVar209._16_4_ = auVar20._16_4_ + auVar18._16_4_ * 0.0 + auVar13._16_4_ * 0.0;
      auVar209._20_4_ = auVar20._20_4_ + auVar18._20_4_ * 0.0 + auVar13._20_4_ * 0.0;
      auVar209._24_4_ = auVar20._24_4_ + auVar18._24_4_ * 0.0 + auVar13._24_4_ * 0.0;
      auVar209._28_4_ = fVar242 + 0.0;
      fVar219 = auVar19._0_4_;
      fVar118 = auVar19._4_4_;
      auVar40._4_4_ = fVar118 * auVar11._4_4_;
      auVar40._0_4_ = fVar219 * auVar11._0_4_;
      fVar119 = auVar19._8_4_;
      auVar40._8_4_ = fVar119 * auVar11._8_4_;
      fVar137 = auVar19._12_4_;
      auVar40._12_4_ = fVar137 * auVar11._12_4_;
      fVar138 = auVar19._16_4_;
      auVar40._16_4_ = fVar138 * auVar11._16_4_;
      fVar140 = auVar19._20_4_;
      auVar40._20_4_ = fVar140 * auVar11._20_4_;
      fVar141 = auVar19._24_4_;
      auVar40._24_4_ = fVar141 * auVar11._24_4_;
      auVar40._28_4_ = fVar242;
      fVar242 = auVar17._0_4_;
      fVar309 = auVar17._4_4_;
      auVar41._4_4_ = auVar22._4_4_ * fVar309;
      auVar41._0_4_ = auVar22._0_4_ * fVar242;
      fVar261 = auVar17._8_4_;
      auVar41._8_4_ = auVar22._8_4_ * fVar261;
      fVar218 = auVar17._12_4_;
      auVar41._12_4_ = auVar22._12_4_ * fVar218;
      fVar173 = auVar17._16_4_;
      auVar41._16_4_ = auVar22._16_4_ * fVar173;
      fVar194 = auVar17._20_4_;
      auVar41._20_4_ = auVar22._20_4_ * fVar194;
      fVar146 = auVar17._24_4_;
      auVar41._24_4_ = auVar22._24_4_ * fVar146;
      auVar41._28_4_ = auVar20._28_4_;
      auVar13 = vsubps_avx(auVar41,auVar40);
      auVar18 = vsubps_avx(_local_7c0,auVar16);
      fVar150 = auVar18._0_4_;
      fVar245 = auVar18._4_4_;
      auVar42._4_4_ = fVar245 * auVar11._4_4_;
      auVar42._0_4_ = fVar150 * auVar11._0_4_;
      fVar193 = auVar18._8_4_;
      auVar42._8_4_ = fVar193 * auVar11._8_4_;
      fVar232 = auVar18._12_4_;
      auVar42._12_4_ = fVar232 * auVar11._12_4_;
      fVar234 = auVar18._16_4_;
      auVar42._16_4_ = fVar234 * auVar11._16_4_;
      fVar241 = auVar18._20_4_;
      auVar42._20_4_ = fVar241 * auVar11._20_4_;
      fVar243 = auVar18._24_4_;
      auVar42._24_4_ = fVar243 * auVar11._24_4_;
      auVar42._28_4_ = auVar11._28_4_;
      auVar43._4_4_ = auVar16._4_4_ * fVar309;
      auVar43._0_4_ = auVar16._0_4_ * fVar242;
      auVar43._8_4_ = auVar16._8_4_ * fVar261;
      auVar43._12_4_ = auVar16._12_4_ * fVar218;
      auVar43._16_4_ = auVar16._16_4_ * fVar173;
      auVar43._20_4_ = auVar16._20_4_ * fVar194;
      auVar43._24_4_ = auVar16._24_4_ * fVar146;
      auVar43._28_4_ = 0;
      auVar18 = vsubps_avx(auVar42,auVar43);
      auVar44._4_4_ = auVar22._4_4_ * fVar245;
      auVar44._0_4_ = auVar22._0_4_ * fVar150;
      auVar44._8_4_ = auVar22._8_4_ * fVar193;
      auVar44._12_4_ = auVar22._12_4_ * fVar232;
      auVar44._16_4_ = auVar22._16_4_ * fVar234;
      auVar44._20_4_ = auVar22._20_4_ * fVar241;
      auVar44._24_4_ = auVar22._24_4_ * fVar243;
      auVar44._28_4_ = auVar11._28_4_;
      auVar45._4_4_ = auVar16._4_4_ * fVar118;
      auVar45._0_4_ = auVar16._0_4_ * fVar219;
      auVar45._8_4_ = auVar16._8_4_ * fVar119;
      auVar45._12_4_ = auVar16._12_4_ * fVar137;
      auVar45._16_4_ = auVar16._16_4_ * fVar138;
      auVar45._20_4_ = auVar16._20_4_ * fVar140;
      auVar45._24_4_ = auVar16._24_4_ * fVar141;
      auVar45._28_4_ = auVar16._28_4_;
      auVar16 = vsubps_avx(auVar45,auVar44);
      auVar188._0_4_ = auVar13._0_4_ * 0.0 + auVar16._0_4_ + auVar18._0_4_ * 0.0;
      auVar188._4_4_ = auVar13._4_4_ * 0.0 + auVar16._4_4_ + auVar18._4_4_ * 0.0;
      auVar188._8_4_ = auVar13._8_4_ * 0.0 + auVar16._8_4_ + auVar18._8_4_ * 0.0;
      auVar188._12_4_ = auVar13._12_4_ * 0.0 + auVar16._12_4_ + auVar18._12_4_ * 0.0;
      auVar188._16_4_ = auVar13._16_4_ * 0.0 + auVar16._16_4_ + auVar18._16_4_ * 0.0;
      auVar188._20_4_ = auVar13._20_4_ * 0.0 + auVar16._20_4_ + auVar18._20_4_ * 0.0;
      auVar188._24_4_ = auVar13._24_4_ * 0.0 + auVar16._24_4_ + auVar18._24_4_ * 0.0;
      auVar188._28_4_ = auVar16._28_4_ + auVar16._28_4_ + auVar18._28_4_;
      auVar189 = ZEXT3264(auVar188);
      auVar13 = vmaxps_avx(auVar209,auVar188);
      auVar13 = vcmpps_avx(auVar13,ZEXT832(0) << 0x20,2);
      auVar184 = vpackssdw_avx(auVar13._0_16_,auVar13._16_16_);
      auVar328 = vpand_avx(auVar328,auVar184);
      auVar184 = vpmovsxwd_avx(auVar328);
      auVar207 = vpunpckhwd_avx(auVar328,auVar328);
      auVar129._16_16_ = auVar207;
      auVar129._0_16_ = auVar184;
      if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar129 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar129 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar129 >> 0x7f,0) == '\0') &&
            (auVar129 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB161(auVar207 >> 0x3f,0) == '\0') &&
          (auVar129 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar207[0xf]
         ) {
LAB_007be0df:
        auVar164 = ZEXT3264(CONCAT824(uStack_4c8,
                                      CONCAT816(uStack_4d0,CONCAT88(uStack_4d8,local_4e0))));
        auVar265 = ZEXT3264(auVar163);
        auVar278 = ZEXT3264(auVar274);
      }
      else {
        auVar46._4_4_ = fVar309 * fVar244;
        auVar46._0_4_ = fVar242 * fVar231;
        auVar46._8_4_ = fVar261 * fVar294;
        auVar46._12_4_ = fVar218 * fVar216;
        auVar46._16_4_ = fVar173 * fVar172;
        auVar46._20_4_ = fVar194 * fVar270;
        auVar46._24_4_ = fVar146 * fVar120;
        auVar46._28_4_ = auVar207._12_4_;
        auVar298._0_4_ = fVar219 * fVar143;
        auVar298._4_4_ = fVar118 * fVar144;
        auVar298._8_4_ = fVar119 * fVar175;
        auVar298._12_4_ = fVar137 * fVar176;
        auVar298._16_4_ = fVar138 * fVar190;
        auVar298._20_4_ = fVar140 * fVar191;
        auVar298._24_4_ = fVar141 * fVar192;
        auVar298._28_4_ = 0;
        auVar16 = vsubps_avx(auVar298,auVar46);
        auVar47._4_4_ = fVar245 * fVar144;
        auVar47._0_4_ = fVar150 * fVar143;
        auVar47._8_4_ = fVar193 * fVar175;
        auVar47._12_4_ = fVar232 * fVar176;
        auVar47._16_4_ = fVar234 * fVar190;
        auVar47._20_4_ = fVar241 * fVar191;
        auVar47._24_4_ = fVar243 * fVar192;
        auVar47._28_4_ = auVar283._28_4_;
        auVar48._4_4_ = fVar309 * fVar292;
        auVar48._0_4_ = fVar242 * fVar240;
        auVar48._8_4_ = fVar261 * fVar296;
        auVar48._12_4_ = fVar218 * fVar267;
        auVar48._16_4_ = fVar173 * fVar220;
        auVar48._20_4_ = fVar194 * fVar174;
        auVar48._24_4_ = fVar146 * fVar145;
        auVar48._28_4_ = auVar17._28_4_;
        auVar22 = vsubps_avx(auVar48,auVar47);
        auVar49._4_4_ = fVar118 * fVar292;
        auVar49._0_4_ = fVar219 * fVar240;
        auVar49._8_4_ = fVar119 * fVar296;
        auVar49._12_4_ = fVar137 * fVar267;
        auVar49._16_4_ = fVar138 * fVar220;
        auVar49._20_4_ = fVar140 * fVar174;
        auVar49._24_4_ = fVar141 * fVar145;
        auVar49._28_4_ = auVar186._28_4_;
        auVar50._4_4_ = fVar245 * fVar244;
        auVar50._0_4_ = fVar150 * fVar231;
        auVar50._8_4_ = fVar193 * fVar294;
        auVar50._12_4_ = fVar232 * fVar216;
        auVar50._16_4_ = fVar234 * fVar172;
        auVar50._20_4_ = fVar241 * fVar270;
        auVar50._24_4_ = fVar243 * fVar120;
        auVar50._28_4_ = auVar226._28_4_;
        auVar11 = vsubps_avx(auVar50,auVar49);
        auVar253._0_4_ = auVar16._0_4_ * 0.0 + auVar11._0_4_ + auVar22._0_4_ * 0.0;
        auVar253._4_4_ = auVar16._4_4_ * 0.0 + auVar11._4_4_ + auVar22._4_4_ * 0.0;
        auVar253._8_4_ = auVar16._8_4_ * 0.0 + auVar11._8_4_ + auVar22._8_4_ * 0.0;
        auVar253._12_4_ = auVar16._12_4_ * 0.0 + auVar11._12_4_ + auVar22._12_4_ * 0.0;
        auVar253._16_4_ = auVar16._16_4_ * 0.0 + auVar11._16_4_ + auVar22._16_4_ * 0.0;
        auVar253._20_4_ = auVar16._20_4_ * 0.0 + auVar11._20_4_ + auVar22._20_4_ * 0.0;
        auVar253._24_4_ = auVar16._24_4_ * 0.0 + auVar11._24_4_ + auVar22._24_4_ * 0.0;
        auVar253._28_4_ = auVar226._28_4_ + auVar11._28_4_ + auVar186._28_4_;
        auVar13 = vrcpps_avx(auVar253);
        fVar240 = auVar13._0_4_;
        fVar242 = auVar13._4_4_;
        auVar51._4_4_ = auVar253._4_4_ * fVar242;
        auVar51._0_4_ = auVar253._0_4_ * fVar240;
        fVar244 = auVar13._8_4_;
        auVar51._8_4_ = auVar253._8_4_ * fVar244;
        fVar292 = auVar13._12_4_;
        auVar51._12_4_ = auVar253._12_4_ * fVar292;
        fVar309 = auVar13._16_4_;
        auVar51._16_4_ = auVar253._16_4_ * fVar309;
        fVar294 = auVar13._20_4_;
        auVar51._20_4_ = auVar253._20_4_ * fVar294;
        fVar296 = auVar13._24_4_;
        auVar51._24_4_ = auVar253._24_4_ * fVar296;
        auVar51._28_4_ = auVar17._28_4_;
        auVar299._8_4_ = 0x3f800000;
        auVar299._0_8_ = 0x3f8000003f800000;
        auVar299._12_4_ = 0x3f800000;
        auVar299._16_4_ = 0x3f800000;
        auVar299._20_4_ = 0x3f800000;
        auVar299._24_4_ = 0x3f800000;
        auVar299._28_4_ = 0x3f800000;
        auVar13 = vsubps_avx(auVar299,auVar51);
        fVar240 = auVar13._0_4_ * fVar240 + fVar240;
        fVar242 = auVar13._4_4_ * fVar242 + fVar242;
        fVar244 = auVar13._8_4_ * fVar244 + fVar244;
        fVar292 = auVar13._12_4_ * fVar292 + fVar292;
        fVar309 = auVar13._16_4_ * fVar309 + fVar309;
        fVar294 = auVar13._20_4_ * fVar294 + fVar294;
        fVar296 = auVar13._24_4_ * fVar296 + fVar296;
        auVar160._0_4_ =
             (auVar16._0_4_ * fVar233 + auVar22._0_4_ * fVar202 + auVar11._0_4_ * fVar147) * fVar240
        ;
        auVar160._4_4_ =
             (auVar16._4_4_ * fVar149 + auVar22._4_4_ * fVar291 + auVar11._4_4_ * fVar148) * fVar242
        ;
        auVar160._8_4_ =
             (auVar16._8_4_ * fVar295 + auVar22._8_4_ * fVar293 + auVar11._8_4_ * fVar203) * fVar244
        ;
        auVar160._12_4_ =
             (auVar16._12_4_ * fVar266 + auVar22._12_4_ * fVar171 + auVar11._12_4_ * fVar213) *
             fVar292;
        auVar160._16_4_ =
             (auVar16._16_4_ * fVar269 + auVar22._16_4_ * fVar268 + auVar11._16_4_ * fVar214) *
             fVar309;
        auVar160._20_4_ =
             (auVar16._20_4_ * fVar221 + auVar22._20_4_ * fVar271 + auVar11._20_4_ * fVar215) *
             fVar294;
        auVar160._24_4_ =
             (auVar16._24_4_ * fVar142 + auVar22._24_4_ * fVar139 + auVar11._24_4_ * fVar217) *
             fVar296;
        auVar160._28_4_ = 0;
        auVar130._16_16_ = auVar14;
        auVar130._0_16_ = auVar14;
        auVar13 = vcmpps_avx(auVar130,auVar160,2);
        fVar231 = ray->tfar;
        auVar210._4_4_ = fVar231;
        auVar210._0_4_ = fVar231;
        auVar210._8_4_ = fVar231;
        auVar210._12_4_ = fVar231;
        auVar210._16_4_ = fVar231;
        auVar210._20_4_ = fVar231;
        auVar210._24_4_ = fVar231;
        auVar210._28_4_ = fVar231;
        auVar17 = vcmpps_avx(auVar160,auVar210,2);
        auVar13 = vandps_avx(auVar17,auVar13);
        auVar184 = vpackssdw_avx(auVar13._0_16_,auVar13._16_16_);
        auVar328 = vpand_avx(auVar328,auVar184);
        auVar184 = vpmovsxwd_avx(auVar328);
        auVar207 = vpshufd_avx(auVar328,0xee);
        auVar207 = vpmovsxwd_avx(auVar207);
        auVar131._16_16_ = auVar207;
        auVar131._0_16_ = auVar184;
        if ((((((((auVar131 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar131 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar131 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar131 >> 0x7f,0) == '\0') &&
              (auVar131 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar207 >> 0x3f,0) == '\0') &&
            (auVar131 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar207[0xf]) goto LAB_007be0df;
        auVar13 = vcmpps_avx(ZEXT832(0) << 0x20,auVar253,4);
        auVar184 = vpackssdw_avx(auVar13._0_16_,auVar13._16_16_);
        auVar328 = vpand_avx(auVar328,auVar184);
        auVar184 = vpmovsxwd_avx(auVar328);
        auVar328 = vpunpckhwd_avx(auVar328,auVar328);
        auVar227._16_16_ = auVar328;
        auVar227._0_16_ = auVar184;
        auVar164 = ZEXT3264(CONCAT824(uStack_4c8,
                                      CONCAT816(uStack_4d0,CONCAT88(uStack_4d8,local_4e0))));
        auVar265 = ZEXT3264(auVar163);
        auVar278 = ZEXT3264(auVar274);
        if ((((((((auVar227 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar227 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar227 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar227 >> 0x7f,0) != '\0') ||
              (auVar227 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar328 >> 0x3f,0) != '\0') ||
            (auVar227 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar328[0xf] < '\0') {
          auVar132._0_4_ = auVar209._0_4_ * fVar240;
          auVar132._4_4_ = auVar209._4_4_ * fVar242;
          auVar132._8_4_ = auVar209._8_4_ * fVar244;
          auVar132._12_4_ = auVar209._12_4_ * fVar292;
          auVar132._16_4_ = auVar209._16_4_ * fVar309;
          auVar132._20_4_ = auVar209._20_4_ * fVar294;
          auVar132._24_4_ = auVar209._24_4_ * fVar296;
          auVar132._28_4_ = 0;
          auVar274._4_4_ = auVar188._4_4_ * fVar242;
          auVar274._0_4_ = auVar188._0_4_ * fVar240;
          auVar274._8_4_ = auVar188._8_4_ * fVar244;
          auVar274._12_4_ = auVar188._12_4_ * fVar292;
          auVar274._16_4_ = auVar188._16_4_ * fVar309;
          auVar274._20_4_ = auVar188._20_4_ * fVar294;
          auVar274._24_4_ = auVar188._24_4_ * fVar296;
          auVar274._28_4_ = auVar188._28_4_;
          auVar189 = ZEXT3264(auVar274);
          auVar238._8_4_ = 0x3f800000;
          auVar238._0_8_ = 0x3f8000003f800000;
          auVar238._12_4_ = 0x3f800000;
          auVar238._16_4_ = 0x3f800000;
          auVar238._20_4_ = 0x3f800000;
          auVar238._24_4_ = 0x3f800000;
          auVar238._28_4_ = 0x3f800000;
          auVar163 = vsubps_avx(auVar238,auVar132);
          auVar163 = vblendvps_avx(auVar163,auVar132,auVar12);
          auVar265 = ZEXT3264(auVar163);
          auVar163 = vsubps_avx(auVar238,auVar274);
          _local_3e0 = vblendvps_avx(auVar163,auVar274,auVar12);
          auVar164 = ZEXT3264(auVar227);
          auVar278 = ZEXT3264(auVar160);
        }
      }
      auVar313 = ZEXT3264(_local_600);
      auVar287 = ZEXT3264(local_6e0);
      auVar163 = auVar164._0_32_;
      if ((((((((auVar163 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar163 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar163 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar163 >> 0x7f,0) == '\0') &&
            (auVar164 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
           SUB321(auVar163 >> 0xbf,0) == '\0') &&
          (auVar164 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
          -1 < auVar164[0x1f]) {
        uVar113 = 0;
        _local_7d0 = auVar122;
        _local_760 = auVar14;
LAB_007bce02:
        fVar152 = (float)local_660._0_4_;
        fVar166 = (float)local_660._4_4_;
        fVar168 = fStack_658;
        fVar170 = fStack_654;
        fVar200 = fStack_650;
        fVar230 = fStack_64c;
        fVar201 = fStack_648;
        auVar122 = _local_7d0;
        auVar14 = _local_760;
      }
      else {
        auVar274 = vsubps_avx(local_6c0,local_780);
        fVar202 = (float)local_780._0_4_ + auVar265._0_4_ * auVar274._0_4_;
        fVar233 = local_780._4_4_ + auVar265._4_4_ * auVar274._4_4_;
        fVar240 = local_780._8_4_ + auVar265._8_4_ * auVar274._8_4_;
        fVar242 = local_780._12_4_ + auVar265._12_4_ * auVar274._12_4_;
        fVar244 = local_780._16_4_ + auVar265._16_4_ * auVar274._16_4_;
        fVar291 = local_780._20_4_ + auVar265._20_4_ * auVar274._20_4_;
        fVar149 = local_780._24_4_ + auVar265._24_4_ * auVar274._24_4_;
        fVar292 = auVar274._28_4_ + 0.0;
        fVar231 = local_7e8->depth_scale;
        auVar52._4_4_ = (fVar233 + fVar233) * fVar231;
        auVar52._0_4_ = (fVar202 + fVar202) * fVar231;
        auVar52._8_4_ = (fVar240 + fVar240) * fVar231;
        auVar52._12_4_ = (fVar242 + fVar242) * fVar231;
        auVar52._16_4_ = (fVar244 + fVar244) * fVar231;
        auVar52._20_4_ = (fVar291 + fVar291) * fVar231;
        auVar52._24_4_ = (fVar149 + fVar149) * fVar231;
        auVar52._28_4_ = fVar292 + fVar292;
        local_280 = auVar278._0_32_;
        auVar274 = vcmpps_avx(local_280,auVar52,6);
        auVar13 = auVar163 & auVar274;
        if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar13 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar13 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar13 >> 0x7f,0) == '\0') &&
              (auVar13 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar13 >> 0xbf,0) == '\0') &&
            (auVar13 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar13[0x1f]) {
          uVar113 = 0;
          _local_540 = auVar15;
          _local_530 = auVar123;
        }
        else {
          local_200 = vandps_avx(auVar274,auVar163);
          local_2a0._0_4_ = (float)local_3e0._0_4_ + (float)local_3e0._0_4_ + -1.0;
          local_2a0._4_4_ = (float)local_3e0._4_4_ + (float)local_3e0._4_4_ + -1.0;
          fStack_298 = (float)uStack_3d8 + (float)uStack_3d8 + -1.0;
          fStack_294 = uStack_3d8._4_4_ + uStack_3d8._4_4_ + -1.0;
          fStack_290 = (float)uStack_3d0 + (float)uStack_3d0 + -1.0;
          fStack_28c = uStack_3d0._4_4_ + uStack_3d0._4_4_ + -1.0;
          fStack_288 = (float)uStack_3c8 + (float)uStack_3c8 + -1.0;
          fStack_284 = uStack_3c8._4_4_ + uStack_3c8._4_4_ + -1.0;
          local_2c0 = auVar265._0_32_;
          local_260 = 0;
          local_25c = uVar107;
          local_250 = local_7d0;
          uStack_248 = local_7d0._8_8_;
          local_240 = local_530;
          uStack_238 = uStack_528;
          local_230 = local_540;
          uStack_228 = uStack_538;
          auVar189 = ZEXT1664(_local_550);
          local_220 = _local_550;
          local_3e0._4_4_ = local_2a0._4_4_;
          local_3e0._0_4_ = local_2a0._0_4_;
          uStack_3d8._0_4_ = fStack_298;
          uStack_3d8._4_4_ = fStack_294;
          uStack_3d0._0_4_ = fStack_290;
          uStack_3d0._4_4_ = fStack_28c;
          auVar158 = _local_3e0;
          uStack_3c8._0_4_ = fStack_288;
          uStack_3c8._4_4_ = fStack_284;
          auVar163 = _local_3e0;
          _local_540 = auVar15;
          _local_530 = auVar123;
          if ((pGVar9->mask & ray->mask) != 0) {
            pGVar110 = (Geometry *)context->args;
            if ((((Geometry *)context->args)->device == (Device *)0x0) &&
               (uVar113 = CONCAT71((int7)((ulong)pGVar9 >> 8),1), pGVar110 = pGVar9,
               pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_007bd23f;
            auVar181._0_4_ = 1.0 / auVar225._0_4_;
            auVar181._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar328 = vshufps_avx(auVar181,auVar181,0);
            auVar189 = ZEXT3264(CONCAT1616(auVar328,auVar328));
            local_1e0[0] = auVar328._0_4_ * (auVar265._0_4_ + 0.0);
            local_1e0[1] = auVar328._4_4_ * (auVar265._4_4_ + 1.0);
            local_1e0[2] = auVar328._8_4_ * (auVar265._8_4_ + 2.0);
            local_1e0[3] = auVar328._12_4_ * (auVar265._12_4_ + 3.0);
            fStack_1d0 = auVar328._0_4_ * (auVar265._16_4_ + 4.0);
            fStack_1cc = auVar328._4_4_ * (auVar265._20_4_ + 5.0);
            fStack_1c8 = auVar328._8_4_ * (auVar265._24_4_ + 6.0);
            fStack_1c4 = auVar265._28_4_ + 7.0;
            uStack_3d0 = auVar158._16_8_;
            uStack_3c8 = auVar163._24_8_;
            local_1c0 = local_3e0;
            uStack_1b8 = uStack_3d8;
            uStack_1b0 = uStack_3d0;
            uStack_1a8 = uStack_3c8;
            local_1a0 = local_280;
            uVar115 = vmovmskps_avx(local_200);
            uVar113 = CONCAT44((int)((ulong)pGVar110 >> 0x20),uVar115);
            lVar112 = 0;
            if (uVar113 != 0) {
              for (; (uVar113 >> lVar112 & 1) == 0; lVar112 = lVar112 + 1) {
              }
            }
            local_700 = auVar265._0_32_;
            local_720 = local_280;
            fVar222 = (float)local_7d0._0_4_;
            fVar195 = (float)local_7d0._4_4_;
            fVar229 = (float)uStack_7c8;
            fVar231 = uStack_7c8._4_4_;
            _local_7d0 = auVar122;
            _local_3e0 = auVar163;
            while (auVar122 = _local_7d0, auVar14 = _local_760, uVar113 != 0) {
              local_780._0_8_ = uVar113;
              local_624 = local_1e0[lVar112];
              local_620 = *(undefined4 *)((long)&local_1c0 + lVar112 * 4);
              local_6c0._0_4_ = ray->tfar;
              local_7c0 = (undefined1  [8])lVar112;
              ray->tfar = *(float *)(local_1a0 + lVar112 * 4);
              local_690.context = context->user;
              fVar230 = 1.0 - local_624;
              fVar200 = local_624 * fVar230 * 4.0;
              auVar328 = ZEXT416((uint)(local_624 * local_624 * 0.5));
              auVar328 = vshufps_avx(auVar328,auVar328,0);
              auVar184 = ZEXT416((uint)((fVar230 * fVar230 + fVar200) * 0.5));
              auVar184 = vshufps_avx(auVar184,auVar184,0);
              auVar207 = ZEXT416((uint)((-local_624 * local_624 - fVar200) * 0.5));
              auVar207 = vshufps_avx(auVar207,auVar207,0);
              auVar198 = ZEXT416((uint)(fVar230 * -fVar230 * 0.5));
              auVar198 = vshufps_avx(auVar198,auVar198,0);
              auVar182._0_4_ =
                   fVar222 * auVar198._0_4_ +
                   auVar207._0_4_ * (float)local_530._0_4_ +
                   auVar328._0_4_ * (float)local_550._0_4_ + auVar184._0_4_ * (float)local_540._0_4_
              ;
              auVar182._4_4_ =
                   fVar195 * auVar198._4_4_ +
                   auVar207._4_4_ * (float)local_530._4_4_ +
                   auVar328._4_4_ * (float)local_550._4_4_ + auVar184._4_4_ * (float)local_540._4_4_
              ;
              auVar182._8_4_ =
                   fVar229 * auVar198._8_4_ +
                   auVar207._8_4_ * (float)uStack_528 +
                   auVar328._8_4_ * fStack_548 + auVar184._8_4_ * (float)uStack_538;
              auVar182._12_4_ =
                   fVar231 * auVar198._12_4_ +
                   auVar207._12_4_ * uStack_528._4_4_ +
                   auVar328._12_4_ * fStack_544 + auVar184._12_4_ * uStack_538._4_4_;
              auVar189 = ZEXT1664(auVar182);
              local_630 = vmovlps_avx(auVar182);
              local_628 = vextractps_avx(auVar182,2);
              local_61c = local_7d4;
              local_618 = (int)local_728;
              local_614 = (local_690.context)->instID[0];
              local_610 = (local_690.context)->instPrimID[0];
              local_804 = -1;
              local_690.valid = &local_804;
              local_690.geometryUserPtr = *(void **)(local_4c0._0_8_ + 0x18);
              local_690.ray = (RTCRayN *)ray;
              local_690.hit = (RTCHitN *)&local_630;
              local_690.N = 1;
              if (*(code **)(local_4c0._0_8_ + 0x48) == (code *)0x0) {
LAB_007bd163:
                pRVar111 = context->args;
                pRVar114 = pRVar111;
                if ((pRVar111->filter != (RTCFilterFunctionN)0x0) &&
                   (((pRVar111->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                    (pRVar114 = (RTCIntersectArguments *)local_4c0._0_8_,
                    ((ulong)((RTCIntersectArguments *)(local_4c0._0_8_ + 0x20))->intersect &
                    0x40000000000000) != 0)))) {
                  auVar189 = ZEXT1664(auVar189._0_16_);
                  (*pRVar111->filter)(&local_690);
                  if (*local_690.valid == 0) goto LAB_007bd1ae;
                }
                uVar113 = CONCAT71((int7)((ulong)pRVar114 >> 8),1);
                auVar265 = ZEXT3264(local_700);
                auVar278 = ZEXT3264(local_720);
                auVar287 = ZEXT3264(local_6e0);
                auVar313 = ZEXT3264(_local_600);
                fVar151 = (float)local_7a0._0_4_;
                fVar165 = (float)local_7a0._4_4_;
                fVar167 = fStack_798;
                fVar169 = fStack_794;
                fVar222 = fStack_790;
                fVar195 = fStack_78c;
                fVar229 = fStack_788;
                goto LAB_007bce02;
              }
              auVar189 = ZEXT1664(auVar182);
              (**(code **)(local_4c0._0_8_ + 0x48))(&local_690);
              if (*local_690.valid != 0) goto LAB_007bd163;
LAB_007bd1ae:
              ray->tfar = (float)local_6c0._0_4_;
              uVar113 = local_780._0_8_ ^ 1L << ((ulong)local_7c0 & 0x3f);
              lVar112 = 0;
              if (uVar113 != 0) {
                for (; (uVar113 >> lVar112 & 1) == 0; lVar112 = lVar112 + 1) {
                }
              }
              auVar265 = ZEXT3264(local_700);
              auVar278 = ZEXT3264(local_720);
              auVar287 = ZEXT3264(local_6e0);
              auVar313 = ZEXT3264(_local_600);
              fVar152 = (float)local_660._0_4_;
              fVar166 = (float)local_660._4_4_;
              fVar168 = fStack_658;
              fVar170 = fStack_654;
              fVar200 = fStack_650;
              fVar230 = fStack_64c;
              fVar201 = fStack_648;
              fVar222 = (float)local_7d0._0_4_;
              fVar195 = (float)local_7d0._4_4_;
              fVar229 = (float)uStack_7c8;
              fVar231 = uStack_7c8._4_4_;
            }
          }
          _local_760 = auVar14;
          _local_7d0 = auVar122;
          uVar113 = 0;
          fVar151 = (float)local_7a0._0_4_;
          fVar165 = (float)local_7a0._4_4_;
          fVar167 = fStack_798;
          fVar169 = fStack_794;
          fVar222 = fStack_790;
          fVar195 = fStack_78c;
          fVar229 = fStack_788;
          auVar122 = _local_7d0;
          auVar14 = _local_760;
        }
      }
    }
LAB_007bd23f:
    _local_760 = auVar14;
    _local_7d0 = auVar122;
    auVar164 = ZEXT1664(local_800);
    auVar254 = ZEXT3264(_local_580);
    if (8 < (int)uVar107) {
      auVar328 = vpshufd_avx(ZEXT416(uVar107),0);
      local_3a0 = auVar328._0_4_;
      fStack_39c = auVar328._4_4_;
      fStack_398 = auVar328._8_4_;
      fStack_394 = auVar328._12_4_;
      auVar328 = vshufps_avx(local_800,local_800,0);
      local_4c0._16_16_ = auVar328;
      local_4c0._0_16_ = auVar328;
      local_e0 = local_760;
      uStack_d8 = uStack_758;
      uStack_d0 = local_760;
      uStack_c8 = uStack_758;
      auVar125._0_4_ = 1.0 / local_4a0;
      auVar125._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar328 = vshufps_avx(auVar125,auVar125,0);
      register0x00001210 = auVar328;
      _local_100 = auVar328;
      auVar136 = ZEXT3264(_local_100);
      local_700 = auVar265._0_32_;
      local_720 = auVar278._0_32_;
      for (lVar112 = 8; lVar112 < local_7f0; lVar112 = lVar112 + 8) {
        uVar115 = (undefined4)uVar113;
        local_780._0_4_ = uVar115;
        pauVar1 = (undefined1 (*) [28])(bspline_basis0 + lVar112 * 4 + lVar109);
        fVar231 = *(float *)*pauVar1;
        fVar202 = *(float *)(*pauVar1 + 4);
        fVar233 = *(float *)(*pauVar1 + 8);
        fVar240 = *(float *)(*pauVar1 + 0xc);
        fVar242 = *(float *)(*pauVar1 + 0x10);
        fVar244 = *(float *)(*pauVar1 + 0x14);
        fVar291 = *(float *)(*pauVar1 + 0x18);
        auVar106 = *pauVar1;
        pauVar2 = (undefined1 (*) [28])(lVar109 + 0x21fffac + lVar112 * 4);
        fVar149 = *(float *)*pauVar2;
        fVar292 = *(float *)(*pauVar2 + 4);
        fVar309 = *(float *)(*pauVar2 + 8);
        fVar294 = *(float *)(*pauVar2 + 0xc);
        fVar293 = *(float *)(*pauVar2 + 0x10);
        fVar295 = *(float *)(*pauVar2 + 0x14);
        fVar296 = *(float *)(*pauVar2 + 0x18);
        auVar105 = *pauVar2;
        pfVar3 = (float *)(lVar109 + 0x2200430 + lVar112 * 4);
        fVar216 = *pfVar3;
        fVar171 = pfVar3[1];
        fVar266 = pfVar3[2];
        fVar267 = pfVar3[3];
        fVar218 = pfVar3[4];
        fVar172 = pfVar3[5];
        fVar268 = pfVar3[6];
        pfVar3 = (float *)(lVar109 + 0x22008b4 + lVar112 * 4);
        fVar269 = *pfVar3;
        fVar220 = pfVar3[1];
        fVar173 = pfVar3[2];
        fVar270 = pfVar3[3];
        fVar271 = pfVar3[4];
        fVar221 = pfVar3[5];
        fVar174 = pfVar3[6];
        fVar261 = pfVar3[7];
        fVar215 = auVar287._0_4_;
        fVar217 = auVar287._4_4_;
        fVar219 = auVar287._8_4_;
        fVar118 = auVar287._12_4_;
        fVar119 = auVar287._16_4_;
        fVar137 = auVar287._20_4_;
        fVar138 = auVar287._24_4_;
        fVar194 = fVar261 + auVar189._28_4_;
        fStack_744 = fVar261 + fVar261 + auVar136._28_4_;
        fVar140 = auVar313._0_4_;
        fVar141 = auVar313._4_4_;
        fVar143 = auVar313._8_4_;
        fVar144 = auVar313._12_4_;
        fVar175 = auVar313._16_4_;
        fVar176 = auVar313._20_4_;
        fVar190 = auVar313._24_4_;
        local_360._0_4_ =
             fVar231 * (float)local_320._0_4_ +
             fVar149 * (float)local_340._0_4_ + fVar216 * fVar151 + (float)local_440._0_4_ * fVar269
        ;
        local_360._4_4_ =
             fVar202 * (float)local_320._4_4_ +
             fVar292 * (float)local_340._4_4_ + fVar171 * fVar165 + (float)local_440._4_4_ * fVar220
        ;
        local_360._8_4_ =
             fVar233 * fStack_318 + fVar309 * fStack_338 + fVar266 * fVar167 + fStack_438 * fVar173;
        local_360._12_4_ =
             fVar240 * fStack_314 + fVar294 * fStack_334 + fVar267 * fVar169 + fStack_434 * fVar270;
        local_360._16_4_ =
             fVar242 * fStack_310 + fVar293 * fStack_330 + fVar218 * fVar222 + fStack_430 * fVar271;
        local_360._20_4_ =
             fVar244 * fStack_30c + fVar295 * fStack_32c + fVar172 * fVar195 + fStack_42c * fVar221;
        local_360._24_4_ =
             fVar291 * fStack_308 + fVar296 * fStack_328 + fVar268 * fVar229 + fStack_428 * fVar174;
        local_360._28_4_ = fVar194 + fStack_744;
        local_5a0._0_4_ =
             fVar140 * fVar149 + fVar215 * fVar216 + auVar254._0_4_ * fVar269 + fVar231 * fVar152;
        local_5a0._4_4_ =
             fVar141 * fVar292 + fVar217 * fVar171 + auVar254._4_4_ * fVar220 + fVar202 * fVar166;
        local_5a0._8_4_ =
             fVar143 * fVar309 + fVar219 * fVar266 + auVar254._8_4_ * fVar173 + fVar233 * fVar168;
        local_5a0._12_4_ =
             fVar144 * fVar294 + fVar118 * fVar267 + auVar254._12_4_ * fVar270 + fVar240 * fVar170;
        local_5a0._16_4_ =
             fVar175 * fVar293 + fVar119 * fVar218 + auVar254._16_4_ * fVar271 + fVar242 * fVar200;
        local_5a0._20_4_ =
             fVar176 * fVar295 + fVar137 * fVar172 + auVar254._20_4_ * fVar221 + fVar244 * fVar230;
        local_5a0._24_4_ =
             fVar190 * fVar296 + fVar138 * fVar268 + auVar254._24_4_ * fVar174 + fVar291 * fVar201;
        local_5a0._28_4_ = fVar261 + fVar261 + auVar164._28_4_ + fStack_744;
        local_760._0_4_ =
             fVar231 * (float)local_120._0_4_ +
             (float)local_c0._0_4_ * fVar149 +
             (float)local_80._0_4_ * fVar216 + (float)local_a0._0_4_ * fVar269;
        local_760._4_4_ =
             fVar202 * (float)local_120._4_4_ +
             (float)local_c0._4_4_ * fVar292 +
             (float)local_80._4_4_ * fVar171 + (float)local_a0._4_4_ * fVar220;
        uStack_758._0_4_ =
             fVar233 * fStack_118 + fStack_b8 * fVar309 + fStack_78 * fVar266 + fStack_98 * fVar173;
        uStack_758._4_4_ =
             fVar240 * fStack_114 + fStack_b4 * fVar294 + fStack_74 * fVar267 + fStack_94 * fVar270;
        fStack_750 = fVar242 * fStack_110 +
                     fStack_b0 * fVar293 + fStack_70 * fVar218 + fStack_90 * fVar271;
        fStack_74c = fVar244 * fStack_10c +
                     fStack_ac * fVar295 + fStack_6c * fVar172 + fStack_8c * fVar221;
        fStack_748 = fVar291 * fStack_108 +
                     fStack_a8 * fVar296 + fStack_68 * fVar268 + fStack_88 * fVar174;
        fStack_744 = fStack_744 + fVar261 + fVar194;
        auVar158 = *(undefined1 (*) [24])(bspline_basis1 + lVar112 * 4 + lVar109);
        uVar96 = *(undefined8 *)((undefined1 (*) [24])(bspline_basis1 + lVar112 * 4 + lVar109))[1];
        pfVar3 = (float *)(lVar109 + 0x22023cc + lVar112 * 4);
        fVar194 = *pfVar3;
        fVar120 = pfVar3[1];
        fVar139 = pfVar3[2];
        fVar142 = pfVar3[3];
        fVar145 = pfVar3[4];
        fVar146 = pfVar3[5];
        fVar147 = pfVar3[6];
        auVar163 = *(undefined1 (*) [32])(lVar109 + 0x2202850 + lVar112 * 4);
        auVar164 = ZEXT3264(auVar163);
        pfVar4 = (float *)(lVar109 + 0x2202cd4 + lVar112 * 4);
        fVar148 = *pfVar4;
        fVar203 = pfVar4[1];
        fVar213 = pfVar4[2];
        fVar214 = pfVar4[3];
        fStack_490 = pfVar4[4];
        fStack_48c = pfVar4[5];
        fStack_488 = pfVar4[6];
        fStack_484 = pfVar4[7];
        fVar202 = auVar163._0_4_;
        fVar233 = auVar163._4_4_;
        fVar240 = auVar163._8_4_;
        fVar242 = auVar163._12_4_;
        fVar291 = auVar163._16_4_;
        fVar309 = auVar163._20_4_;
        fVar295 = auVar163._24_4_;
        fVar231 = auVar254._28_4_;
        fVar244 = fVar231 + fStack_424 + fVar231;
        local_7c0._0_4_ = auVar158._0_4_;
        local_7c0._4_4_ = auVar158._4_4_;
        fStack_7b8 = auVar158._8_4_;
        fStack_7b4 = auVar158._12_4_;
        fStack_7b0 = auVar158._16_4_;
        fStack_7ac = auVar158._20_4_;
        fStack_7a8 = (float)uVar96;
        fStack_7a4 = (float)((ulong)uVar96 >> 0x20);
        local_380._0_4_ =
             (float)local_320._0_4_ * (float)local_7c0._0_4_ +
             (float)local_340._0_4_ * fVar194 + (float)local_440._0_4_ * fVar148 + fVar151 * fVar202
        ;
        local_380._4_4_ =
             (float)local_320._4_4_ * (float)local_7c0._4_4_ +
             (float)local_340._4_4_ * fVar120 + (float)local_440._4_4_ * fVar203 + fVar165 * fVar233
        ;
        local_380._8_4_ =
             fStack_318 * fStack_7b8 +
             fStack_338 * fVar139 + fStack_438 * fVar213 + fVar167 * fVar240;
        local_380._12_4_ =
             fStack_314 * fStack_7b4 +
             fStack_334 * fVar142 + fStack_434 * fVar214 + fVar169 * fVar242;
        local_380._16_4_ =
             fStack_310 * fStack_7b0 +
             fStack_330 * fVar145 + fStack_430 * fStack_490 + fVar222 * fVar291;
        local_380._20_4_ =
             fStack_30c * fStack_7ac +
             fStack_32c * fVar146 + fStack_42c * fStack_48c + fVar195 * fVar309;
        local_380._24_4_ =
             fStack_308 * fStack_7a8 +
             fStack_328 * fVar147 + fStack_428 * fStack_488 + fVar229 * fVar295;
        local_380._28_4_ = fVar231 + fStack_84 + fVar244;
        local_460._0_4_ =
             (float)local_7c0._0_4_ * fVar152 +
             fVar148 * auVar254._0_4_ + fVar215 * fVar202 + fVar140 * fVar194;
        local_460._4_4_ =
             (float)local_7c0._4_4_ * fVar166 +
             fVar203 * auVar254._4_4_ + fVar217 * fVar233 + fVar141 * fVar120;
        fStack_458 = fStack_7b8 * fVar168 +
                     fVar213 * auVar254._8_4_ + fVar219 * fVar240 + fVar143 * fVar139;
        fStack_454 = fStack_7b4 * fVar170 +
                     fVar214 * auVar254._12_4_ + fVar118 * fVar242 + fVar144 * fVar142;
        fStack_450 = fStack_7b0 * fVar200 +
                     fStack_490 * auVar254._16_4_ + fVar119 * fVar291 + fVar175 * fVar145;
        fStack_44c = fStack_7ac * fVar230 +
                     fStack_48c * auVar254._20_4_ + fVar137 * fVar309 + fVar176 * fVar146;
        fStack_448 = fStack_7a8 * fVar201 +
                     fStack_488 * auVar254._24_4_ + fVar138 * fVar295 + fVar190 * fVar147;
        fStack_444 = fVar244 + *(float *)pauVar1[1] + fVar231 + fVar231;
        local_6c0._0_4_ =
             (float)local_c0._0_4_ * fVar194 +
             (float)local_80._0_4_ * fVar202 + fVar148 * (float)local_a0._0_4_ +
             (float)local_7c0._0_4_ * (float)local_120._0_4_;
        local_6c0._4_4_ =
             (float)local_c0._4_4_ * fVar120 +
             (float)local_80._4_4_ * fVar233 + fVar203 * (float)local_a0._4_4_ +
             (float)local_7c0._4_4_ * (float)local_120._4_4_;
        local_6c0._8_4_ =
             fStack_b8 * fVar139 + fStack_78 * fVar240 + fVar213 * fStack_98 +
             fStack_7b8 * fStack_118;
        local_6c0._12_4_ =
             fStack_b4 * fVar142 + fStack_74 * fVar242 + fVar214 * fStack_94 +
             fStack_7b4 * fStack_114;
        local_6c0._16_4_ =
             fStack_b0 * fVar145 + fStack_70 * fVar291 + fStack_490 * fStack_90 +
             fStack_7b0 * fStack_110;
        local_6c0._20_4_ =
             fStack_ac * fVar146 + fStack_6c * fVar309 + fStack_48c * fStack_8c +
             fStack_7ac * fStack_10c;
        local_6c0._24_4_ =
             fStack_a8 * fVar147 + fStack_68 * fVar295 + fStack_488 * fStack_88 +
             fStack_7a8 * fStack_108;
        local_6c0._28_4_ = fVar231 + fVar231 + fStack_84 + fVar244;
        auVar13 = vsubps_avx(local_380,local_360);
        auVar17 = vsubps_avx(_local_460,local_5a0);
        fVar222 = auVar13._0_4_;
        fVar229 = auVar13._4_4_;
        auVar53._4_4_ = local_5a0._4_4_ * fVar229;
        auVar53._0_4_ = (float)local_5a0._0_4_ * fVar222;
        fVar230 = auVar13._8_4_;
        auVar53._8_4_ = local_5a0._8_4_ * fVar230;
        fVar231 = auVar13._12_4_;
        auVar53._12_4_ = local_5a0._12_4_ * fVar231;
        fVar149 = auVar13._16_4_;
        auVar53._16_4_ = local_5a0._16_4_ * fVar149;
        fVar294 = auVar13._20_4_;
        auVar53._20_4_ = local_5a0._20_4_ * fVar294;
        fVar296 = auVar13._24_4_;
        auVar53._24_4_ = local_5a0._24_4_ * fVar296;
        auVar53._28_4_ = fVar244;
        fVar195 = auVar17._0_4_;
        fVar200 = auVar17._4_4_;
        auVar54._4_4_ = local_360._4_4_ * fVar200;
        auVar54._0_4_ = local_360._0_4_ * fVar195;
        fVar201 = auVar17._8_4_;
        auVar54._8_4_ = local_360._8_4_ * fVar201;
        fVar244 = auVar17._12_4_;
        auVar54._12_4_ = local_360._12_4_ * fVar244;
        fVar292 = auVar17._16_4_;
        auVar54._16_4_ = local_360._16_4_ * fVar292;
        fVar293 = auVar17._20_4_;
        auVar54._20_4_ = local_360._20_4_ * fVar293;
        fVar261 = auVar17._24_4_;
        auVar54._24_4_ = local_360._24_4_ * fVar261;
        auVar54._28_4_ = fStack_444;
        auVar16 = vsubps_avx(auVar53,auVar54);
        auVar136 = ZEXT3264(_local_760);
        auVar274 = vmaxps_avx(_local_760,local_6c0);
        auVar55._4_4_ = auVar274._4_4_ * auVar274._4_4_ * (fVar229 * fVar229 + fVar200 * fVar200);
        auVar55._0_4_ = auVar274._0_4_ * auVar274._0_4_ * (fVar222 * fVar222 + fVar195 * fVar195);
        auVar55._8_4_ = auVar274._8_4_ * auVar274._8_4_ * (fVar230 * fVar230 + fVar201 * fVar201);
        auVar55._12_4_ = auVar274._12_4_ * auVar274._12_4_ * (fVar231 * fVar231 + fVar244 * fVar244)
        ;
        auVar55._16_4_ = auVar274._16_4_ * auVar274._16_4_ * (fVar149 * fVar149 + fVar292 * fVar292)
        ;
        auVar55._20_4_ = auVar274._20_4_ * auVar274._20_4_ * (fVar294 * fVar294 + fVar293 * fVar293)
        ;
        auVar55._24_4_ = auVar274._24_4_ * auVar274._24_4_ * (fVar296 * fVar296 + fVar261 * fVar261)
        ;
        auVar55._28_4_ = local_380._28_4_ + fStack_444;
        auVar56._4_4_ = auVar16._4_4_ * auVar16._4_4_;
        auVar56._0_4_ = auVar16._0_4_ * auVar16._0_4_;
        auVar56._8_4_ = auVar16._8_4_ * auVar16._8_4_;
        auVar56._12_4_ = auVar16._12_4_ * auVar16._12_4_;
        auVar56._16_4_ = auVar16._16_4_ * auVar16._16_4_;
        auVar56._20_4_ = auVar16._20_4_ * auVar16._20_4_;
        auVar56._24_4_ = auVar16._24_4_ * auVar16._24_4_;
        auVar56._28_4_ = auVar16._28_4_;
        auVar274 = vcmpps_avx(auVar56,auVar55,2);
        local_800._0_8_ = lVar112;
        local_260 = (uint)lVar112;
        auVar184 = vpshufd_avx(ZEXT416(local_260),0);
        auVar328 = vpor_avx(auVar184,_DAT_01f4ad30);
        auVar184 = vpor_avx(auVar184,_DAT_01f7afa0);
        auVar102._4_4_ = fStack_39c;
        auVar102._0_4_ = local_3a0;
        auVar102._8_4_ = fStack_398;
        auVar102._12_4_ = fStack_394;
        auVar328 = vpcmpgtd_avx(auVar102,auVar328);
        auVar184 = vpcmpgtd_avx(auVar102,auVar184);
        local_3c0._16_16_ = auVar184;
        local_3c0._0_16_ = auVar328;
        auVar189 = ZEXT3264(local_3c0);
        auVar16 = local_3c0 & auVar274;
        fVar151 = (float)local_7a0._0_4_;
        fVar165 = (float)local_7a0._4_4_;
        fVar167 = fStack_798;
        fVar169 = fStack_794;
        fVar222 = fStack_790;
        fVar195 = fStack_78c;
        fVar229 = fStack_788;
        fVar152 = (float)local_660._0_4_;
        fVar166 = (float)local_660._4_4_;
        fVar168 = fStack_658;
        fVar170 = fStack_654;
        fVar200 = fStack_650;
        fVar230 = fStack_64c;
        fVar201 = fStack_648;
        if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar16 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar16 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar16 >> 0x7f,0) == '\0') &&
              (auVar16 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar16 >> 0xbf,0) == '\0') &&
            (auVar16 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar16[0x1f]) {
          auVar265 = ZEXT3264(local_700);
          auVar278 = ZEXT3264(local_720);
          auVar287 = ZEXT3264(auVar287._0_32_);
          auVar254 = ZEXT3264(_local_580);
          auVar313 = ZEXT3264(auVar313._0_32_);
          uVar113 = uVar113 & 0xffffffff;
        }
        else {
          local_4a0 = (float)local_7c0._0_4_ * (float)local_140._0_4_ +
                      fVar194 * (float)local_420._0_4_ +
                      (float)local_300._0_4_ * fVar202 + (float)local_520._0_4_ * fVar148;
          fStack_49c = (float)local_7c0._4_4_ * (float)local_140._4_4_ +
                       fVar120 * (float)local_420._4_4_ +
                       (float)local_300._4_4_ * fVar233 + (float)local_520._4_4_ * fVar203;
          fStack_498 = fStack_7b8 * fStack_138 +
                       fVar139 * fStack_418 + fStack_2f8 * fVar240 + fStack_518 * fVar213;
          fStack_494 = fStack_7b4 * fStack_134 +
                       fVar142 * fStack_414 + fStack_2f4 * fVar242 + fStack_514 * fVar214;
          fStack_490 = fStack_7b0 * fStack_130 +
                       fVar145 * fStack_410 + fStack_2f0 * fVar291 + fStack_510 * fStack_490;
          fStack_48c = fStack_7ac * fStack_12c +
                       fVar146 * fStack_40c + fStack_2ec * fVar309 + fStack_50c * fStack_48c;
          fStack_488 = fStack_7a8 * fStack_128 +
                       fVar147 * fStack_408 + fStack_2e8 * fVar295 + fStack_508 * fStack_488;
          fStack_484 = fStack_7a4 + fStack_744 + auVar163._28_4_ + 0.0;
          local_5c0._0_4_ = auVar105._0_4_;
          local_5c0._4_4_ = auVar105._4_4_;
          fStack_5b8 = auVar105._8_4_;
          fStack_5b4 = auVar105._12_4_;
          fStack_5b0 = auVar105._16_4_;
          fStack_5ac = auVar105._20_4_;
          fStack_5a8 = auVar105._24_4_;
          pfVar4 = (float *)(lVar109 + 0x2201640 + lVar112 * 4);
          fVar231 = *pfVar4;
          fVar202 = pfVar4[1];
          fVar233 = pfVar4[2];
          fVar240 = pfVar4[3];
          fVar242 = pfVar4[4];
          fVar244 = pfVar4[5];
          fVar291 = pfVar4[6];
          pfVar5 = (float *)(lVar109 + 0x2201ac4 + lVar112 * 4);
          fVar149 = *pfVar5;
          fVar292 = pfVar5[1];
          fVar309 = pfVar5[2];
          fVar294 = pfVar5[3];
          fVar293 = pfVar5[4];
          fVar295 = pfVar5[5];
          fVar296 = pfVar5[6];
          fVar245 = pfVar3[7] + 0.0;
          pfVar6 = (float *)(lVar109 + 0x22011bc + lVar112 * 4);
          fVar261 = *pfVar6;
          fVar194 = pfVar6[1];
          fVar120 = pfVar6[2];
          fVar139 = pfVar6[3];
          fVar142 = pfVar6[4];
          fVar145 = pfVar6[5];
          fVar146 = pfVar6[6];
          fVar150 = pfVar4[7] + pfVar5[7];
          fStack_464 = pfVar5[7] + fVar245;
          fVar245 = pfVar3[7] + local_360._28_4_ + fVar245;
          pfVar3 = (float *)(lVar109 + 0x2200d38 + lVar112 * 4);
          fVar147 = *pfVar3;
          fVar148 = pfVar3[1];
          fVar203 = pfVar3[2];
          fVar213 = pfVar3[3];
          fVar214 = pfVar3[4];
          fVar191 = pfVar3[5];
          fVar192 = pfVar3[6];
          local_5e0 = (float)local_320._0_4_ * fVar147 +
                      (float)local_340._0_4_ * fVar261 +
                      (float)local_7a0._0_4_ * fVar231 + (float)local_440._0_4_ * fVar149;
          fStack_5dc = (float)local_320._4_4_ * fVar148 +
                       (float)local_340._4_4_ * fVar194 +
                       (float)local_7a0._4_4_ * fVar202 + (float)local_440._4_4_ * fVar292;
          fStack_5d8 = fStack_318 * fVar203 +
                       fStack_338 * fVar120 + fStack_798 * fVar233 + fStack_438 * fVar309;
          fStack_5d4 = fStack_314 * fVar213 +
                       fStack_334 * fVar139 + fStack_794 * fVar240 + fStack_434 * fVar294;
          fStack_5d0 = fStack_310 * fVar214 +
                       fStack_330 * fVar142 + fStack_790 * fVar242 + fStack_430 * fVar293;
          fStack_5cc = fStack_30c * fVar191 +
                       fStack_32c * fVar145 + fStack_78c * fVar244 + fStack_42c * fVar295;
          fStack_5c8 = fStack_308 * fVar192 +
                       fStack_328 * fVar146 + fStack_788 * fVar291 + fStack_428 * fVar296;
          fStack_5c4 = fVar150 + fStack_464;
          local_480 = fVar147 * (float)local_660._0_4_ +
                      fVar215 * fVar231 + fVar149 * (float)local_580._0_4_ + fVar140 * fVar261;
          fStack_47c = fVar148 * (float)local_660._4_4_ +
                       fVar217 * fVar202 + fVar292 * (float)local_580._4_4_ + fVar141 * fVar194;
          fStack_478 = fVar203 * fStack_658 +
                       fVar219 * fVar233 + fVar309 * fStack_578 + fVar143 * fVar120;
          fStack_474 = fVar213 * fStack_654 +
                       fVar118 * fVar240 + fVar294 * fStack_574 + fVar144 * fVar139;
          fStack_470 = fVar214 * fStack_650 +
                       fVar119 * fVar242 + fVar293 * fStack_570 + fVar175 * fVar142;
          fStack_46c = fVar191 * fStack_64c +
                       fVar137 * fVar244 + fVar295 * fStack_56c + fVar176 * fVar145;
          fStack_468 = fVar192 * fStack_648 +
                       fVar138 * fVar291 + fVar296 * fStack_568 + fVar190 * fVar146;
          fStack_464 = fStack_464 + fVar245;
          auVar304._0_4_ =
               fVar261 * (float)local_420._0_4_ +
               (float)local_300._0_4_ * fVar231 + (float)local_520._0_4_ * fVar149 +
               fVar147 * (float)local_140._0_4_;
          auVar304._4_4_ =
               fVar194 * (float)local_420._4_4_ +
               (float)local_300._4_4_ * fVar202 + (float)local_520._4_4_ * fVar292 +
               fVar148 * (float)local_140._4_4_;
          auVar304._8_4_ =
               fVar120 * fStack_418 + fStack_2f8 * fVar233 + fStack_518 * fVar309 +
               fVar203 * fStack_138;
          auVar304._12_4_ =
               fVar139 * fStack_414 + fStack_2f4 * fVar240 + fStack_514 * fVar294 +
               fVar213 * fStack_134;
          auVar304._16_4_ =
               fVar142 * fStack_410 + fStack_2f0 * fVar242 + fStack_510 * fVar293 +
               fVar214 * fStack_130;
          auVar304._20_4_ =
               fVar145 * fStack_40c + fStack_2ec * fVar244 + fStack_50c * fVar295 +
               fVar191 * fStack_12c;
          auVar304._24_4_ =
               fVar146 * fStack_408 + fStack_2e8 * fVar291 + fStack_508 * fVar296 +
               fVar192 * fStack_128;
          auVar304._28_4_ = pfVar6[7] + fVar150 + fVar245;
          pfVar3 = (float *)(lVar109 + 0x2203a60 + lVar112 * 4);
          fVar202 = *pfVar3;
          fVar233 = pfVar3[1];
          fVar240 = pfVar3[2];
          fVar242 = pfVar3[3];
          fVar244 = pfVar3[4];
          fVar291 = pfVar3[5];
          fVar149 = pfVar3[6];
          pfVar4 = (float *)(lVar109 + 0x2203ee4 + lVar112 * 4);
          fVar292 = *pfVar4;
          fVar309 = pfVar4[1];
          fVar294 = pfVar4[2];
          fVar293 = pfVar4[3];
          fVar295 = pfVar4[4];
          fVar296 = pfVar4[5];
          fVar261 = pfVar4[6];
          fVar231 = auVar313._28_4_;
          pfVar5 = (float *)(lVar109 + 0x22035dc + lVar112 * 4);
          fVar194 = *pfVar5;
          fVar120 = pfVar5[1];
          fVar139 = pfVar5[2];
          fVar142 = pfVar5[3];
          fVar145 = pfVar5[4];
          fVar146 = pfVar5[5];
          fVar147 = pfVar5[6];
          pfVar6 = (float *)(lVar109 + 0x2203158 + lVar112 * 4);
          fVar148 = *pfVar6;
          fVar203 = pfVar6[1];
          fVar213 = pfVar6[2];
          fVar214 = pfVar6[3];
          fVar140 = pfVar6[4];
          fVar141 = pfVar6[5];
          fVar143 = pfVar6[6];
          auVar276._0_4_ =
               (float)local_320._0_4_ * fVar148 +
               (float)local_340._0_4_ * fVar194 +
               (float)local_7a0._0_4_ * fVar202 + (float)local_440._0_4_ * fVar292;
          auVar276._4_4_ =
               (float)local_320._4_4_ * fVar203 +
               (float)local_340._4_4_ * fVar120 +
               (float)local_7a0._4_4_ * fVar233 + (float)local_440._4_4_ * fVar309;
          auVar276._8_4_ =
               fStack_318 * fVar213 +
               fStack_338 * fVar139 + fStack_798 * fVar240 + fStack_438 * fVar294;
          auVar276._12_4_ =
               fStack_314 * fVar214 +
               fStack_334 * fVar142 + fStack_794 * fVar242 + fStack_434 * fVar293;
          auVar276._16_4_ =
               fStack_310 * fVar140 +
               fStack_330 * fVar145 + fStack_790 * fVar244 + fStack_430 * fVar295;
          auVar276._20_4_ =
               fStack_30c * fVar141 +
               fStack_32c * fVar146 + fStack_78c * fVar291 + fStack_42c * fVar296;
          auVar276._24_4_ =
               fStack_308 * fVar143 +
               fStack_328 * fVar147 + fStack_788 * fVar149 + fStack_428 * fVar261;
          auVar276._28_4_ = fVar231 + fVar231 + fStack_784 + fVar231;
          auVar300._0_4_ =
               fVar148 * (float)local_660._0_4_ +
               fVar194 * (float)local_600._0_4_ +
               fVar215 * fVar202 + fVar292 * (float)local_580._0_4_;
          auVar300._4_4_ =
               fVar203 * (float)local_660._4_4_ +
               fVar120 * (float)local_600._4_4_ +
               fVar217 * fVar233 + fVar309 * (float)local_580._4_4_;
          auVar300._8_4_ =
               fVar213 * fStack_658 +
               fVar139 * fStack_5f8 + fVar219 * fVar240 + fVar294 * fStack_578;
          auVar300._12_4_ =
               fVar214 * fStack_654 +
               fVar142 * fStack_5f4 + fVar118 * fVar242 + fVar293 * fStack_574;
          auVar300._16_4_ =
               fVar140 * fStack_650 +
               fVar145 * fStack_5f0 + fVar119 * fVar244 + fVar295 * fStack_570;
          auVar300._20_4_ =
               fVar141 * fStack_64c +
               fVar146 * fStack_5ec + fVar137 * fVar291 + fVar296 * fStack_56c;
          auVar300._24_4_ =
               fVar143 * fStack_648 +
               fVar147 * fStack_5e8 + fVar138 * fVar149 + fVar261 * fStack_568;
          auVar300._28_4_ = fVar231 + fVar231 + fStack_424 + fVar231;
          auVar228._8_4_ = 0x7fffffff;
          auVar228._0_8_ = 0x7fffffff7fffffff;
          auVar228._12_4_ = 0x7fffffff;
          auVar228._16_4_ = 0x7fffffff;
          auVar228._20_4_ = 0x7fffffff;
          auVar228._24_4_ = 0x7fffffff;
          auVar228._28_4_ = 0x7fffffff;
          auVar99._4_4_ = fStack_5dc;
          auVar99._0_4_ = local_5e0;
          auVar99._8_4_ = fStack_5d8;
          auVar99._12_4_ = fStack_5d4;
          auVar99._16_4_ = fStack_5d0;
          auVar99._20_4_ = fStack_5cc;
          auVar99._24_4_ = fStack_5c8;
          auVar99._28_4_ = fStack_5c4;
          auVar16 = vandps_avx(auVar99,auVar228);
          auVar101._4_4_ = fStack_47c;
          auVar101._0_4_ = local_480;
          auVar101._8_4_ = fStack_478;
          auVar101._12_4_ = fStack_474;
          auVar101._16_4_ = fStack_470;
          auVar101._20_4_ = fStack_46c;
          auVar101._24_4_ = fStack_468;
          auVar101._28_4_ = fStack_464;
          auVar22 = vandps_avx(auVar101,auVar228);
          auVar22 = vmaxps_avx(auVar16,auVar22);
          auVar16 = vandps_avx(auVar304,auVar228);
          auVar22 = vmaxps_avx(auVar22,auVar16);
          auVar22 = vcmpps_avx(auVar22,local_4c0,1);
          auVar11 = vblendvps_avx(auVar99,auVar13,auVar22);
          auVar133._0_4_ =
               fVar148 * (float)local_140._0_4_ +
               fVar194 * (float)local_420._0_4_ +
               fVar292 * (float)local_520._0_4_ + (float)local_300._0_4_ * fVar202;
          auVar133._4_4_ =
               fVar203 * (float)local_140._4_4_ +
               fVar120 * (float)local_420._4_4_ +
               fVar309 * (float)local_520._4_4_ + (float)local_300._4_4_ * fVar233;
          auVar133._8_4_ =
               fVar213 * fStack_138 +
               fVar139 * fStack_418 + fVar294 * fStack_518 + fStack_2f8 * fVar240;
          auVar133._12_4_ =
               fVar214 * fStack_134 +
               fVar142 * fStack_414 + fVar293 * fStack_514 + fStack_2f4 * fVar242;
          auVar133._16_4_ =
               fVar140 * fStack_130 +
               fVar145 * fStack_410 + fVar295 * fStack_510 + fStack_2f0 * fVar244;
          auVar133._20_4_ =
               fVar141 * fStack_12c +
               fVar146 * fStack_40c + fVar296 * fStack_50c + fStack_2ec * fVar291;
          auVar133._24_4_ =
               fVar143 * fStack_128 +
               fVar147 * fStack_408 + fVar261 * fStack_508 + fStack_2e8 * fVar149;
          auVar133._28_4_ = auVar16._28_4_ + pfVar5[7] + pfVar4[7] + pfVar3[7];
          auVar186 = vblendvps_avx(auVar101,auVar17,auVar22);
          auVar16 = vandps_avx(auVar276,auVar228);
          auVar22 = vandps_avx(auVar300,auVar228);
          auVar22 = vmaxps_avx(auVar16,auVar22);
          auVar16 = vandps_avx(auVar133,auVar228);
          auVar16 = vmaxps_avx(auVar22,auVar16);
          local_500._0_4_ = auVar106._0_4_;
          local_500._4_4_ = auVar106._4_4_;
          fStack_4f8 = auVar106._8_4_;
          fStack_4f4 = auVar106._12_4_;
          fStack_4f0 = auVar106._16_4_;
          fStack_4ec = auVar106._20_4_;
          fStack_4e8 = auVar106._24_4_;
          auVar16 = vcmpps_avx(auVar16,local_4c0,1);
          auVar13 = vblendvps_avx(auVar276,auVar13,auVar16);
          auVar134._0_4_ =
               (float)local_140._0_4_ * (float)local_500._0_4_ +
               (float)local_420._0_4_ * (float)local_5c0._0_4_ +
               (float)local_300._0_4_ * fVar216 + (float)local_520._0_4_ * fVar269;
          auVar134._4_4_ =
               (float)local_140._4_4_ * (float)local_500._4_4_ +
               (float)local_420._4_4_ * (float)local_5c0._4_4_ +
               (float)local_300._4_4_ * fVar171 + (float)local_520._4_4_ * fVar220;
          auVar134._8_4_ =
               fStack_138 * fStack_4f8 +
               fStack_418 * fStack_5b8 + fStack_2f8 * fVar266 + fStack_518 * fVar173;
          auVar134._12_4_ =
               fStack_134 * fStack_4f4 +
               fStack_414 * fStack_5b4 + fStack_2f4 * fVar267 + fStack_514 * fVar270;
          auVar134._16_4_ =
               fStack_130 * fStack_4f0 +
               fStack_410 * fStack_5b0 + fStack_2f0 * fVar218 + fStack_510 * fVar271;
          auVar134._20_4_ =
               fStack_12c * fStack_4ec +
               fStack_40c * fStack_5ac + fStack_2ec * fVar172 + fStack_50c * fVar221;
          auVar134._24_4_ =
               fStack_128 * fStack_4e8 +
               fStack_408 * fStack_5a8 + fStack_2e8 * fVar268 + fStack_508 * fVar174;
          auVar134._28_4_ = auVar22._28_4_ + fStack_484 + auVar163._28_4_ + 0.0;
          auVar163 = vblendvps_avx(auVar300,auVar17,auVar16);
          fVar147 = auVar11._0_4_;
          fVar148 = auVar11._4_4_;
          fVar203 = auVar11._8_4_;
          fVar213 = auVar11._12_4_;
          fVar214 = auVar11._16_4_;
          fVar215 = auVar11._20_4_;
          fVar217 = auVar11._24_4_;
          fVar219 = auVar11._28_4_;
          fVar261 = auVar13._0_4_;
          fVar171 = auVar13._4_4_;
          fVar267 = auVar13._8_4_;
          fVar172 = auVar13._12_4_;
          fVar269 = auVar13._16_4_;
          fVar173 = auVar13._20_4_;
          fVar271 = auVar13._24_4_;
          fVar231 = auVar186._0_4_;
          fVar233 = auVar186._4_4_;
          fVar242 = auVar186._8_4_;
          fVar291 = auVar186._12_4_;
          fVar292 = auVar186._16_4_;
          fVar294 = auVar186._20_4_;
          fVar295 = auVar186._24_4_;
          auVar285._0_4_ = fVar231 * fVar231 + fVar147 * fVar147;
          auVar285._4_4_ = fVar233 * fVar233 + fVar148 * fVar148;
          auVar285._8_4_ = fVar242 * fVar242 + fVar203 * fVar203;
          auVar285._12_4_ = fVar291 * fVar291 + fVar213 * fVar213;
          auVar285._16_4_ = fVar292 * fVar292 + fVar214 * fVar214;
          auVar285._20_4_ = fVar294 * fVar294 + fVar215 * fVar215;
          auVar285._24_4_ = fVar295 * fVar295 + fVar217 * fVar217;
          auVar285._28_4_ = fStack_324 + auVar17._28_4_;
          auVar17 = vrsqrtps_avx(auVar285);
          fVar202 = auVar17._0_4_;
          fVar240 = auVar17._4_4_;
          auVar57._4_4_ = fVar240 * 1.5;
          auVar57._0_4_ = fVar202 * 1.5;
          fVar244 = auVar17._8_4_;
          auVar57._8_4_ = fVar244 * 1.5;
          fVar149 = auVar17._12_4_;
          auVar57._12_4_ = fVar149 * 1.5;
          fVar309 = auVar17._16_4_;
          auVar57._16_4_ = fVar309 * 1.5;
          fVar293 = auVar17._20_4_;
          auVar57._20_4_ = fVar293 * 1.5;
          fVar296 = auVar17._24_4_;
          auVar57._24_4_ = fVar296 * 1.5;
          auVar57._28_4_ = auVar300._28_4_;
          auVar58._4_4_ = fVar240 * fVar240 * fVar240 * auVar285._4_4_ * 0.5;
          auVar58._0_4_ = fVar202 * fVar202 * fVar202 * auVar285._0_4_ * 0.5;
          auVar58._8_4_ = fVar244 * fVar244 * fVar244 * auVar285._8_4_ * 0.5;
          auVar58._12_4_ = fVar149 * fVar149 * fVar149 * auVar285._12_4_ * 0.5;
          auVar58._16_4_ = fVar309 * fVar309 * fVar309 * auVar285._16_4_ * 0.5;
          auVar58._20_4_ = fVar293 * fVar293 * fVar293 * auVar285._20_4_ * 0.5;
          auVar58._24_4_ = fVar296 * fVar296 * fVar296 * auVar285._24_4_ * 0.5;
          auVar58._28_4_ = auVar285._28_4_;
          auVar16 = vsubps_avx(auVar57,auVar58);
          fVar174 = auVar16._0_4_;
          fVar194 = auVar16._4_4_;
          fVar120 = auVar16._8_4_;
          fVar139 = auVar16._12_4_;
          fVar142 = auVar16._16_4_;
          fVar145 = auVar16._20_4_;
          fVar146 = auVar16._24_4_;
          fVar202 = auVar163._0_4_;
          fVar240 = auVar163._4_4_;
          fVar244 = auVar163._8_4_;
          fVar149 = auVar163._12_4_;
          fVar309 = auVar163._16_4_;
          fVar293 = auVar163._20_4_;
          fVar296 = auVar163._24_4_;
          auVar264._0_4_ = fVar202 * fVar202 + fVar261 * fVar261;
          auVar264._4_4_ = fVar240 * fVar240 + fVar171 * fVar171;
          auVar264._8_4_ = fVar244 * fVar244 + fVar267 * fVar267;
          auVar264._12_4_ = fVar149 * fVar149 + fVar172 * fVar172;
          auVar264._16_4_ = fVar309 * fVar309 + fVar269 * fVar269;
          auVar264._20_4_ = fVar293 * fVar293 + fVar173 * fVar173;
          auVar264._24_4_ = fVar296 * fVar296 + fVar271 * fVar271;
          auVar264._28_4_ = auVar17._28_4_ + auVar13._28_4_;
          auVar163 = vrsqrtps_avx(auVar264);
          fVar216 = auVar163._0_4_;
          fVar266 = auVar163._4_4_;
          auVar59._4_4_ = fVar266 * 1.5;
          auVar59._0_4_ = fVar216 * 1.5;
          fVar218 = auVar163._8_4_;
          auVar59._8_4_ = fVar218 * 1.5;
          fVar268 = auVar163._12_4_;
          auVar59._12_4_ = fVar268 * 1.5;
          fVar220 = auVar163._16_4_;
          auVar59._16_4_ = fVar220 * 1.5;
          fVar270 = auVar163._20_4_;
          auVar59._20_4_ = fVar270 * 1.5;
          fVar221 = auVar163._24_4_;
          auVar59._24_4_ = fVar221 * 1.5;
          auVar59._28_4_ = auVar300._28_4_;
          auVar60._4_4_ = fVar266 * fVar266 * fVar266 * auVar264._4_4_ * 0.5;
          auVar60._0_4_ = fVar216 * fVar216 * fVar216 * auVar264._0_4_ * 0.5;
          auVar60._8_4_ = fVar218 * fVar218 * fVar218 * auVar264._8_4_ * 0.5;
          auVar60._12_4_ = fVar268 * fVar268 * fVar268 * auVar264._12_4_ * 0.5;
          auVar60._16_4_ = fVar220 * fVar220 * fVar220 * auVar264._16_4_ * 0.5;
          auVar60._20_4_ = fVar270 * fVar270 * fVar270 * auVar264._20_4_ * 0.5;
          auVar60._24_4_ = fVar221 * fVar221 * fVar221 * auVar264._24_4_ * 0.5;
          auVar60._28_4_ = auVar264._28_4_;
          auVar13 = vsubps_avx(auVar59,auVar60);
          fVar216 = auVar13._0_4_;
          fVar266 = auVar13._4_4_;
          fVar218 = auVar13._8_4_;
          fVar268 = auVar13._12_4_;
          fVar220 = auVar13._16_4_;
          fVar270 = auVar13._20_4_;
          fVar221 = auVar13._24_4_;
          fVar231 = (float)local_760._0_4_ * fVar174 * fVar231;
          fVar233 = (float)local_760._4_4_ * fVar194 * fVar233;
          auVar61._4_4_ = fVar233;
          auVar61._0_4_ = fVar231;
          fVar242 = (float)uStack_758 * fVar120 * fVar242;
          auVar61._8_4_ = fVar242;
          fVar291 = uStack_758._4_4_ * fVar139 * fVar291;
          auVar61._12_4_ = fVar291;
          fVar292 = fStack_750 * fVar142 * fVar292;
          auVar61._16_4_ = fVar292;
          fVar294 = fStack_74c * fVar145 * fVar294;
          auVar61._20_4_ = fVar294;
          fVar295 = fStack_748 * fVar146 * fVar295;
          auVar61._24_4_ = fVar295;
          auVar61._28_4_ = auVar163._28_4_;
          local_500._4_4_ = fVar233 + local_360._4_4_;
          local_500._0_4_ = fVar231 + local_360._0_4_;
          fStack_4f8 = fVar242 + local_360._8_4_;
          fStack_4f4 = fVar291 + local_360._12_4_;
          fStack_4f0 = fVar292 + local_360._16_4_;
          fStack_4ec = fVar294 + local_360._20_4_;
          fStack_4e8 = fVar295 + local_360._24_4_;
          fStack_4e4 = auVar163._28_4_ + local_360._28_4_;
          fVar231 = (float)local_760._0_4_ * fVar174 * -fVar147;
          fVar233 = (float)local_760._4_4_ * fVar194 * -fVar148;
          auVar163._4_4_ = fVar233;
          auVar163._0_4_ = fVar231;
          fVar242 = (float)uStack_758 * fVar120 * -fVar203;
          auVar163._8_4_ = fVar242;
          fVar291 = uStack_758._4_4_ * fVar139 * -fVar213;
          auVar163._12_4_ = fVar291;
          fVar292 = fStack_750 * fVar142 * -fVar214;
          auVar163._16_4_ = fVar292;
          fVar294 = fStack_74c * fVar145 * -fVar215;
          auVar163._20_4_ = fVar294;
          fVar295 = fStack_748 * fVar146 * -fVar217;
          auVar163._24_4_ = fVar295;
          auVar163._28_4_ = -fVar219;
          local_5c0._4_4_ = local_5a0._4_4_ + fVar233;
          local_5c0._0_4_ = (float)local_5a0._0_4_ + fVar231;
          fStack_5b8 = local_5a0._8_4_ + fVar242;
          fStack_5b4 = local_5a0._12_4_ + fVar291;
          fStack_5b0 = local_5a0._16_4_ + fVar292;
          fStack_5ac = local_5a0._20_4_ + fVar294;
          fStack_5a8 = local_5a0._24_4_ + fVar295;
          fStack_5a4 = local_5a0._28_4_ + -fVar219;
          fVar231 = fVar174 * 0.0 * (float)local_760._0_4_;
          fVar233 = fVar194 * 0.0 * (float)local_760._4_4_;
          auVar62._4_4_ = fVar233;
          auVar62._0_4_ = fVar231;
          fVar242 = fVar120 * 0.0 * (float)uStack_758;
          auVar62._8_4_ = fVar242;
          fVar291 = fVar139 * 0.0 * uStack_758._4_4_;
          auVar62._12_4_ = fVar291;
          fVar292 = fVar142 * 0.0 * fStack_750;
          auVar62._16_4_ = fVar292;
          fVar294 = fVar145 * 0.0 * fStack_74c;
          auVar62._20_4_ = fVar294;
          fVar295 = fVar146 * 0.0 * fStack_748;
          auVar62._24_4_ = fVar295;
          auVar62._28_4_ = fVar219;
          auVar186 = vsubps_avx(local_360,auVar61);
          auVar323._0_4_ = fVar231 + auVar134._0_4_;
          auVar323._4_4_ = fVar233 + auVar134._4_4_;
          auVar323._8_4_ = fVar242 + auVar134._8_4_;
          auVar323._12_4_ = fVar291 + auVar134._12_4_;
          auVar323._16_4_ = fVar292 + auVar134._16_4_;
          auVar323._20_4_ = fVar294 + auVar134._20_4_;
          auVar323._24_4_ = fVar295 + auVar134._24_4_;
          auVar323._28_4_ = fVar219 + auVar134._28_4_;
          fVar231 = (float)local_6c0._0_4_ * fVar216 * fVar202;
          fVar202 = local_6c0._4_4_ * fVar266 * fVar240;
          auVar63._4_4_ = fVar202;
          auVar63._0_4_ = fVar231;
          fVar233 = local_6c0._8_4_ * fVar218 * fVar244;
          auVar63._8_4_ = fVar233;
          fVar240 = local_6c0._12_4_ * fVar268 * fVar149;
          auVar63._12_4_ = fVar240;
          fVar242 = local_6c0._16_4_ * fVar220 * fVar309;
          auVar63._16_4_ = fVar242;
          fVar244 = local_6c0._20_4_ * fVar270 * fVar293;
          auVar63._20_4_ = fVar244;
          fVar291 = local_6c0._24_4_ * fVar221 * fVar296;
          auVar63._24_4_ = fVar291;
          auVar63._28_4_ = fStack_744;
          auVar18 = vsubps_avx(local_5a0,auVar163);
          auVar305._0_4_ = local_380._0_4_ + fVar231;
          auVar305._4_4_ = local_380._4_4_ + fVar202;
          auVar305._8_4_ = local_380._8_4_ + fVar233;
          auVar305._12_4_ = local_380._12_4_ + fVar240;
          auVar305._16_4_ = local_380._16_4_ + fVar242;
          auVar305._20_4_ = local_380._20_4_ + fVar244;
          auVar305._24_4_ = local_380._24_4_ + fVar291;
          auVar305._28_4_ = local_380._28_4_ + fStack_744;
          fVar231 = fVar216 * -fVar261 * (float)local_6c0._0_4_;
          fVar202 = fVar266 * -fVar171 * local_6c0._4_4_;
          auVar64._4_4_ = fVar202;
          auVar64._0_4_ = fVar231;
          fVar233 = fVar218 * -fVar267 * local_6c0._8_4_;
          auVar64._8_4_ = fVar233;
          fVar240 = fVar268 * -fVar172 * local_6c0._12_4_;
          auVar64._12_4_ = fVar240;
          fVar242 = fVar220 * -fVar269 * local_6c0._16_4_;
          auVar64._16_4_ = fVar242;
          fVar244 = fVar270 * -fVar173 * local_6c0._20_4_;
          auVar64._20_4_ = fVar244;
          fVar291 = fVar221 * -fVar271 * local_6c0._24_4_;
          auVar64._24_4_ = fVar291;
          auVar64._28_4_ = local_360._28_4_;
          auVar19 = vsubps_avx(auVar134,auVar62);
          auVar211._0_4_ = (float)local_460._0_4_ + fVar231;
          auVar211._4_4_ = (float)local_460._4_4_ + fVar202;
          auVar211._8_4_ = fStack_458 + fVar233;
          auVar211._12_4_ = fStack_454 + fVar240;
          auVar211._16_4_ = fStack_450 + fVar242;
          auVar211._20_4_ = fStack_44c + fVar244;
          auVar211._24_4_ = fStack_448 + fVar291;
          auVar211._28_4_ = fStack_444 + local_360._28_4_;
          fVar231 = fVar216 * 0.0 * (float)local_6c0._0_4_;
          fVar202 = fVar266 * 0.0 * local_6c0._4_4_;
          auVar65._4_4_ = fVar202;
          auVar65._0_4_ = fVar231;
          fVar233 = fVar218 * 0.0 * local_6c0._8_4_;
          auVar65._8_4_ = fVar233;
          fVar240 = fVar268 * 0.0 * local_6c0._12_4_;
          auVar65._12_4_ = fVar240;
          fVar242 = fVar220 * 0.0 * local_6c0._16_4_;
          auVar65._16_4_ = fVar242;
          fVar244 = fVar270 * 0.0 * local_6c0._20_4_;
          auVar65._20_4_ = fVar244;
          fVar291 = fVar221 * 0.0 * local_6c0._24_4_;
          auVar65._24_4_ = fVar291;
          auVar65._28_4_ = auVar134._28_4_;
          auVar163 = vsubps_avx(local_380,auVar63);
          auVar100._4_4_ = fStack_49c;
          auVar100._0_4_ = local_4a0;
          auVar100._8_4_ = fStack_498;
          auVar100._12_4_ = fStack_494;
          auVar100._16_4_ = fStack_490;
          auVar100._20_4_ = fStack_48c;
          auVar100._24_4_ = fStack_488;
          auVar100._28_4_ = fStack_484;
          auVar277._0_4_ = local_4a0 + fVar231;
          auVar277._4_4_ = fStack_49c + fVar202;
          auVar277._8_4_ = fStack_498 + fVar233;
          auVar277._12_4_ = fStack_494 + fVar240;
          auVar277._16_4_ = fStack_490 + fVar242;
          auVar277._20_4_ = fStack_48c + fVar244;
          auVar277._24_4_ = fStack_488 + fVar291;
          auVar277._28_4_ = fStack_484 + auVar134._28_4_;
          auVar17 = vsubps_avx(_local_460,auVar64);
          auVar16 = vsubps_avx(auVar100,auVar65);
          auVar22 = vsubps_avx(auVar211,auVar18);
          auVar11 = vsubps_avx(auVar277,auVar19);
          auVar66._4_4_ = auVar19._4_4_ * auVar22._4_4_;
          auVar66._0_4_ = auVar19._0_4_ * auVar22._0_4_;
          auVar66._8_4_ = auVar19._8_4_ * auVar22._8_4_;
          auVar66._12_4_ = auVar19._12_4_ * auVar22._12_4_;
          auVar66._16_4_ = auVar19._16_4_ * auVar22._16_4_;
          auVar66._20_4_ = auVar19._20_4_ * auVar22._20_4_;
          auVar66._24_4_ = auVar19._24_4_ * auVar22._24_4_;
          auVar66._28_4_ = auVar300._28_4_;
          auVar67._4_4_ = auVar18._4_4_ * auVar11._4_4_;
          auVar67._0_4_ = auVar18._0_4_ * auVar11._0_4_;
          auVar67._8_4_ = auVar18._8_4_ * auVar11._8_4_;
          auVar67._12_4_ = auVar18._12_4_ * auVar11._12_4_;
          auVar67._16_4_ = auVar18._16_4_ * auVar11._16_4_;
          auVar67._20_4_ = auVar18._20_4_ * auVar11._20_4_;
          auVar67._24_4_ = auVar18._24_4_ * auVar11._24_4_;
          auVar67._28_4_ = fStack_484;
          auVar226 = vsubps_avx(auVar67,auVar66);
          auVar68._4_4_ = auVar186._4_4_ * auVar11._4_4_;
          auVar68._0_4_ = auVar186._0_4_ * auVar11._0_4_;
          auVar68._8_4_ = auVar186._8_4_ * auVar11._8_4_;
          auVar68._12_4_ = auVar186._12_4_ * auVar11._12_4_;
          auVar68._16_4_ = auVar186._16_4_ * auVar11._16_4_;
          auVar68._20_4_ = auVar186._20_4_ * auVar11._20_4_;
          auVar68._24_4_ = auVar186._24_4_ * auVar11._24_4_;
          auVar68._28_4_ = auVar11._28_4_;
          auVar11 = vsubps_avx(auVar305,auVar186);
          auVar69._4_4_ = auVar19._4_4_ * auVar11._4_4_;
          auVar69._0_4_ = auVar19._0_4_ * auVar11._0_4_;
          auVar69._8_4_ = auVar19._8_4_ * auVar11._8_4_;
          auVar69._12_4_ = auVar19._12_4_ * auVar11._12_4_;
          auVar69._16_4_ = auVar19._16_4_ * auVar11._16_4_;
          auVar69._20_4_ = auVar19._20_4_ * auVar11._20_4_;
          auVar69._24_4_ = auVar19._24_4_ * auVar11._24_4_;
          auVar69._28_4_ = auVar13._28_4_;
          auVar283 = vsubps_avx(auVar69,auVar68);
          auVar70._4_4_ = auVar18._4_4_ * auVar11._4_4_;
          auVar70._0_4_ = auVar18._0_4_ * auVar11._0_4_;
          auVar70._8_4_ = auVar18._8_4_ * auVar11._8_4_;
          auVar70._12_4_ = auVar18._12_4_ * auVar11._12_4_;
          auVar70._16_4_ = auVar18._16_4_ * auVar11._16_4_;
          auVar70._20_4_ = auVar18._20_4_ * auVar11._20_4_;
          auVar70._24_4_ = auVar18._24_4_ * auVar11._24_4_;
          auVar70._28_4_ = auVar13._28_4_;
          auVar71._4_4_ = auVar186._4_4_ * auVar22._4_4_;
          auVar71._0_4_ = auVar186._0_4_ * auVar22._0_4_;
          auVar71._8_4_ = auVar186._8_4_ * auVar22._8_4_;
          auVar71._12_4_ = auVar186._12_4_ * auVar22._12_4_;
          auVar71._16_4_ = auVar186._16_4_ * auVar22._16_4_;
          auVar71._20_4_ = auVar186._20_4_ * auVar22._20_4_;
          auVar71._24_4_ = auVar186._24_4_ * auVar22._24_4_;
          auVar71._28_4_ = auVar22._28_4_;
          auVar13 = vsubps_avx(auVar71,auVar70);
          auVar161._0_4_ = auVar226._0_4_ * 0.0 + auVar13._0_4_ + auVar283._0_4_ * 0.0;
          auVar161._4_4_ = auVar226._4_4_ * 0.0 + auVar13._4_4_ + auVar283._4_4_ * 0.0;
          auVar161._8_4_ = auVar226._8_4_ * 0.0 + auVar13._8_4_ + auVar283._8_4_ * 0.0;
          auVar161._12_4_ = auVar226._12_4_ * 0.0 + auVar13._12_4_ + auVar283._12_4_ * 0.0;
          auVar161._16_4_ = auVar226._16_4_ * 0.0 + auVar13._16_4_ + auVar283._16_4_ * 0.0;
          auVar161._20_4_ = auVar226._20_4_ * 0.0 + auVar13._20_4_ + auVar283._20_4_ * 0.0;
          auVar161._24_4_ = auVar226._24_4_ * 0.0 + auVar13._24_4_ + auVar283._24_4_ * 0.0;
          auVar161._28_4_ = auVar226._28_4_ + auVar13._28_4_ + auVar283._28_4_;
          auVar12 = vcmpps_avx(auVar161,ZEXT832(0) << 0x20,2);
          auVar189 = ZEXT3264(auVar12);
          auVar163 = vblendvps_avx(auVar163,_local_500,auVar12);
          auVar13 = vblendvps_avx(auVar17,_local_5c0,auVar12);
          auVar17 = vblendvps_avx(auVar16,auVar323,auVar12);
          auVar16 = vblendvps_avx(auVar186,auVar305,auVar12);
          auVar22 = vblendvps_avx(auVar18,auVar211,auVar12);
          auVar11 = vblendvps_avx(auVar19,auVar277,auVar12);
          auVar186 = vblendvps_avx(auVar305,auVar186,auVar12);
          auVar226 = vblendvps_avx(auVar211,auVar18,auVar12);
          auVar283 = vblendvps_avx(auVar277,auVar19,auVar12);
          _local_7c0 = vandps_avx(local_3c0,auVar274);
          auVar186 = vsubps_avx(auVar186,auVar163);
          auVar20 = vsubps_avx(auVar226,auVar13);
          auVar283 = vsubps_avx(auVar283,auVar17);
          auVar274 = vsubps_avx(auVar13,auVar22);
          fVar231 = auVar20._0_4_;
          fVar143 = auVar17._0_4_;
          fVar149 = auVar20._4_4_;
          fVar144 = auVar17._4_4_;
          auVar72._4_4_ = fVar144 * fVar149;
          auVar72._0_4_ = fVar143 * fVar231;
          fVar261 = auVar20._8_4_;
          fVar175 = auVar17._8_4_;
          auVar72._8_4_ = fVar175 * fVar261;
          fVar268 = auVar20._12_4_;
          fVar176 = auVar17._12_4_;
          auVar72._12_4_ = fVar176 * fVar268;
          fVar174 = auVar20._16_4_;
          fVar190 = auVar17._16_4_;
          auVar72._16_4_ = fVar190 * fVar174;
          fVar147 = auVar20._20_4_;
          fVar191 = auVar17._20_4_;
          auVar72._20_4_ = fVar191 * fVar147;
          fVar219 = auVar20._24_4_;
          fVar192 = auVar17._24_4_;
          auVar72._24_4_ = fVar192 * fVar219;
          auVar72._28_4_ = auVar226._28_4_;
          fVar202 = auVar13._0_4_;
          fVar150 = auVar283._0_4_;
          fVar292 = auVar13._4_4_;
          fVar245 = auVar283._4_4_;
          auVar74._4_4_ = fVar245 * fVar292;
          auVar74._0_4_ = fVar150 * fVar202;
          fVar216 = auVar13._8_4_;
          fVar193 = auVar283._8_4_;
          auVar74._8_4_ = fVar193 * fVar216;
          fVar269 = auVar13._12_4_;
          fVar232 = auVar283._12_4_;
          auVar74._12_4_ = fVar232 * fVar269;
          fVar194 = auVar13._16_4_;
          fVar234 = auVar283._16_4_;
          auVar74._16_4_ = fVar234 * fVar194;
          fVar148 = auVar13._20_4_;
          fVar241 = auVar283._20_4_;
          auVar74._20_4_ = fVar241 * fVar148;
          fVar118 = auVar13._24_4_;
          fVar243 = auVar283._24_4_;
          uVar73 = auVar18._28_4_;
          auVar74._24_4_ = fVar243 * fVar118;
          auVar74._28_4_ = uVar73;
          auVar226 = vsubps_avx(auVar74,auVar72);
          fVar233 = auVar163._0_4_;
          fVar309 = auVar163._4_4_;
          auVar75._4_4_ = fVar245 * fVar309;
          auVar75._0_4_ = fVar150 * fVar233;
          fVar171 = auVar163._8_4_;
          auVar75._8_4_ = fVar193 * fVar171;
          fVar220 = auVar163._12_4_;
          auVar75._12_4_ = fVar232 * fVar220;
          fVar120 = auVar163._16_4_;
          auVar75._16_4_ = fVar234 * fVar120;
          fVar203 = auVar163._20_4_;
          auVar75._20_4_ = fVar241 * fVar203;
          fVar119 = auVar163._24_4_;
          auVar75._24_4_ = fVar243 * fVar119;
          auVar75._28_4_ = uVar73;
          fVar240 = auVar186._0_4_;
          fVar294 = auVar186._4_4_;
          auVar76._4_4_ = fVar144 * fVar294;
          auVar76._0_4_ = fVar143 * fVar240;
          fVar266 = auVar186._8_4_;
          auVar76._8_4_ = fVar175 * fVar266;
          fVar173 = auVar186._12_4_;
          auVar76._12_4_ = fVar176 * fVar173;
          fVar139 = auVar186._16_4_;
          auVar76._16_4_ = fVar190 * fVar139;
          fVar213 = auVar186._20_4_;
          auVar76._20_4_ = fVar191 * fVar213;
          fVar137 = auVar186._24_4_;
          auVar76._24_4_ = fVar192 * fVar137;
          auVar76._28_4_ = auVar305._28_4_;
          auVar18 = vsubps_avx(auVar76,auVar75);
          auVar77._4_4_ = fVar292 * fVar294;
          auVar77._0_4_ = fVar202 * fVar240;
          auVar77._8_4_ = fVar216 * fVar266;
          auVar77._12_4_ = fVar269 * fVar173;
          auVar77._16_4_ = fVar194 * fVar139;
          auVar77._20_4_ = fVar148 * fVar213;
          auVar77._24_4_ = fVar118 * fVar137;
          auVar77._28_4_ = uVar73;
          auVar78._4_4_ = fVar309 * fVar149;
          auVar78._0_4_ = fVar233 * fVar231;
          auVar78._8_4_ = fVar171 * fVar261;
          auVar78._12_4_ = fVar220 * fVar268;
          auVar78._16_4_ = fVar120 * fVar174;
          auVar78._20_4_ = fVar203 * fVar147;
          auVar78._24_4_ = fVar119 * fVar219;
          auVar78._28_4_ = auVar19._28_4_;
          auVar19 = vsubps_avx(auVar78,auVar77);
          auVar21 = vsubps_avx(auVar17,auVar11);
          fVar244 = auVar19._28_4_ + auVar18._28_4_;
          auVar286._0_4_ = auVar19._0_4_ + auVar18._0_4_ * 0.0 + auVar226._0_4_ * 0.0;
          auVar286._4_4_ = auVar19._4_4_ + auVar18._4_4_ * 0.0 + auVar226._4_4_ * 0.0;
          auVar286._8_4_ = auVar19._8_4_ + auVar18._8_4_ * 0.0 + auVar226._8_4_ * 0.0;
          auVar286._12_4_ = auVar19._12_4_ + auVar18._12_4_ * 0.0 + auVar226._12_4_ * 0.0;
          auVar286._16_4_ = auVar19._16_4_ + auVar18._16_4_ * 0.0 + auVar226._16_4_ * 0.0;
          auVar286._20_4_ = auVar19._20_4_ + auVar18._20_4_ * 0.0 + auVar226._20_4_ * 0.0;
          auVar286._24_4_ = auVar19._24_4_ + auVar18._24_4_ * 0.0 + auVar226._24_4_ * 0.0;
          auVar286._28_4_ = fVar244 + auVar226._28_4_;
          fVar242 = auVar274._0_4_;
          fVar293 = auVar274._4_4_;
          auVar79._4_4_ = auVar11._4_4_ * fVar293;
          auVar79._0_4_ = auVar11._0_4_ * fVar242;
          fVar267 = auVar274._8_4_;
          auVar79._8_4_ = auVar11._8_4_ * fVar267;
          fVar270 = auVar274._12_4_;
          auVar79._12_4_ = auVar11._12_4_ * fVar270;
          fVar142 = auVar274._16_4_;
          auVar79._16_4_ = auVar11._16_4_ * fVar142;
          fVar214 = auVar274._20_4_;
          auVar79._20_4_ = auVar11._20_4_ * fVar214;
          fVar138 = auVar274._24_4_;
          auVar79._24_4_ = auVar11._24_4_ * fVar138;
          auVar79._28_4_ = fVar244;
          fVar244 = auVar21._0_4_;
          fVar295 = auVar21._4_4_;
          auVar80._4_4_ = auVar22._4_4_ * fVar295;
          auVar80._0_4_ = auVar22._0_4_ * fVar244;
          fVar218 = auVar21._8_4_;
          auVar80._8_4_ = auVar22._8_4_ * fVar218;
          fVar271 = auVar21._12_4_;
          auVar80._12_4_ = auVar22._12_4_ * fVar271;
          fVar145 = auVar21._16_4_;
          auVar80._16_4_ = auVar22._16_4_ * fVar145;
          fVar215 = auVar21._20_4_;
          auVar80._20_4_ = auVar22._20_4_ * fVar215;
          fVar140 = auVar21._24_4_;
          auVar80._24_4_ = auVar22._24_4_ * fVar140;
          auVar80._28_4_ = auVar19._28_4_;
          auVar274 = vsubps_avx(auVar80,auVar79);
          auVar18 = vsubps_avx(auVar163,auVar16);
          fVar291 = auVar18._0_4_;
          fVar296 = auVar18._4_4_;
          auVar81._4_4_ = auVar11._4_4_ * fVar296;
          auVar81._0_4_ = auVar11._0_4_ * fVar291;
          fVar172 = auVar18._8_4_;
          auVar81._8_4_ = auVar11._8_4_ * fVar172;
          fVar221 = auVar18._12_4_;
          auVar81._12_4_ = auVar11._12_4_ * fVar221;
          fVar146 = auVar18._16_4_;
          auVar81._16_4_ = auVar11._16_4_ * fVar146;
          fVar217 = auVar18._20_4_;
          auVar81._20_4_ = auVar11._20_4_ * fVar217;
          fVar141 = auVar18._24_4_;
          auVar81._24_4_ = auVar11._24_4_ * fVar141;
          auVar81._28_4_ = auVar11._28_4_;
          auVar82._4_4_ = fVar295 * auVar16._4_4_;
          auVar82._0_4_ = fVar244 * auVar16._0_4_;
          auVar82._8_4_ = fVar218 * auVar16._8_4_;
          auVar82._12_4_ = fVar271 * auVar16._12_4_;
          auVar82._16_4_ = fVar145 * auVar16._16_4_;
          auVar82._20_4_ = fVar215 * auVar16._20_4_;
          auVar82._24_4_ = fVar140 * auVar16._24_4_;
          auVar82._28_4_ = auVar226._28_4_;
          auVar11 = vsubps_avx(auVar81,auVar82);
          auVar83._4_4_ = auVar22._4_4_ * fVar296;
          auVar83._0_4_ = auVar22._0_4_ * fVar291;
          auVar83._8_4_ = auVar22._8_4_ * fVar172;
          auVar83._12_4_ = auVar22._12_4_ * fVar221;
          auVar83._16_4_ = auVar22._16_4_ * fVar146;
          auVar83._20_4_ = auVar22._20_4_ * fVar217;
          auVar83._24_4_ = auVar22._24_4_ * fVar141;
          auVar83._28_4_ = auVar22._28_4_;
          auVar84._4_4_ = fVar293 * auVar16._4_4_;
          auVar84._0_4_ = fVar242 * auVar16._0_4_;
          auVar84._8_4_ = fVar267 * auVar16._8_4_;
          auVar84._12_4_ = fVar270 * auVar16._12_4_;
          auVar84._16_4_ = fVar142 * auVar16._16_4_;
          auVar84._20_4_ = fVar214 * auVar16._20_4_;
          auVar84._24_4_ = fVar138 * auVar16._24_4_;
          auVar84._28_4_ = auVar16._28_4_;
          auVar16 = vsubps_avx(auVar84,auVar83);
          auVar135._0_4_ = auVar274._0_4_ * 0.0 + auVar16._0_4_ + auVar11._0_4_ * 0.0;
          auVar135._4_4_ = auVar274._4_4_ * 0.0 + auVar16._4_4_ + auVar11._4_4_ * 0.0;
          auVar135._8_4_ = auVar274._8_4_ * 0.0 + auVar16._8_4_ + auVar11._8_4_ * 0.0;
          auVar135._12_4_ = auVar274._12_4_ * 0.0 + auVar16._12_4_ + auVar11._12_4_ * 0.0;
          auVar135._16_4_ = auVar274._16_4_ * 0.0 + auVar16._16_4_ + auVar11._16_4_ * 0.0;
          auVar135._20_4_ = auVar274._20_4_ * 0.0 + auVar16._20_4_ + auVar11._20_4_ * 0.0;
          auVar135._24_4_ = auVar274._24_4_ * 0.0 + auVar16._24_4_ + auVar11._24_4_ * 0.0;
          auVar135._28_4_ = auVar11._28_4_ + auVar16._28_4_ + auVar11._28_4_;
          auVar136 = ZEXT3264(auVar135);
          auVar274 = vmaxps_avx(auVar286,auVar135);
          auVar274 = vcmpps_avx(auVar274,ZEXT432(0) << 0x20,2);
          auVar16 = _local_7c0 & auVar274;
          if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar16 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar16 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar16 >> 0x7f,0) == '\0') &&
                (auVar16 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar16 >> 0xbf,0) == '\0') &&
              (auVar16 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar16[0x1f]) {
LAB_007be02a:
            auVar290 = auVar21._4_12_;
            auVar164 = ZEXT3264(CONCAT824(uStack_4c8,
                                          CONCAT816(uStack_4d0,CONCAT88(uStack_4d8,local_4e0))));
          }
          else {
            auVar16 = vandps_avx(auVar274,_local_7c0);
            auVar85._4_4_ = fVar295 * fVar149;
            auVar85._0_4_ = fVar244 * fVar231;
            auVar85._8_4_ = fVar218 * fVar261;
            auVar85._12_4_ = fVar271 * fVar268;
            auVar85._16_4_ = fVar145 * fVar174;
            auVar85._20_4_ = fVar215 * fVar147;
            auVar85._24_4_ = fVar140 * fVar219;
            auVar85._28_4_ = local_7c0._28_4_;
            auVar86._4_4_ = fVar293 * fVar245;
            auVar86._0_4_ = fVar242 * fVar150;
            auVar86._8_4_ = fVar267 * fVar193;
            auVar86._12_4_ = fVar270 * fVar232;
            auVar86._16_4_ = fVar142 * fVar234;
            auVar86._20_4_ = fVar214 * fVar241;
            auVar86._24_4_ = fVar138 * fVar243;
            auVar86._28_4_ = auVar274._28_4_;
            auVar22 = vsubps_avx(auVar86,auVar85);
            auVar87._4_4_ = fVar296 * fVar245;
            auVar87._0_4_ = fVar291 * fVar150;
            auVar87._8_4_ = fVar172 * fVar193;
            auVar87._12_4_ = fVar221 * fVar232;
            auVar87._16_4_ = fVar146 * fVar234;
            auVar87._20_4_ = fVar217 * fVar241;
            auVar87._24_4_ = fVar141 * fVar243;
            auVar87._28_4_ = auVar283._28_4_;
            auVar88._4_4_ = fVar295 * fVar294;
            auVar88._0_4_ = fVar244 * fVar240;
            auVar88._8_4_ = fVar218 * fVar266;
            auVar88._12_4_ = fVar271 * fVar173;
            auVar88._16_4_ = fVar145 * fVar139;
            auVar88._20_4_ = fVar215 * fVar213;
            auVar88._24_4_ = fVar140 * fVar137;
            auVar88._28_4_ = auVar21._28_4_;
            auVar11 = vsubps_avx(auVar88,auVar87);
            auVar89._4_4_ = fVar293 * fVar294;
            auVar89._0_4_ = fVar242 * fVar240;
            auVar89._8_4_ = fVar267 * fVar266;
            auVar89._12_4_ = fVar270 * fVar173;
            auVar89._16_4_ = fVar142 * fVar139;
            auVar89._20_4_ = fVar214 * fVar213;
            auVar89._24_4_ = fVar138 * fVar137;
            auVar89._28_4_ = auVar186._28_4_;
            auVar90._4_4_ = fVar296 * fVar149;
            auVar90._0_4_ = fVar291 * fVar231;
            auVar90._8_4_ = fVar172 * fVar261;
            auVar90._12_4_ = fVar221 * fVar268;
            auVar90._16_4_ = fVar146 * fVar174;
            auVar90._20_4_ = fVar217 * fVar147;
            auVar90._24_4_ = fVar141 * fVar219;
            auVar90._28_4_ = auVar20._28_4_;
            auVar226 = vsubps_avx(auVar90,auVar89);
            auVar162._0_4_ = auVar22._0_4_ * 0.0 + auVar226._0_4_ + auVar11._0_4_ * 0.0;
            auVar162._4_4_ = auVar22._4_4_ * 0.0 + auVar226._4_4_ + auVar11._4_4_ * 0.0;
            auVar162._8_4_ = auVar22._8_4_ * 0.0 + auVar226._8_4_ + auVar11._8_4_ * 0.0;
            auVar162._12_4_ = auVar22._12_4_ * 0.0 + auVar226._12_4_ + auVar11._12_4_ * 0.0;
            auVar162._16_4_ = auVar22._16_4_ * 0.0 + auVar226._16_4_ + auVar11._16_4_ * 0.0;
            auVar162._20_4_ = auVar22._20_4_ * 0.0 + auVar226._20_4_ + auVar11._20_4_ * 0.0;
            auVar162._24_4_ = auVar22._24_4_ * 0.0 + auVar226._24_4_ + auVar11._24_4_ * 0.0;
            auVar162._28_4_ = auVar20._28_4_ + auVar226._28_4_ + auVar186._28_4_;
            auVar274 = vrcpps_avx(auVar162);
            fVar240 = auVar274._0_4_;
            fVar242 = auVar274._4_4_;
            auVar91._4_4_ = auVar162._4_4_ * fVar242;
            auVar91._0_4_ = auVar162._0_4_ * fVar240;
            fVar244 = auVar274._8_4_;
            auVar91._8_4_ = auVar162._8_4_ * fVar244;
            fVar291 = auVar274._12_4_;
            auVar91._12_4_ = auVar162._12_4_ * fVar291;
            fVar231 = auVar274._16_4_;
            auVar91._16_4_ = auVar162._16_4_ * fVar231;
            fVar149 = auVar274._20_4_;
            auVar91._20_4_ = auVar162._20_4_ * fVar149;
            fVar294 = auVar274._24_4_;
            auVar91._24_4_ = auVar162._24_4_ * fVar294;
            auVar91._28_4_ = auVar21._28_4_;
            auVar301._8_4_ = 0x3f800000;
            auVar301._0_8_ = 0x3f8000003f800000;
            auVar301._12_4_ = 0x3f800000;
            auVar301._16_4_ = 0x3f800000;
            auVar301._20_4_ = 0x3f800000;
            auVar301._24_4_ = 0x3f800000;
            auVar301._28_4_ = 0x3f800000;
            auVar274 = vsubps_avx(auVar301,auVar91);
            auVar289._0_4_ = auVar274._0_4_ * fVar240;
            auVar289._4_4_ = auVar274._4_4_ * fVar242;
            auVar289._8_4_ = auVar274._8_4_ * fVar244;
            auVar289._12_4_ = auVar274._12_4_ * fVar291;
            fVar293 = auVar274._16_4_ * fVar231;
            auVar21._16_4_ = fVar293;
            auVar21._0_16_ = auVar289;
            fVar295 = auVar274._20_4_ * fVar149;
            auVar21._20_4_ = fVar295;
            fVar296 = auVar274._24_4_ * fVar294;
            auVar21._24_4_ = fVar296;
            auVar21._28_4_ = auVar274._28_4_;
            auVar290 = auVar289._4_12_;
            fVar240 = auVar289._0_4_ + fVar240;
            fVar242 = auVar289._4_4_ + fVar242;
            fVar244 = auVar289._8_4_ + fVar244;
            fVar291 = auVar289._12_4_ + fVar291;
            fVar293 = fVar293 + fVar231;
            fVar295 = fVar295 + fVar149;
            fVar296 = fVar296 + fVar294;
            auVar92._4_4_ =
                 (fVar309 * auVar22._4_4_ + auVar11._4_4_ * fVar292 + auVar226._4_4_ * fVar144) *
                 fVar242;
            auVar92._0_4_ =
                 (fVar233 * auVar22._0_4_ + auVar11._0_4_ * fVar202 + auVar226._0_4_ * fVar143) *
                 fVar240;
            auVar92._8_4_ =
                 (fVar171 * auVar22._8_4_ + auVar11._8_4_ * fVar216 + auVar226._8_4_ * fVar175) *
                 fVar244;
            auVar92._12_4_ =
                 (fVar220 * auVar22._12_4_ + auVar11._12_4_ * fVar269 + auVar226._12_4_ * fVar176) *
                 fVar291;
            auVar92._16_4_ =
                 (fVar120 * auVar22._16_4_ + auVar11._16_4_ * fVar194 + auVar226._16_4_ * fVar190) *
                 fVar293;
            auVar92._20_4_ =
                 (fVar203 * auVar22._20_4_ + auVar11._20_4_ * fVar148 + auVar226._20_4_ * fVar191) *
                 fVar295;
            auVar92._24_4_ =
                 (fVar119 * auVar22._24_4_ + auVar11._24_4_ * fVar118 + auVar226._24_4_ * fVar192) *
                 fVar296;
            auVar92._28_4_ = auVar163._28_4_ + auVar13._28_4_ + auVar17._28_4_;
            fVar231 = ray->tfar;
            auVar212._4_4_ = fVar231;
            auVar212._0_4_ = fVar231;
            auVar212._8_4_ = fVar231;
            auVar212._12_4_ = fVar231;
            auVar212._16_4_ = fVar231;
            auVar212._20_4_ = fVar231;
            auVar212._24_4_ = fVar231;
            auVar212._28_4_ = fVar231;
            auVar104._8_8_ = uStack_d8;
            auVar104._0_8_ = local_e0;
            auVar104._16_8_ = uStack_d0;
            auVar104._24_8_ = uStack_c8;
            auVar163 = vcmpps_avx(auVar104,auVar92,2);
            auVar274 = vcmpps_avx(auVar92,auVar212,2);
            auVar163 = vandps_avx(auVar163,auVar274);
            auVar13 = auVar16 & auVar163;
            if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar13 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar13 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar13 >> 0x7f,0) == '\0') &&
                  (auVar13 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar13 >> 0xbf,0) == '\0') &&
                (auVar13 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar13[0x1f]) goto LAB_007be02a;
            auVar163 = vandps_avx(auVar16,auVar163);
            auVar13 = vcmpps_avx(ZEXT432(0) << 0x20,auVar162,4);
            auVar17 = auVar163 & auVar13;
            auVar164 = ZEXT3264(CONCAT824(uStack_4c8,
                                          CONCAT816(uStack_4d0,CONCAT88(uStack_4d8,local_4e0))));
            if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar17 >> 0x7f,0) != '\0') ||
                  (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar17 >> 0xbf,0) != '\0') ||
                (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar17[0x1f] < '\0') {
              auVar163 = vandps_avx(auVar13,auVar163);
              auVar164 = ZEXT3264(auVar163);
              auVar93._4_4_ = auVar286._4_4_ * fVar242;
              auVar93._0_4_ = auVar286._0_4_ * fVar240;
              auVar93._8_4_ = auVar286._8_4_ * fVar244;
              auVar93._12_4_ = auVar286._12_4_ * fVar291;
              auVar93._16_4_ = auVar286._16_4_ * fVar293;
              auVar93._20_4_ = auVar286._20_4_ * fVar295;
              auVar93._24_4_ = auVar286._24_4_ * fVar296;
              auVar93._28_4_ = auVar274._28_4_;
              auVar94._4_4_ = auVar135._4_4_ * fVar242;
              auVar94._0_4_ = auVar135._0_4_ * fVar240;
              auVar94._8_4_ = auVar135._8_4_ * fVar244;
              auVar94._12_4_ = auVar135._12_4_ * fVar291;
              auVar94._16_4_ = auVar135._16_4_ * fVar293;
              auVar94._20_4_ = auVar135._20_4_ * fVar295;
              auVar94._24_4_ = auVar135._24_4_ * fVar296;
              auVar94._28_4_ = auVar135._28_4_;
              auVar239._8_4_ = 0x3f800000;
              auVar239._0_8_ = 0x3f8000003f800000;
              auVar239._12_4_ = 0x3f800000;
              auVar239._16_4_ = 0x3f800000;
              auVar239._20_4_ = 0x3f800000;
              auVar239._24_4_ = 0x3f800000;
              auVar239._28_4_ = 0x3f800000;
              auVar163 = vsubps_avx(auVar239,auVar93);
              _local_160 = vblendvps_avx(auVar163,auVar93,auVar12);
              auVar163 = vsubps_avx(auVar239,auVar94);
              _local_400 = vblendvps_avx(auVar163,auVar94,auVar12);
              auVar136 = ZEXT3264(_local_400);
              local_180 = auVar92;
            }
          }
          uVar113 = uVar113 & 0xffffffff;
          auVar278 = ZEXT3264(local_720);
          auVar265 = ZEXT3264(local_700);
          auVar163 = auVar164._0_32_;
          auVar313 = ZEXT3264(_local_600);
          if ((((((((auVar163 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar163 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar163 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar163 >> 0x7f,0) == '\0') &&
                (auVar164 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
               SUB321(auVar163 >> 0xbf,0) == '\0') &&
              (auVar164 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
              -1 < auVar164[0x1f]) {
            auVar287 = ZEXT3264(local_6e0);
            auVar254 = ZEXT3264(_local_580);
          }
          else {
            auVar274 = vsubps_avx(local_6c0,_local_760);
            fVar202 = (float)local_760._0_4_ + auVar274._0_4_ * (float)local_160._0_4_;
            fVar233 = (float)local_760._4_4_ + auVar274._4_4_ * (float)local_160._4_4_;
            fVar240 = (float)uStack_758 + auVar274._8_4_ * fStack_158;
            fVar242 = uStack_758._4_4_ + auVar274._12_4_ * fStack_154;
            fVar244 = fStack_750 + auVar274._16_4_ * fStack_150;
            fVar291 = fStack_74c + auVar274._20_4_ * fStack_14c;
            fVar149 = fStack_748 + auVar274._24_4_ * fStack_148;
            fVar292 = fStack_744 + auVar274._28_4_;
            fVar231 = local_7e8->depth_scale;
            auVar189 = ZEXT3264(CONCAT428(fVar231,CONCAT424(fVar231,CONCAT420(fVar231,CONCAT416(
                                                  fVar231,CONCAT412(fVar231,CONCAT48(fVar231,
                                                  CONCAT44(fVar231,fVar231))))))));
            auVar95._4_4_ = (fVar233 + fVar233) * fVar231;
            auVar95._0_4_ = (fVar202 + fVar202) * fVar231;
            auVar95._8_4_ = (fVar240 + fVar240) * fVar231;
            auVar95._12_4_ = (fVar242 + fVar242) * fVar231;
            auVar95._16_4_ = (fVar244 + fVar244) * fVar231;
            auVar95._20_4_ = (fVar291 + fVar291) * fVar231;
            auVar95._24_4_ = (fVar149 + fVar149) * fVar231;
            auVar95._28_4_ = fVar292 + fVar292;
            auVar274 = vcmpps_avx(local_180,auVar95,6);
            auVar136 = ZEXT3264(auVar274);
            auVar13 = auVar163 & auVar274;
            auVar254 = ZEXT3264(_local_580);
            if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar13 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar13 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar13 >> 0x7f,0) == '\0') &&
                  (auVar13 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar13 >> 0xbf,0) == '\0') &&
                (auVar13 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar13[0x1f]) {
              auVar287 = ZEXT3264(local_6e0);
            }
            else {
              local_200 = vandps_avx(auVar274,auVar163);
              auVar136 = ZEXT3264(local_200);
              auVar157._0_8_ =
                   CONCAT44((float)local_400._4_4_ + (float)local_400._4_4_ + -1.0,
                            (float)local_400._0_4_ + (float)local_400._0_4_ + -1.0);
              auVar157._8_4_ = (float)uStack_3f8 + (float)uStack_3f8 + -1.0;
              auVar157._12_4_ = uStack_3f8._4_4_ + uStack_3f8._4_4_ + -1.0;
              auVar158._16_4_ = (float)uStack_3f0 + (float)uStack_3f0 + -1.0;
              auVar158._0_16_ = auVar157;
              auVar158._20_4_ = uStack_3f0._4_4_ + uStack_3f0._4_4_ + -1.0;
              fStack_288 = (float)uStack_3e8 + (float)uStack_3e8 + -1.0;
              _local_2a0 = auVar158;
              fStack_284 = uStack_3e8._4_4_ + uStack_3e8._4_4_ + -1.0;
              auVar164 = ZEXT3264(_local_2a0);
              local_2c0 = _local_160;
              local_280 = local_180;
              local_25c = uVar107;
              local_250 = local_7d0;
              uStack_248 = uStack_7c8;
              local_240 = local_530;
              uStack_238 = uStack_528;
              local_230 = local_540;
              uStack_228 = uStack_538;
              auVar189 = ZEXT1664(_local_550);
              local_220 = _local_550;
              pGVar9 = (context->scene->geometries).items[local_728].ptr;
              local_760 = (undefined1  [8])pGVar9;
              _local_400 = _local_2a0;
              auVar163 = _local_400;
              if ((pGVar9->mask & ray->mask) == 0) {
                pRVar111 = (RTCIntersectArguments *)0x0;
LAB_007be00a:
                uVar115 = local_780._0_4_;
              }
              else {
                pRVar111 = context->args;
                if ((pRVar111->filter != (RTCFilterFunctionN)0x0) ||
                   (pRVar111 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pGVar9 >> 8),1),
                   pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  auVar183._0_4_ = (float)(int)local_260;
                  auVar183._4_12_ = auVar290;
                  auVar328 = vshufps_avx(auVar183,auVar183,0);
                  auVar189 = ZEXT3264(CONCAT1616(auVar328,auVar328));
                  local_1e0[0] = (auVar328._0_4_ + (float)local_160._0_4_ + 0.0) *
                                 (float)local_100._0_4_;
                  local_1e0[1] = (auVar328._4_4_ + (float)local_160._4_4_ + 1.0) *
                                 (float)local_100._4_4_;
                  local_1e0[2] = (auVar328._8_4_ + fStack_158 + 2.0) * fStack_f8;
                  local_1e0[3] = (auVar328._12_4_ + fStack_154 + 3.0) * fStack_f4;
                  fStack_1d0 = (auVar328._0_4_ + fStack_150 + 4.0) * fStack_f0;
                  fStack_1cc = (auVar328._4_4_ + fStack_14c + 5.0) * fStack_ec;
                  fStack_1c8 = (auVar328._8_4_ + fStack_148 + 6.0) * fStack_e8;
                  fStack_1c4 = auVar328._12_4_ + fStack_144 + 7.0;
                  uStack_3f8 = auVar157._8_8_;
                  uStack_3f0 = auVar158._16_8_;
                  uStack_3e8 = local_2a0._24_8_;
                  local_1c0 = auVar157._0_8_;
                  uStack_1b8 = uStack_3f8;
                  uStack_1b0 = uStack_3f0;
                  uStack_1a8 = uStack_3e8;
                  auVar164 = ZEXT3264(local_180);
                  local_1a0 = local_180;
                  uVar115 = vmovmskps_avx(local_200);
                  uVar113 = CONCAT44((int)((ulong)pRVar111 >> 0x20),uVar115);
                  lVar112 = 0;
                  _local_400 = auVar163;
                  if (uVar113 != 0) {
                    for (; (uVar113 >> lVar112 & 1) == 0; lVar112 = lVar112 + 1) {
                    }
                  }
                  while( true ) {
                    local_7c0 = (undefined1  [8])lVar112;
                    local_6c0._0_8_ = uVar113;
                    if (uVar113 == 0) break;
                    local_624 = local_1e0[lVar112];
                    auVar136 = ZEXT464((uint)local_624);
                    local_620 = *(uint *)((long)&local_1c0 + lVar112 * 4);
                    auVar164 = ZEXT464(local_620);
                    local_5a0._0_4_ = ray->tfar;
                    ray->tfar = *(float *)(local_1a0 + lVar112 * 4);
                    local_690.context = context->user;
                    fVar195 = 1.0 - local_624;
                    fVar222 = local_624 * fVar195 * 4.0;
                    auVar328 = ZEXT416((uint)(local_624 * local_624 * 0.5));
                    auVar328 = vshufps_avx(auVar328,auVar328,0);
                    auVar184 = ZEXT416((uint)((fVar195 * fVar195 + fVar222) * 0.5));
                    auVar184 = vshufps_avx(auVar184,auVar184,0);
                    auVar207 = ZEXT416((uint)((-local_624 * local_624 - fVar222) * 0.5));
                    auVar207 = vshufps_avx(auVar207,auVar207,0);
                    auVar198 = ZEXT416((uint)(fVar195 * -fVar195 * 0.5));
                    auVar198 = vshufps_avx(auVar198,auVar198,0);
                    auVar185._0_4_ =
                         auVar198._0_4_ * (float)local_7d0._0_4_ +
                         auVar207._0_4_ * (float)local_530._0_4_ +
                         auVar328._0_4_ * (float)local_550._0_4_ +
                         auVar184._0_4_ * (float)local_540._0_4_;
                    auVar185._4_4_ =
                         auVar198._4_4_ * (float)local_7d0._4_4_ +
                         auVar207._4_4_ * (float)local_530._4_4_ +
                         auVar328._4_4_ * (float)local_550._4_4_ +
                         auVar184._4_4_ * (float)local_540._4_4_;
                    auVar185._8_4_ =
                         auVar198._8_4_ * (float)uStack_7c8 +
                         auVar207._8_4_ * (float)uStack_528 +
                         auVar328._8_4_ * fStack_548 + auVar184._8_4_ * (float)uStack_538;
                    auVar185._12_4_ =
                         auVar198._12_4_ * uStack_7c8._4_4_ +
                         auVar207._12_4_ * uStack_528._4_4_ +
                         auVar328._12_4_ * fStack_544 + auVar184._12_4_ * uStack_538._4_4_;
                    auVar189 = ZEXT1664(auVar185);
                    local_630 = vmovlps_avx(auVar185);
                    local_628 = vextractps_avx(auVar185,2);
                    local_61c = local_7d4;
                    local_618 = (int)local_728;
                    local_614 = (local_690.context)->instID[0];
                    local_610 = (local_690.context)->instPrimID[0];
                    local_804 = -1;
                    local_690.valid = &local_804;
                    local_690.geometryUserPtr = *(void **)((long)local_760 + 0x18);
                    local_690.ray = (RTCRayN *)ray;
                    local_690.hit = (RTCHitN *)&local_630;
                    local_690.N = 1;
                    if (*(code **)((long)local_760 + 0x48) == (code *)0x0) {
LAB_007bdf7e:
                      p_Var10 = context->args->filter;
                      if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          ((*(byte *)((long)local_760 + 0x3e) & 0x40) != 0)))) {
                        auVar189 = ZEXT1664(auVar189._0_16_);
                        auVar328 = (*p_Var10)(&local_690);
                        auVar164._0_8_ = auVar328._8_8_;
                        auVar136._0_8_ = auVar328._0_8_;
                        auVar164._8_56_ = extraout_var_02;
                        auVar136._8_56_ = extraout_var_00;
                        if (*local_690.valid == 0) goto LAB_007bdfc9;
                      }
                      pRVar111 = (RTCIntersectArguments *)0x1;
                      goto LAB_007be074;
                    }
                    auVar189 = ZEXT1664(auVar185);
                    auVar328 = (**(code **)((long)local_760 + 0x48))(&local_690);
                    auVar164._0_8_ = auVar328._8_8_;
                    auVar136._0_8_ = auVar328._0_8_;
                    auVar164._8_56_ = extraout_var_01;
                    auVar136._8_56_ = extraout_var;
                    if (*local_690.valid != 0) goto LAB_007bdf7e;
LAB_007bdfc9:
                    auVar136 = ZEXT464((uint)local_5a0._0_4_);
                    ray->tfar = (float)local_5a0._0_4_;
                    uVar113 = local_6c0._0_8_ ^ 1L << ((ulong)local_7c0 & 0x3f);
                    lVar112 = 0;
                    if (uVar113 != 0) {
                      for (; (uVar113 >> lVar112 & 1) == 0; lVar112 = lVar112 + 1) {
                      }
                    }
                  }
                  pRVar111 = (RTCIntersectArguments *)0x0;
LAB_007be074:
                  auVar265 = ZEXT3264(local_700);
                  auVar278 = ZEXT3264(local_720);
                  auVar254 = ZEXT3264(_local_580);
                  auVar313 = ZEXT3264(_local_600);
                  fVar151 = (float)local_7a0._0_4_;
                  fVar165 = (float)local_7a0._4_4_;
                  fVar167 = fStack_798;
                  fVar169 = fStack_794;
                  fVar222 = fStack_790;
                  fVar195 = fStack_78c;
                  fVar229 = fStack_788;
                  fVar152 = (float)local_660._0_4_;
                  fVar166 = (float)local_660._4_4_;
                  fVar168 = fStack_658;
                  fVar170 = fStack_654;
                  fVar200 = fStack_650;
                  fVar230 = fStack_64c;
                  fVar201 = fStack_648;
                  goto LAB_007be00a;
                }
              }
              auVar287 = ZEXT3264(local_6e0);
              uVar113 = (ulong)CONCAT31((int3)((uint)uVar115 >> 8),(byte)uVar115 | (byte)pRVar111);
              lVar112 = local_800._0_8_;
            }
          }
        }
      }
    }
    if ((uVar113 & 1) != 0) break;
    fVar222 = ray->tfar;
    auVar124._4_4_ = fVar222;
    auVar124._0_4_ = fVar222;
    auVar124._8_4_ = fVar222;
    auVar124._12_4_ = fVar222;
    auVar328 = vcmpps_avx(local_2d0,auVar124,2);
    uVar107 = vmovmskps_avx(auVar328);
    uVar116 = (ulong)((uint)uVar117 & uVar107);
  }
  return uVar116 != 0;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }
          
          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }